

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodePreconditioner.cpp
# Opt level: O1

int pele::physics::reactions::cvode::Precond_custom
              (Real param_1,N_Vector u,N_Vector param_3,int jok,int *jcurPtr,Real gamma,
              void *user_data)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int i;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  int iVar14;
  long lVar15;
  realtype *prVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 uVar22;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  Real T_1;
  Real invT_1;
  Real invT;
  double dVar31;
  Real h_RT [21];
  Real T;
  Real dcRdT [21];
  Real c_R [21];
  Real activity [21];
  Real massfrac [21];
  double local_a48 [22];
  double local_998;
  undefined8 uStack_990;
  double local_988 [22];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  double local_8a8;
  undefined8 uStack_8a0;
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  double local_868;
  double dStack_860;
  undefined1 local_858 [16];
  double local_848;
  undefined8 uStack_840;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [16];
  double local_7b8;
  double dStack_7b0;
  double local_7a8;
  double dStack_7a0;
  double local_798;
  double dStack_790;
  double local_788;
  double dStack_780;
  double local_778;
  double dStack_770;
  double local_768;
  double dStack_760;
  double local_758;
  double dStack_750;
  double local_748;
  double dStack_740;
  double local_738;
  double dStack_730;
  double local_728;
  double dStack_720;
  double local_718;
  undefined1 local_708 [24];
  double local_6f0;
  undefined1 local_6e8 [16];
  double local_6d8;
  undefined8 uStack_6d0;
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  double local_6a8;
  undefined8 uStack_6a0;
  undefined1 local_698 [16];
  double local_688;
  double dStack_680;
  double local_678 [22];
  double local_5c8;
  double dStack_5c0;
  double local_5b8;
  double dStack_5b0;
  double local_5a0;
  double local_598;
  double dStack_590;
  double local_580;
  double local_578;
  undefined8 uStack_570;
  double local_568;
  double dStack_560;
  double local_558;
  undefined8 uStack_550;
  double local_548;
  double dStack_540;
  double local_538;
  ulong local_530;
  realtype *local_528;
  int local_51c;
  double local_518;
  undefined8 uStack_510;
  int *local_508;
  realtype *local_500;
  double local_4f8;
  undefined8 uStack_4f0;
  double local_4e8 [22];
  double local_438 [22];
  Real local_388;
  double local_370;
  long *local_368;
  long local_360;
  double local_358;
  undefined8 uStack_350;
  double local_348;
  undefined8 uStack_340;
  undefined1 local_338 [16];
  double local_328;
  undefined8 uStack_320;
  double local_318;
  undefined8 uStack_310;
  double local_308;
  undefined8 uStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double dStack_260;
  double local_258;
  double local_248;
  undefined8 uStack_240;
  double local_238 [22];
  double local_188 [22];
  double local_d8 [21];
  
  local_388 = gamma;
  local_500 = N_VGetArrayPointer(u);
  uVar1 = *(uint *)((long)user_data + 8);
  local_51c = *(int *)((long)user_data + 0x14);
  lVar4 = *(long *)((long)user_data + 0xa0);
  plVar5 = *(long **)((long)user_data + 0x80);
  local_368 = *(long **)((long)user_data + 0x90);
  local_360 = *(long *)((long)user_data + 0x68);
  memset(local_238,0,0xa8);
  iVar14 = 0;
  local_238[0] = 2.016;
  local_238[1] = 1.008;
  local_238[2] = 15.999;
  local_238[3] = 31.998;
  local_238[4] = 17.007;
  local_238[5] = 18.015;
  local_238[6] = 33.006;
  local_238[7] = 14.027;
  local_238[8] = 14.027;
  local_238[9] = 15.035;
  local_238[10] = 16.043;
  local_238[0xb] = 28.01;
  local_238[0xc] = 44.009;
  local_238[0xd] = 29.018;
  local_238[0xe] = 30.026;
  local_238[0xf] = 31.034;
  local_238[0x10] = 28.054;
  local_238[0x11] = 29.062;
  local_238[0x12] = 30.07;
  local_238[0x13] = 28.014;
  local_238[0x14] = 39.95;
  if (jok == 0) {
    local_508 = jcurPtr;
    if (0 < (int)uVar1) {
      uVar21 = 0;
      local_998 = 0.0;
      prVar16 = local_500;
      local_528 = local_500;
      do {
        lVar10 = 0;
        dVar30 = 0.0;
        do {
          dVar30 = dVar30 + local_528[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x15);
        local_530 = uVar21;
        memset(local_d8,0,0xa8);
        lVar10 = 0;
        do {
          local_d8[lVar10] = local_528[lVar10] * (1.0 / dVar30);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x15);
        local_6d8 = prVar16[uVar21 * 0x16 + 0x15];
        uStack_6d0 = 0;
        memset(local_188,0,0xa8);
        local_988[0] = 0.49603174603174605;
        local_988[1] = 0.9920634920634921;
        local_988[2] = 0.06250390649415588;
        local_988[3] = 0.03125195324707794;
        local_988[4] = 0.05879931792791203;
        local_988[5] = 0.055509297807382736;
        local_988[6] = 0.030297521662727988;
        local_988[7] = 0.07129108148570615;
        local_988[8] = 0.07129108148570615;
        local_988[9] = 0.06651147322913202;
        local_988[10] = 0.06233248145608677;
        local_988[0xb] = 0.035701535166012134;
        local_988[0xc] = 0.022722624917630486;
        local_988[0xd] = 0.03446136880556896;
        local_988[0xe] = 0.033304469459801506;
        local_988[0xf] = 0.032222723464587225;
        local_988[0x10] = 0.035645540742853074;
        local_988[0x11] = 0.034409194136673316;
        local_988[0x12] = 0.03325573661456601;
        local_988[0x13] = 0.03569643749553795;
        local_988[0x14] = 0.025031289111389236;
        lVar10 = 0;
        do {
          local_188[lVar10] = local_d8[lVar10] * dVar30 * local_988[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x15);
        if (ABS(local_6d8 - local_998) <= 1.0) {
          lVar10 = *(long *)(lVar4 + -8 + local_530 * 8);
          lVar19 = *(long *)(lVar4 + local_530 * 8);
          lVar15 = 0;
          do {
            lVar18 = 0;
            do {
              *(undefined8 *)(lVar19 + lVar18) = *(undefined8 *)(lVar10 + lVar18);
              lVar18 = lVar18 + 0xb0;
            } while (lVar18 != 0xf20);
            lVar15 = lVar15 + 1;
            lVar19 = lVar19 + 8;
            lVar10 = lVar10 + 8;
          } while (lVar15 != 0x16);
        }
        else {
          pdVar6 = *(double **)(lVar4 + local_530 * 8);
          lVar10 = 0;
          do {
            local_a48[lVar10] = local_188[lVar10] * 1000000.0;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x15);
          memset(pdVar6,0,0xf20);
          memset(local_988,0,0xa8);
          local_848 = log(local_6d8);
          uStack_840 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
          local_318 = local_6d8 * local_6d8;
          local_308 = local_6d8 * local_318;
          dVar31 = 1.0 / local_6d8;
          local_5a0 = 12186.6002121605 / local_6d8;
          dVar30 = 0.0;
          lVar10 = 0;
          do {
            dVar30 = dVar30 + local_a48[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x15);
          local_518 = local_6d8 * local_308;
          uStack_510 = uStack_6d0;
          if (1000.0 <= local_6d8) {
            local_838._0_8_ =
                 local_518 * -1.00127688e-15 +
                 local_308 * 1.496386616666667e-11 +
                 local_318 * -8.324279633333333e-08 +
                 local_6d8 * 2.470123655e-05 +
                 local_848 * -3.3372792 + dVar31 * -950.158922 + 6.54230251;
            local_868 = local_518 * -2.490986785e-23 +
                        local_308 * 3.945960291666667e-19 +
                        local_318 * -2.692699133333334e-15 +
                        local_6d8 * 1.154214865e-11 +
                        local_848 * -2.50000001 + dVar31 * 25473.6599 + 2.946682924;
            dStack_860 = local_518 * 2.33577197e-15 +
                         local_308 * -4.9640387e-11 +
                         local_318 * 4.978572466666667e-07 +
                         local_6d8 * -0.003619950185 +
                         local_848 * -2.28571772 + dVar31 * 16775.5843 + -6.19435407;
            local_828._8_8_ =
                 local_518 * 2.667543555e-15 +
                 local_308 * -4.909681483333334e-11 +
                 local_318 * 4.140760216666667e-07 +
                 local_6d8 * -0.00247847763 +
                 local_848 * -2.77217438 + dVar31 * 4011.91815 + -7.02617054;
            local_828._0_8_ =
                 local_518 * -5.8706188e-16 +
                 local_308 * 7.3288463e-12 +
                 local_318 * -2.108420466666667e-08 +
                 local_6d8 * -0.000274214858 +
                 local_848 * -3.09288767 + dVar31 * 3858.657 + -1.38380843;
            local_688 = local_518 * 4.419278200000001e-15 +
                        local_308 * -8.386767666666666e-11 +
                        local_318 * 7.370980216666666e-07 +
                        local_6d8 * -0.00460000041 +
                        local_848 * -1.76069008 + dVar31 * -13995.8323 + -11.89563292;
            dStack_680 = local_518 * 1.01823858e-15 +
                         local_308 * -1.9171084e-11 +
                         local_318 * 1.664709618333334e-07 +
                         local_6d8 * -0.001031263715 +
                         local_848 * -2.71518561 + dVar31 * -14151.8724 + -5.10350211;
            local_6e8._8_8_ =
                 local_518 * 1.08358897e-15 +
                 local_308 * -1.745587958333333e-11 +
                 local_318 * 1.263277781666667e-07 +
                 local_6d8 * -0.00074154377 +
                 local_848 * -3.28253784 + dVar31 * -1088.45772 + -2.17069345;
            local_6e8._0_8_ =
                 local_518 * 9.38637835e-16 +
                 local_308 * -2.168162908333333e-11 +
                 local_318 * 2.348243283333333e-07 +
                 local_6d8 * -0.00182819646 +
                 local_848 * -2.87410113 + dVar31 * 46263.604 + -3.29709211;
            local_8d8._8_8_ =
                 local_518 * 1.698581825e-15 +
                 local_308 * -3.48255e-11 +
                 local_318 * 3.353199116666667e-07 +
                 local_6d8 * -0.002327943185 +
                 local_848 * -2.29203842 + dVar31 * 50925.9997 + -6.33446327;
            local_8d8._0_8_ =
                 local_518 * -6.141684549999999e-17 +
                 local_308 * 8.348149916666666e-13 +
                 local_318 * -6.991409816666667e-09 +
                 local_6d8 * 4.298705685e-05 +
                 local_848 * -2.56942078 + dVar31 * 29217.5791 + -2.214917859999999;
            local_5c8 = local_518 * 5.39542675e-16 +
                        local_308 * -9.520530833333334e-12 +
                        local_318 * 1.056096916666667e-07 +
                        local_6d8 * -0.001119910065 +
                        local_848 * -4.0172109 + dVar31 * 111.856713 + 0.2321087500000001;
            dStack_5c0 = local_518 * -8.4100496e-16 +
                         local_308 * 8.08683225e-12 +
                         local_318 * 2.734541966666666e-08 +
                         local_6d8 * -0.00108845902 +
                         local_848 * -3.03399249 + dVar31 * -30004.2971 + -1.93277761;
            local_568 = local_518 * 2.36042082e-15 +
                        local_308 * -4.362418233333334e-11 +
                        local_318 * 3.691356733333334e-07 +
                        local_6d8 * -0.00220718513 +
                        local_848 * -3.85746029 + dVar31 * -48759.166 + 1.58582223;
            dStack_560 = local_518 * 5.0907615e-15 +
                         local_308 * -1.019104458333333e-10 +
                         local_318 * 9.554763483333333e-07 +
                         local_6d8 * -0.00669547335 +
                         local_848 * -0.074851495 + dVar31 * -9468.34459 + -18.362466505;
            local_548 = local_518 * 6.28530305e-15 +
                        local_308 * -1.226857691666667e-10 +
                        local_318 * 1.118463191666667e-06 +
                        local_6d8 * -0.00732270755 +
                        local_848 * -2.03611116 + dVar31 * 4939.88614 + -8.269258140000002;
            dStack_540 = local_518 * 1.056308e-15 +
                         local_308 * -3.287025833333333e-11 +
                         local_318 * 4.427306666666667e-07 +
                         local_6d8 * -0.0039357485 +
                         local_848 * -3.770799 + dVar31 * 127.83252 + 0.841224;
            local_578 = local_518 * 7.4820788e-15 +
                        local_308 * -1.460147408333333e-10 +
                        local_318 * 1.330344446666667e-06 +
                        local_6d8 * -0.0086986361 +
                        local_848 * -1.95465642 + dVar31 * 12857.52 + -11.50777788;
            local_558 = local_518 * 9.5001445e-15 +
                        local_308 * -1.845100008333333e-10 +
                        local_318 * 1.67093445e-06 +
                        local_6d8 * -0.01084263385 +
                        local_848 * -1.0718815 + dVar31 * -11426.3932 + -14.0437292;
            dVar24 = local_308 * -8.414198333333333e-12 +
                     local_318 * 9.474600000000001e-08 +
                     local_6d8 * -0.0007439884 +
                     local_848 * -2.92664 + dVar31 * -922.7977 + -3.053888;
            local_4f8 = local_518 * 3.3766755e-16;
          }
          else {
            local_838._0_8_ =
                 local_518 * 3.688058805e-13 +
                 local_308 * -1.67976745e-09 +
                 local_318 * 3.2463585e-06 +
                 local_6d8 * -0.003990260375 +
                 local_848 * -2.34433112 + dVar31 * -917.935173 + 1.661320882;
            local_868 = local_518 * 4.63866166e-23 +
                        local_308 * -1.917346933333333e-19 +
                        local_318 * 3.326532733333333e-16 +
                        local_6d8 * -3.526664095e-13 +
                        local_848 * -2.5 + dVar31 * 25473.6599 + 2.946682853;
            dStack_860 = local_518 * -1.27192867e-13 +
                         local_308 * 5.725978541666666e-10 +
                         local_318 * -9.550364266666668e-07 +
                         local_6d8 * -0.001005475875 +
                         local_848 * -3.6735904 + dVar31 * 16444.9988 + 2.06902607;
            local_828._8_8_ =
                 local_518 * -2.168844325e-13 +
                 local_308 * 1.109534108333333e-09 +
                 local_318 * -2.296657433333333e-06 +
                 local_6d8 * 0.00162196266 +
                 local_848 * -4.22118584 + dVar31 * 3839.56496 + 0.8268134100000002;
            local_828._0_8_ =
                 local_518 * -6.8205735e-14 +
                 local_308 * 3.234277775e-10 +
                 local_318 * -7.696564016666666e-07 +
                 local_6d8 * 0.00120065876 +
                 local_848 * -3.99201543 + dVar31 * 3615.08056 + 4.095940888;
            local_688 = local_518 * -6.5886326e-13 +
                        local_308 * 3.160710508333333e-09 +
                        local_318 * -6.220333466666666e-06 +
                        local_6d8 * 0.004954166845 +
                        local_848 * -4.79372315 + dVar31 * -14308.9567 + 4.19091025;
            dStack_680 = local_518 * 4.522122495e-14 +
                         local_308 * -7.558382366666667e-11 +
                         local_318 * -1.69469055e-07 +
                         local_6d8 * 0.00030517684 +
                         local_848 * -3.57953347 + dVar31 * -14344.086 + 0.07112418999999992;
            local_6e8._8_8_ =
                 local_518 * -1.621864185e-13 +
                 local_308 * 8.067745908333334e-10 +
                 local_318 * -1.641217001666667e-06 +
                 local_6d8 * 0.00149836708 +
                 local_848 * -3.78245636 + dVar31 * -1063.94356 + 0.1247806300000001;
            local_6e8._0_8_ =
                 local_518 * -8.43708595e-14 +
                 local_308 * 3.209092941666667e-10 +
                 local_318 * -4.658164016666667e-07 +
                 local_6d8 * -0.0004844360715 +
                 local_848 * -3.76267867 + dVar31 * 46004.0401 + 2.20014682;
            local_8d8._8_8_ =
                 local_518 * -9.71573685e-14 +
                 local_308 * 5.573466508333334e-10 +
                 local_318 * -1.372160366666667e-06 +
                 local_6d8 * 0.001183307095 +
                 local_848 * -4.19860411 + dVar31 * 50496.8163 + 4.967723077;
            local_8d8._0_8_ =
                 local_518 * -1.056329855e-13 +
                 local_308 * 5.106721866666666e-10 +
                 local_318 * -1.107177326666667e-06 +
                 local_6d8 * 0.00163965942 +
                 local_848 * -3.1682671 + dVar31 * 29122.2592 + 1.11633364;
            local_5c8 = local_518 * -4.646125620000001e-13 +
                        local_308 * 2.02303245e-09 +
                        local_318 * -3.526381516666666e-06 +
                        local_6d8 * 0.002374560255 +
                        local_848 * -4.30179801 + dVar31 * 294.80804 + 0.5851355599999999;
            dStack_5c0 = local_518 * -8.85989085e-14 +
                         local_308 * 4.57330885e-10 +
                         local_318 * -1.086733685e-06 +
                         local_6d8 * 0.00101821705 +
                         local_848 * -4.19864056 + dVar31 * -30293.7267 + 5.047672768;
            local_568 = local_518 * 7.184977399999999e-15 +
                        local_308 * -2.049325183333333e-10 +
                        local_318 * 1.187260448333333e-06 +
                        local_6d8 * -0.004492298385 +
                        local_848 * -2.35677352 + dVar31 * -48371.9697 + -7.5442787;
            dStack_560 = local_518 * -8.3346978e-13 +
                         local_308 * 4.039525216666667e-09 +
                         local_318 * -8.19667665e-06 +
                         local_6d8 * 0.0068354894 +
                         local_848 * -5.14987613 + dVar31 * -10246.6476 + 9.791179889999999;
            local_548 = local_518 * -1.349421865e-12 +
                        local_308 * 5.763239608333333e-09 +
                        local_318 * -9.516504866666667e-06 +
                        local_6d8 * 0.003785261235 +
                        local_848 * -3.95920148 + dVar31 * 5089.77593 + -0.1381294799999999;
            dStack_540 = local_518 * -1.037805e-13 +
                         local_308 * 6.14803e-10 +
                         local_318 * -8.897453333333333e-07 +
                         local_6d8 * -0.0036082975 +
                         local_848 * -2.106204 + dVar31 * 978.6011 + -11.045973;
            local_578 = local_518 * -1.15254502e-12 +
                        local_308 * 4.992721716666666e-09 +
                        local_318 * -8.28571345e-06 +
                        local_6d8 * 0.00209329446 +
                        local_848 * -4.30646568 + dVar31 * 12841.6265 + -0.4007435600000004;
            local_558 = local_518 * -1.343428855e-12 +
                        local_308 * 5.903885708333334e-09 +
                        local_318 * -9.990638133333334e-06 +
                        local_6d8 * 0.00275077135 +
                        local_848 * -4.29142492 + dVar31 * -11522.2055 + 1.62460176;
            dVar24 = local_308 * -4.701262500000001e-10 +
                     local_318 * 6.605369999999999e-07 +
                     local_6d8 * -0.0007041202 +
                     local_848 * -3.298677 + dVar31 * -1020.8999 + -0.6516950000000001;
            local_4f8 = local_518 * 1.222427e-13;
          }
          local_838._8_8_ = uStack_6d0;
          uStack_570 = uStack_6d0;
          local_4f8 = local_4f8 + dVar24;
          uStack_4f0 = uStack_6d0;
          local_998 = dVar31 * dVar31;
          uStack_990 = 0;
          local_8c8._0_8_ = 1.0 / (12186.6002121605 / local_6d8);
          if (1000.0 <= local_6d8) {
            local_7b8 = dVar31 * -950.158922 +
                        local_518 * 4.00510752e-15 +
                        local_308 * -4.48915985e-11 +
                        local_318 * 1.66485593e-07 + local_6d8 * -2.47012365e-05 + 3.3372792;
            dStack_7b0 = dVar31 * 25473.6599 +
                         local_518 * 9.96394714e-23 +
                         local_308 * -1.18378809e-18 +
                         local_318 * 5.38539827e-15 + local_6d8 * -1.15421486e-11 + 2.50000001;
            local_7a8 = dVar31 * 29217.5791 +
                        local_518 * 2.45667382e-16 +
                        local_308 * -2.50444497e-12 +
                        local_318 * 1.39828196e-08 + local_6d8 * -4.29870569e-05 + 2.56942078;
            dStack_7a0 = dVar31 * -1088.45772 +
                         local_518 * -4.33435588e-15 +
                         local_308 * 5.23676387e-11 +
                         local_318 * -2.52655556e-07 + local_6d8 * 0.00074154377 + 3.28253784;
            local_798 = dVar31 * 3858.657 +
                        local_518 * 2.34824752e-15 +
                        local_308 * -2.19865389e-11 +
                        local_318 * 4.21684093e-08 + local_6d8 * 0.000274214858 + 3.09288767;
            dStack_790 = dVar31 * -30004.2971 +
                         local_518 * 3.36401984e-15 +
                         local_308 * -2.42604967e-11 +
                         local_318 * -5.46908393e-08 + local_6d8 * 0.00108845902 + 3.03399249;
            local_788 = dVar31 * 111.856713 +
                        local_518 * -2.1581707e-15 +
                        local_308 * 2.85615925e-11 +
                        local_318 * -2.11219383e-07 + local_6d8 * 0.00111991006 + 4.0172109;
            dStack_780 = dVar31 * 46263.604 +
                         local_518 * -3.75455134e-15 +
                         local_308 * 6.50448872e-11 +
                         local_318 * -4.69648657e-07 + local_6d8 * 0.00182819646 + 2.87410113;
            local_778 = dVar31 * 50925.9997 +
                        local_518 * -6.7943273e-15 +
                        local_308 * 1.044765e-10 +
                        local_318 * -6.70639823e-07 + local_6d8 * 0.00232794318 + 2.29203842;
            dStack_770 = dVar31 * 16775.5843 +
                         local_518 * -9.34308788e-15 +
                         local_308 * 1.48921161e-10 +
                         local_318 * -9.95714493e-07 + local_6d8 * 0.00361995018 + 2.28571772;
            local_768 = dVar31 * -9468.34459 +
                        local_518 * -2.0363046e-14 +
                        local_308 * 3.05731338e-10 +
                        local_318 * -1.9109527e-06 + local_6d8 * 0.00669547335 + 0.074851495;
            dStack_760 = dVar31 * -14151.8724 +
                         local_518 * -4.07295432e-15 +
                         local_308 * 5.7513252e-11 +
                         local_318 * -3.32941924e-07 + local_6d8 * 0.00103126372 + 2.71518561;
            local_758 = dVar31 * -48759.166 +
                        local_518 * -9.44168328e-15 +
                        local_308 * 1.30872547e-10 +
                        local_318 * -7.38271347e-07 + local_6d8 * 0.00220718513 + 3.85746029;
            dStack_750 = dVar31 * 4011.91815 +
                         local_518 * -1.06701742e-14 +
                         local_308 * 1.47290445e-10 +
                         local_318 * -8.28152043e-07 + local_6d8 * 0.00247847763 + 2.77217438;
            local_748 = dVar31 * -13995.8323 +
                        local_518 * -1.76771128e-14 +
                        local_308 * 2.5160303e-10 +
                        local_318 * -1.47419604e-06 + local_6d8 * 0.00460000041 + 1.76069008;
            dStack_740 = dVar31 * 127.83252 +
                         local_518 * -4.225232e-15 +
                         local_308 * 9.8610775e-11 +
                         local_318 * -8.85461333e-07 + local_6d8 * 0.0039357485 + 3.770799;
            local_738 = dVar31 * 4939.88614 +
                        local_518 * -2.51412122e-14 +
                        local_308 * 3.68057308e-10 +
                        local_318 * -2.23692638e-06 + local_6d8 * 0.00732270755 + 2.03611116;
            dStack_730 = dVar31 * 12857.52 +
                         local_518 * -2.99283152e-14 +
                         local_308 * 4.38044223e-10 +
                         local_318 * -2.66068889e-06 + local_6d8 * 0.0086986361 + 1.95465642;
            local_728 = local_518 * -3.8000578e-14 +
                        local_308 * 5.53530003e-10 +
                        local_318 * -3.3418689e-06 + local_6d8 * 0.0108426339 + 1.0718815;
            dStack_720 = local_518 * -1.3506702e-15 +
                         local_308 * 2.5242595e-11 +
                         local_318 * -1.89492e-07 + local_6d8 * 0.0007439884 + 2.92664;
            dVar24 = -11426.3932;
            dVar23 = -922.7977;
          }
          else {
            local_7b8 = dVar31 * -917.935173 +
                        local_518 * -1.47522352e-12 +
                        local_308 * 5.03930235e-09 +
                        local_318 * -6.492717e-06 + local_6d8 * 0.00399026037 + 2.34433112;
            dStack_7b0 = dVar31 * 25473.6599 +
                         local_518 * -1.85546466e-22 +
                         local_308 * 5.7520408e-19 +
                         local_318 * -6.65306547e-16 + local_6d8 * 3.52666409e-13 + 2.5;
            local_7a8 = dVar31 * 29122.2592 +
                        local_518 * 4.22531942e-13 +
                        local_308 * -1.53201656e-09 +
                        local_318 * 2.21435465e-06 + local_6d8 * -0.00163965942 + 3.1682671;
            dStack_7a0 = dVar31 * -1063.94356 +
                         local_518 * 6.48745674e-13 +
                         local_308 * -2.42032377e-09 +
                         local_318 * 3.282434e-06 + local_6d8 * -0.00149836708 + 3.78245636;
            local_798 = dVar31 * 3615.08056 +
                        local_518 * 2.7282294e-13 +
                        local_308 * -9.70283332e-10 +
                        local_318 * 1.5393128e-06 + local_6d8 * -0.00120065876 + 3.99201543;
            dStack_790 = dVar31 * -30293.7267 +
                         local_518 * 3.54395634e-13 +
                         local_308 * -1.37199266e-09 +
                         local_318 * 2.17346737e-06 + local_6d8 * -0.00101821705 + 4.19864056;
            local_788 = dVar31 * 294.80804 +
                        local_518 * 1.85845025e-12 +
                        local_308 * -6.06909735e-09 +
                        local_318 * 7.05276303e-06 + local_6d8 * -0.00237456025 + 4.30179801;
            dStack_780 = dVar31 * 46004.0401 +
                         local_518 * 3.37483438e-13 +
                         local_308 * -9.62727883e-10 +
                         local_318 * 9.31632803e-07 + local_6d8 * 0.000484436072 + 3.76267867;
            local_778 = dVar31 * 50496.8163 +
                        local_518 * 3.88629474e-13 +
                        local_308 * -1.67203995e-09 +
                        local_318 * 2.74432073e-06 + local_6d8 * -0.0011833071 + 4.19860411;
            dStack_770 = dVar31 * 16444.9988 +
                         local_518 * 5.08771468e-13 +
                         local_308 * -1.71779356e-09 +
                         local_318 * 1.91007285e-06 + local_6d8 * 0.00100547588 + 3.6735904;
            local_768 = dVar31 * -10246.6476 +
                        local_518 * 3.33387912e-12 +
                        local_308 * -1.21185757e-08 +
                        local_318 * 1.63933533e-05 + local_6d8 * -0.0068354894 + 5.14987613;
            dStack_760 = dVar31 * -14344.086 +
                         local_518 * -1.808849e-13 +
                         local_308 * 2.26751471e-10 +
                         local_318 * 3.3893811e-07 + local_6d8 * -0.00030517684 + 3.57953347;
            local_758 = dVar31 * -48371.9697 +
                        local_518 * -2.87399096e-14 +
                        local_308 * 6.14797555e-10 +
                        local_318 * -2.3745209e-06 + local_6d8 * 0.00449229839 + 2.35677352;
            dStack_750 = dVar31 * 3839.56496 +
                         local_518 * 8.6753773e-13 +
                         local_308 * -3.32860233e-09 +
                         local_318 * 4.59331487e-06 + local_6d8 * -0.00162196266 + 4.22118584;
            local_748 = dVar31 * -14308.9567 +
                        local_518 * 2.63545304e-12 +
                        local_308 * -9.48213152e-09 +
                        local_318 * 1.24406669e-05 + local_6d8 * -0.00495416684 + 4.79372315;
            dStack_740 = dVar31 * 978.6011 +
                         local_518 * 4.15122e-13 +
                         local_308 * -1.844409e-09 +
                         local_318 * 1.77949067e-06 + local_6d8 * 0.0036082975 + 2.106204;
            local_738 = dVar31 * 5089.77593 +
                        local_518 * 5.39768746e-12 +
                        local_308 * -1.72897188e-08 +
                        local_318 * 1.90330097e-05 + local_6d8 * -0.00378526124 + 3.95920148;
            dStack_730 = dVar31 * 12841.6265 +
                         local_518 * 4.61018008e-12 +
                         local_308 * -1.49781651e-08 +
                         local_318 * 1.65714269e-05 + local_6d8 * -0.00209329446 + 4.30646568;
            local_728 = local_518 * 5.37371542e-12 +
                        local_308 * -1.77116571e-08 +
                        local_318 * 1.99812763e-05 + local_6d8 * -0.00275077135 + 4.29142492;
            dStack_720 = local_518 * -4.889708e-13 +
                         local_308 * 1.41037875e-09 +
                         local_318 * -1.321074e-06 + local_6d8 * 0.0007041202 + 3.298677;
            dVar24 = -11522.2055;
            dVar23 = -1020.8999;
          }
          local_728 = dVar31 * dVar24 + local_728;
          dStack_720 = dVar31 * dVar23 + dStack_720;
          local_248 = local_518 * -0.0 +
                      local_308 * -0.0 +
                      local_318 * -0.0 +
                      local_6d8 * -0.0 + local_848 * -2.5 + dVar31 * -745.375 + -1.866;
          uStack_240 = uStack_6d0;
          local_338._8_4_ = (int)uStack_6d0;
          local_338._0_8_ = local_6d8 * 0.0;
          local_338._12_4_ = (int)((ulong)uStack_6d0 >> 0x20);
          uStack_310 = uStack_6d0;
          local_348 = local_318 * 0.0;
          uStack_340 = uStack_6d0;
          uStack_300 = uStack_6d0;
          local_328 = local_308 * 0.0;
          uStack_320 = uStack_6d0;
          local_358 = local_518 * 0.0;
          uStack_350 = uStack_6d0;
          local_718 = dVar31 * -745.375 + local_6d8 * 0.0 + 2.5 + local_348 + local_328 + local_358;
          local_878._8_8_ = 0;
          local_878._0_8_ = dVar31 * -0.0;
          local_6c8._0_8_ = local_848 * -0.8 + dVar31 * -0.0;
          uStack_550 = uStack_570;
          local_7e8._0_8_ =
               local_a48[0x14] * -0.30000000000000004 +
               local_a48[0x12] + local_a48[0x12] +
               local_a48[0xb] * 0.5 + local_a48[5] * 5.0 + local_a48[0] + dVar30 + local_a48[10] +
               local_a48[0xc];
          local_818._0_8_ = local_a48[1] * local_a48[7];
          local_6c8._8_8_ = uStack_840;
          dVar24 = exp((double)local_6c8._0_8_);
          local_858._8_4_ = (int)uStack_990;
          local_858._0_8_ = local_998 * 0.0;
          local_858._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          local_698._8_8_ = 0;
          local_698._0_8_ = dVar31 * -0.8 + local_998 * 0.0;
          local_8b8._0_8_ = dVar24 * 25000000000.0;
          dVar24 = exp(local_848 * -3.14 + dVar31 * -618.9564989398057);
          dVar24 = dVar24 * 3.2e+27 * (((double)local_7e8._0_8_ * 1e-12) / (double)local_8b8._0_8_);
          local_5b8 = ((dVar31 * -3.14 + local_998 * 618.9564989398057) - (double)local_698._0_8_) *
                      0.43429448190325176;
          dStack_5b0 = 0.0;
          local_598 = local_5b8 / (dVar24 + 1.0);
          dStack_590 = 0.0;
          local_898._0_8_ = dVar24 / (dVar24 + 1.0);
          dVar24 = log10(dVar24);
          local_7e8._0_8_ = exp(local_6d8 / -78.0);
          local_7e8._0_8_ = (double)local_7e8._0_8_ * 0.31999999999999995;
          local_8a8 = exp(local_6d8 / -1995.0);
          local_8a8 = local_8a8 * 0.68;
          dVar23 = exp(dVar31 * -5590.0);
          local_6a8 = (double)local_7e8._0_8_ + local_8a8 + dVar23;
          local_7f8._0_8_ = dVar23;
          dVar23 = log10(local_6a8);
          local_7d8._0_8_ = dVar23 * -1.27 + 0.75;
          dVar24 = dVar23 * -0.67 + -0.4 + dVar24;
          dVar27 = 1.0 / (dVar24 * -0.14 + (double)local_7d8._0_8_);
          dVar24 = dVar24 * dVar27;
          dVar25 = 1.0 / (dVar24 * dVar24 + 1.0);
          local_7c8._0_8_ = dVar23;
          local_888._0_8_ = dVar27;
          local_708._0_8_ = dVar24;
          dVar24 = pow(10.0,dVar23 * dVar25);
          dVar23 = ((double)local_7c8._0_8_ + (double)local_7c8._0_8_) * dVar25 * dVar25 *
                   (double)local_708._0_8_ * (double)local_888._0_8_;
          dVar27 = -(double)local_7d8._0_8_ * dVar23 * (double)local_888._0_8_;
          local_7c8._0_8_ =
               (dVar23 * (double)local_708._0_8_ * -1.27 + dVar27 * -0.67 + dVar25) *
               ((double)local_7f8._0_8_ * 5590.0 * local_998 +
               local_8a8 / -1995.0 + (double)local_7e8._0_8_ / -78.0) *
               (0.43429448190325176 / local_6a8) + local_5b8 * dVar27 + local_598;
          local_8a8 = local_a48[9];
          local_7e8._8_8_ = dStack_860;
          local_7e8._0_8_ = dStack_860;
          dVar23 = exp(((double)local_6e8._0_8_ + local_868) - dStack_860);
          dVar23 = (double)local_8b8._0_8_ / (dVar23 * (double)local_8c8._0_8_);
          dVar24 = dVar24 * (double)local_898._0_8_;
          dVar25 = ((double)local_8b8._0_8_ * (double)local_818._0_8_ - local_8a8 * dVar23) * dVar24
          ;
          local_988[1] = local_988[1] - dVar25;
          local_988[7] = local_988[7] - dVar25;
          local_988[9] = dVar25 + local_988[9];
          local_678[0] = 0.0;
          local_678[1] = local_a48[7] * (double)local_8b8._0_8_ * dVar24 + 0.0;
          local_678[6] = 0.0;
          local_678[4] = 0.0;
          local_678[5] = 0.0;
          local_678[2] = 0.0;
          local_678[3] = 0.0;
          local_678[7] = (double)local_8b8._0_8_ * dVar24 * local_a48[1] + 0.0;
          local_678[8] = 0.0;
          local_678[9] = 0.0 - dVar23 * dVar24;
          local_678[10] = 0.0;
          local_678[0xb] = 0.0;
          local_678[0xc] = 0.0;
          local_678[0xd] = 0.0;
          local_678[0xe] = 0.0;
          local_678[0xf] = 0.0;
          local_678[0x10] = 0.0;
          local_678[0x11] = 0.0;
          local_678[0x12] = 0.0;
          local_678[0x13] = 0.0;
          local_678[0x14] = 0.0;
          pdVar13 = pdVar6 + 9;
          lVar10 = 0;
          pdVar12 = pdVar13;
          do {
            pdVar12[-8] = pdVar12[-8] - local_678[lVar10];
            pdVar12[-2] = pdVar12[-2] - local_678[lVar10];
            *pdVar12 = local_678[lVar10] + *pdVar12;
            lVar10 = lVar10 + 1;
            pdVar12 = pdVar12 + 0x16;
          } while (lVar10 != 0x15);
          dVar24 = dVar24 * ((double)local_8b8._0_8_ * (double)local_698._0_8_ *
                             (double)local_818._0_8_ +
                            -((double)local_698._0_8_ -
                             ((dStack_770 - (dStack_7b0 + dStack_780)) + 1.0) * dVar31) * dVar23 *
                            local_8a8) + (double)local_7c8._0_8_ * 2.302585092994046 * dVar25;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar24;
          pdVar6[0x1d5] = pdVar6[0x1d5] - dVar24;
          pdVar6[0x1d7] = dVar24 + pdVar6[0x1d7];
          local_7c8._0_8_ =
               local_a48[0x14] * -0.30000000000000004 +
               local_a48[0x12] + local_a48[0x12] +
               local_a48[0xb] * 0.5 + local_a48[5] * 5.0 + local_a48[0] + dVar30 + local_a48[10] +
               local_a48[0xc];
          local_5b8 = local_a48[1] * local_a48[9];
          local_8b8._0_8_ = exp(local_848 * -0.63 + dVar31 * -192.73198300320777);
          local_8b8._0_8_ = (double)local_8b8._0_8_ * 12700000000.0;
          local_8a8 = dVar31 * -0.63 + local_998 * 192.73198300320777;
          uStack_8a0 = 0;
          dVar24 = exp(local_848 * -4.76 + dVar31 * -1227.8486645635169);
          dVar24 = dVar24 * 2.477e+33 *
                   (((double)local_7c8._0_8_ * 1e-12) / (double)local_8b8._0_8_);
          local_7f8._0_8_ =
               ((dVar31 * -4.76 + local_998 * 1227.8486645635169) - local_8a8) * 0.43429448190325176
          ;
          local_7f8._8_8_ = 0;
          local_598 = (double)local_7f8._0_8_ / (dVar24 + 1.0);
          dStack_590 = 0.0;
          local_7d8._0_8_ = log10(dVar24);
          local_818._0_8_ = exp(local_6d8 / -74.0);
          local_818._0_8_ = (double)local_818._0_8_ * 0.21699999999999997;
          local_898._0_8_ = exp(local_6d8 / -2941.0);
          local_898._0_8_ = (double)local_898._0_8_ * 0.783;
          local_888._0_8_ = exp(dVar31 * -6964.0);
          dVar23 = (double)local_818._0_8_ + (double)local_898._0_8_ + (double)local_888._0_8_;
          local_7c8._0_8_ = log10(dVar23);
          local_6a8 = (double)local_7c8._0_8_ * -1.27 + 0.75;
          dVar27 = (double)local_7c8._0_8_ * -0.67 + -0.4 + (double)local_7d8._0_8_;
          local_708._0_8_ = 1.0 / (dVar27 * -0.14 + local_6a8);
          dVar27 = dVar27 * (double)local_708._0_8_;
          dVar26 = 1.0 / (dVar27 * dVar27 + 1.0);
          local_7d8._0_8_ = pow(10.0,(double)local_7c8._0_8_ * dVar26);
          dVar25 = ((double)local_7c8._0_8_ + (double)local_7c8._0_8_) * dVar26 * dVar26 * dVar27 *
                   (double)local_708._0_8_;
          dVar28 = -local_6a8 * dVar25 * (double)local_708._0_8_;
          local_7c8._0_8_ =
               (dVar25 * dVar27 * -1.27 + dVar28 * -0.67 + dVar26) *
               ((double)local_888._0_8_ * 6964.0 * local_998 +
               (double)local_898._0_8_ / -2941.0 + (double)local_818._0_8_ / -74.0) *
               (0.43429448190325176 / dVar23) + (double)local_7f8._0_8_ * dVar28 + local_598;
          local_818._0_8_ = local_a48[10];
          local_598 = dStack_560;
          dStack_590 = dStack_560;
          dVar23 = exp(((double)local_7e8._0_8_ + local_868) - dStack_560);
          dVar23 = (double)local_8b8._0_8_ / (dVar23 * (double)local_8c8._0_8_);
          dVar25 = (double)local_7d8._0_8_ * (dVar24 / (dVar24 + 1.0));
          dVar24 = ((double)local_8b8._0_8_ * local_5b8 - (double)local_818._0_8_ * dVar23) * dVar25
          ;
          local_988[1] = local_988[1] - dVar24;
          local_988[9] = local_988[9] - dVar24;
          local_988[10] = dVar24 + local_988[10];
          local_678[0] = 0.0;
          local_678[1] = local_a48[9] * (double)local_8b8._0_8_ * dVar25 + 0.0;
          local_678[8] = 0.0;
          local_678[6] = 0.0;
          local_678[7] = 0.0;
          local_678[4] = 0.0;
          local_678[5] = 0.0;
          local_678[2] = 0.0;
          local_678[3] = 0.0;
          local_678[9] = (double)local_8b8._0_8_ * dVar25 * local_a48[1] + 0.0;
          local_678[10] = 0.0 - dVar23 * dVar25;
          local_678[0x13] = 0.0;
          local_678[0x14] = 0.0;
          local_678[0x11] = 0.0;
          local_678[0x12] = 0.0;
          local_678[0xf] = 0.0;
          local_678[0x10] = 0.0;
          local_678[0xd] = 0.0;
          local_678[0xe] = 0.0;
          local_678[0xb] = 0.0;
          local_678[0xc] = 0.0;
          pdVar12 = pdVar6 + 10;
          lVar10 = 0;
          do {
            pdVar12[-9] = pdVar12[-9] - local_678[lVar10];
            pdVar12[-1] = pdVar12[-1] - local_678[lVar10];
            *pdVar12 = local_678[lVar10] + *pdVar12;
            lVar10 = lVar10 + 1;
            pdVar12 = pdVar12 + 0x16;
          } while (lVar10 != 0x15);
          dVar24 = dVar25 * (local_8a8 * (double)local_8b8._0_8_ * local_5b8 +
                            -(local_8a8 - ((local_768 - (dStack_7b0 + dStack_770)) + 1.0) * dVar31)
                            * dVar23 * (double)local_818._0_8_) +
                   (double)local_7c8._0_8_ * 2.302585092994046 * dVar24;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar24;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar24;
          pdVar6[0x1d8] = dVar24 + pdVar6[0x1d8];
          local_7c8._0_8_ =
               local_a48[0x14] * -0.30000000000000004 +
               local_a48[0x12] + local_a48[0x12] +
               local_a48[0xb] * 0.5 + local_a48[5] * 5.0 + local_a48[0] + dVar30 + local_a48[10] +
               local_a48[0xc];
          local_5b8 = local_a48[1] * local_a48[0xd];
          local_8a8 = exp(local_848 * 0.48 + dVar31 * 130.8363331092272);
          local_8a8 = local_8a8 * 1090000.0;
          local_818._8_8_ = 0;
          local_818._0_8_ = dVar31 * 0.48 + local_998 * -130.8363331092272;
          dVar24 = exp(local_848 * -2.57 + dVar31 * -717.083748771726);
          dVar24 = dVar24 * 1.35e+24 * (((double)local_7c8._0_8_ * 1e-12) / local_8a8);
          local_7d8._0_8_ =
               ((dVar31 * -2.57 + local_998 * 717.083748771726) - (double)local_818._0_8_) *
               0.43429448190325176;
          local_7d8._8_8_ = 0;
          local_7f8._8_8_ = 0;
          local_7f8._0_8_ = (double)local_7d8._0_8_ / (dVar24 + 1.0);
          local_888._0_8_ = log10(dVar24);
          dVar23 = exp(local_6d8 / -271.0);
          local_7c8._0_8_ = dVar23 * 0.21760000000000002;
          local_898._0_8_ = exp(local_6d8 / -2755.0);
          local_898._0_8_ = (double)local_898._0_8_ * 0.7824;
          local_6a8 = exp(dVar31 * -6570.0);
          dVar23 = (double)local_7c8._0_8_ + (double)local_898._0_8_ + local_6a8;
          local_8b8._0_8_ = log10(dVar23);
          local_708._0_8_ = (double)local_8b8._0_8_ * -1.27 + 0.75;
          dVar27 = (double)local_8b8._0_8_ * -0.67 + -0.4 + (double)local_888._0_8_;
          dVar26 = 1.0 / (dVar27 * -0.14 + (double)local_708._0_8_);
          dVar27 = dVar27 * dVar26;
          dVar25 = 1.0 / (dVar27 * dVar27 + 1.0);
          local_808._0_8_ = dVar25;
          local_888._0_8_ = pow(10.0,(double)local_8b8._0_8_ * dVar25);
          dVar25 = ((double)local_8b8._0_8_ + (double)local_8b8._0_8_) * (double)local_808._0_8_ *
                   (double)local_808._0_8_ * dVar27 * dVar26;
          dVar26 = -(double)local_708._0_8_ * dVar25 * dVar26;
          local_8b8._0_8_ =
               (dVar25 * dVar27 * -1.27 + dVar26 * -0.67 + (double)local_808._0_8_) *
               (local_6a8 * 6570.0 * local_998 +
               (double)local_898._0_8_ / -2755.0 + (double)local_7c8._0_8_ / -271.0) *
               (0.43429448190325176 / dVar23) + (double)local_7d8._0_8_ * dVar26 +
               (double)local_7f8._0_8_;
          local_898._0_8_ = local_a48[0xe];
          local_7c8._8_4_ = local_828._8_4_;
          local_7c8._0_8_ = local_828._8_8_;
          local_7c8._12_4_ = local_828._12_4_;
          dVar23 = exp((local_828._8_8_ + local_868) - local_688);
          dVar23 = local_8a8 / (dVar23 * (double)local_8c8._0_8_);
          dVar25 = (double)local_888._0_8_ * (dVar24 / (dVar24 + 1.0));
          dVar24 = (local_8a8 * local_5b8 - (double)local_898._0_8_ * dVar23) * dVar25;
          local_988[1] = local_988[1] - dVar24;
          local_988[0xd] = local_988[0xd] - dVar24;
          local_988[0xe] = dVar24 + local_988[0xe];
          local_678[0] = 0.0;
          local_678[1] = local_a48[0xd] * local_8a8 * dVar25 + 0.0;
          local_678[0xc] = 0.0;
          local_678[10] = 0.0;
          local_678[0xb] = 0.0;
          local_678[8] = 0.0;
          local_678[9] = 0.0;
          local_678[6] = 0.0;
          local_678[7] = 0.0;
          local_678[4] = 0.0;
          local_678[5] = 0.0;
          local_678[2] = 0.0;
          local_678[3] = 0.0;
          local_678[0xd] = local_8a8 * dVar25 * local_a48[1] + 0.0;
          local_678[0xe] = 0.0 - dVar23 * dVar25;
          local_678[0x13] = 0.0;
          local_678[0x14] = 0.0;
          local_678[0x11] = 0.0;
          local_678[0x12] = 0.0;
          local_678[0xf] = 0.0;
          local_678[0x10] = 0.0;
          pdVar12 = pdVar6 + 0xe;
          lVar10 = 0;
          pdVar11 = pdVar12;
          do {
            pdVar11[-0xd] = pdVar11[-0xd] - local_678[lVar10];
            pdVar11[-1] = pdVar11[-1] - local_678[lVar10];
            *pdVar11 = local_678[lVar10] + *pdVar11;
            lVar10 = lVar10 + 1;
            pdVar11 = pdVar11 + 0x16;
          } while (lVar10 != 0x15);
          dVar24 = dVar25 * ((double)local_818._0_8_ * local_8a8 * local_5b8 +
                            -((double)local_818._0_8_ -
                             ((local_748 - (dStack_7b0 + dStack_750)) + 1.0) * dVar31) * dVar23 *
                            (double)local_898._0_8_) +
                   (double)local_8b8._0_8_ * 2.302585092994046 * dVar24;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar24;
          pdVar6[0x1db] = pdVar6[0x1db] - dVar24;
          pdVar6[0x1dc] = dVar24 + pdVar6[0x1dc];
          local_8a8 = local_a48[0x12] + local_a48[0x12] +
                      local_a48[0xb] * 0.5 +
                      local_a48[5] * 5.0 + local_a48[0] + dVar30 + local_a48[10] + local_a48[0xc];
          local_7f8._0_8_ = local_848 * 0.454;
          local_7f8._8_8_ = uStack_840;
          local_7d8._0_8_ = local_a48[1] * local_a48[0xe];
          dVar24 = exp(dVar31 * -1308.3633310922721 + (double)local_7f8._0_8_);
          local_8b8._8_8_ = 0;
          local_8b8._0_8_ = dVar31 * 0.454;
          local_898._0_8_ = local_998 * 1308.3633310922721 + dVar31 * 0.454;
          local_898._8_8_ = uStack_990;
          local_818._0_8_ = dVar24 * 540000.0;
          dVar24 = exp(local_848 * -4.8 + dVar31 * -2797.884661874243);
          dVar24 = dVar24 * 2.2e+30 * ((local_8a8 * 1e-12) / (double)local_818._0_8_);
          local_888._0_8_ = dVar24 / (dVar24 + 1.0);
          local_708._0_8_ =
               ((dVar31 * -4.8 + local_998 * 2797.884661874243) - (double)local_898._0_8_) *
               0.43429448190325176;
          local_708._8_8_ = 0;
          local_6a8 = (double)local_708._0_8_ / (dVar24 + 1.0);
          uStack_6a0 = 0;
          dVar24 = log10(dVar24);
          local_5b8 = exp(local_6d8 / -94.0);
          local_5b8 = local_5b8 * 0.242;
          dVar23 = exp(local_6d8 / -1555.0);
          dVar25 = exp(dVar31 * -4200.0);
          dVar27 = local_5b8 + dVar23 * 0.758 + dVar25;
          local_6b8._0_8_ = dVar27;
          local_8a8 = log10(dVar27);
          dVar26 = local_8a8 * -1.27 + 0.75;
          dVar24 = local_8a8 * -0.67 + -0.4 + dVar24;
          local_808._0_8_ = 1.0 / (dVar24 * -0.14 + dVar26);
          local_6f0 = dVar24 * (double)local_808._0_8_;
          local_580 = 1.0 / (local_6f0 * local_6f0 + 1.0);
          dVar24 = pow(10.0,local_8a8 * local_580);
          dVar27 = local_a48[0xf];
          dVar28 = (local_8a8 + local_8a8) * local_580 * local_580 * local_6f0 *
                   (double)local_808._0_8_;
          dVar26 = -dVar26 * dVar28 * (double)local_808._0_8_;
          local_8a8 = (dVar28 * local_6f0 * -1.27 + dVar26 * -0.67 + local_580) *
                      (dVar25 * 4200.0 * local_998 + (dVar23 * 0.758) / -1555.0 + local_5b8 / -94.0)
                      * (0.43429448190325176 / (double)local_6b8._0_8_) +
                      (double)local_708._0_8_ * dVar26 + local_6a8;
          local_5b8 = dStack_540;
          dStack_5b0 = dStack_540;
          dVar23 = exp((local_688 + local_868) - dStack_540);
          dVar23 = (double)local_818._0_8_ / (dVar23 * (double)local_8c8._0_8_);
          dVar24 = dVar24 * (double)local_888._0_8_;
          dVar25 = ((double)local_818._0_8_ * (double)local_7d8._0_8_ - dVar27 * dVar23) * dVar24;
          local_988[1] = local_988[1] - dVar25;
          local_988[0xe] = local_988[0xe] - dVar25;
          local_988[0xf] = dVar25 + local_988[0xf];
          local_678[0] = 0.0;
          local_678[1] = local_a48[0xe] * (double)local_818._0_8_ * dVar24 + 0.0;
          local_678[0xc] = 0.0;
          local_678[0xd] = 0.0;
          local_678[10] = 0.0;
          local_678[0xb] = 0.0;
          local_678[8] = 0.0;
          local_678[9] = 0.0;
          local_678[6] = 0.0;
          local_678[7] = 0.0;
          local_678[4] = 0.0;
          local_678[5] = 0.0;
          local_678[2] = 0.0;
          local_678[3] = 0.0;
          local_678[0xe] = (double)local_818._0_8_ * dVar24 * local_a48[1] + 0.0;
          local_678[0xf] = 0.0 - dVar23 * dVar24;
          local_678[0x14] = 0.0;
          local_678[0x12] = 0.0;
          local_678[0x13] = 0.0;
          local_678[0x10] = 0.0;
          local_678[0x11] = 0.0;
          pdVar11 = pdVar6 + 0xf;
          lVar10 = 0;
          do {
            pdVar11[-0xe] = pdVar11[-0xe] - local_678[lVar10];
            pdVar11[-1] = pdVar11[-1] - local_678[lVar10];
            *pdVar11 = local_678[lVar10] + *pdVar11;
            lVar10 = lVar10 + 1;
            pdVar11 = pdVar11 + 0x16;
          } while (lVar10 != 0x15);
          dVar24 = dVar24 * ((double)local_898._0_8_ * (double)local_818._0_8_ *
                             (double)local_7d8._0_8_ +
                            -((double)local_898._0_8_ -
                             ((dStack_740 - (dStack_7b0 + local_748)) + 1.0) * dVar31) * dVar23 *
                            dVar27) + local_8a8 * 2.302585092994046 * dVar25;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar24;
          pdVar6[0x1dc] = pdVar6[0x1dc] - dVar24;
          pdVar6[0x1dd] = dVar24 + pdVar6[0x1dd];
          local_7d8._0_8_ = local_a48[1] * local_a48[0x10];
          local_8a8 = local_a48[0x14] * -0.30000000000000004 +
                      local_a48[0x12] + local_a48[0x12] +
                      local_a48[0xb] * 0.5 +
                      local_a48[5] * 5.0 + local_a48[0] + dVar30 + local_a48[10] + local_a48[0xc];
          local_818._0_8_ = exp((double)local_7f8._0_8_ + dVar31 * -915.8543317645905);
          local_818._0_8_ = (double)local_818._0_8_ * 1080000.0;
          local_8b8._0_8_ = (double)local_8b8._0_8_ + local_998 * 915.8543317645905;
          dVar24 = exp(local_848 * -7.62 + dVar31 * -3507.4201606588986);
          dVar24 = dVar24 * 1.2e+42 * ((local_8a8 * 1e-12) / (double)local_818._0_8_);
          local_7f8._0_8_ = dVar24 / (dVar24 + 1.0);
          local_6a8 = ((dVar31 * -7.62 + local_998 * 3507.4201606588986) - (double)local_8b8._0_8_)
                      * 0.43429448190325176;
          uStack_6a0 = 0;
          local_888._8_8_ = 0;
          local_888._0_8_ = local_6a8 / (dVar24 + 1.0);
          dVar24 = log10(dVar24);
          local_708._0_8_ = dVar24;
          local_898._0_8_ = exp(local_6d8 / -210.0);
          local_898._0_8_ = (double)local_898._0_8_ * 0.024700000000000055;
          dVar24 = exp(local_6d8 / -984.0);
          dVar23 = exp(dVar31 * -4374.0);
          local_808._0_8_ = (double)local_898._0_8_ + dVar24 * 0.9753 + dVar23;
          local_8a8 = log10((double)local_808._0_8_);
          dVar25 = local_8a8 * -1.27 + 0.75;
          local_6b8._0_8_ = local_8a8 * -0.67 + -0.4 + (double)local_708._0_8_;
          dVar26 = 1.0 / ((double)local_6b8._0_8_ * -0.14 + dVar25);
          local_6b8._0_8_ = (double)local_6b8._0_8_ * dVar26;
          local_6f0 = 1.0 / ((double)local_6b8._0_8_ * (double)local_6b8._0_8_ + 1.0);
          local_708._0_8_ = pow(10.0,local_8a8 * local_6f0);
          dVar27 = (local_8a8 + local_8a8) * local_6f0 * local_6f0 * (double)local_6b8._0_8_ *
                   dVar26;
          dVar26 = -dVar25 * dVar27 * dVar26;
          local_8a8 = (dVar27 * (double)local_6b8._0_8_ * -1.27 + dVar26 * -0.67 + local_6f0) *
                      (dVar23 * 4374.0 * local_998 +
                      (dVar24 * 0.9753) / -984.0 + (double)local_898._0_8_ / -210.0) *
                      (0.43429448190325176 / (double)local_808._0_8_) + local_6a8 * dVar26 +
                      (double)local_888._0_8_;
          local_898._0_8_ = local_a48[0x11];
          dVar24 = exp((local_548 + local_868) - local_578);
          dVar24 = (double)local_818._0_8_ / (dVar24 * (double)local_8c8._0_8_);
          local_7f8._0_8_ = (double)local_708._0_8_ * (double)local_7f8._0_8_;
          dVar23 = ((double)local_818._0_8_ * (double)local_7d8._0_8_ -
                   (double)local_898._0_8_ * dVar24) * (double)local_7f8._0_8_;
          local_988[1] = local_988[1] - dVar23;
          local_988[0x10] = local_988[0x10] - dVar23;
          local_988[0x11] = dVar23 + local_988[0x11];
          local_678[0] = 0.0;
          local_678[1] = local_a48[0x10] * (double)local_818._0_8_ * (double)local_7f8._0_8_ + 0.0;
          local_678[0xe] = 0.0;
          local_678[0xf] = 0.0;
          local_678[0xc] = 0.0;
          local_678[0xd] = 0.0;
          local_678[10] = 0.0;
          local_678[0xb] = 0.0;
          local_678[8] = 0.0;
          local_678[9] = 0.0;
          local_678[6] = 0.0;
          local_678[7] = 0.0;
          local_678[4] = 0.0;
          local_678[5] = 0.0;
          local_678[2] = 0.0;
          local_678[3] = 0.0;
          local_678[0x10] = (double)local_818._0_8_ * (double)local_7f8._0_8_ * local_a48[1] + 0.0;
          local_678[0x11] = 0.0 - dVar24 * (double)local_7f8._0_8_;
          local_678[0x14] = 0.0;
          local_678[0x12] = 0.0;
          local_678[0x13] = 0.0;
          pdVar11 = pdVar6 + 0x11;
          lVar10 = 0;
          do {
            pdVar11[-0x10] = pdVar11[-0x10] - local_678[lVar10];
            pdVar11[-1] = pdVar11[-1] - local_678[lVar10];
            *pdVar11 = local_678[lVar10] + *pdVar11;
            lVar10 = lVar10 + 1;
            pdVar11 = pdVar11 + 0x16;
          } while (lVar10 != 0x15);
          dVar24 = (double)local_7f8._0_8_ *
                   ((double)local_8b8._0_8_ * (double)local_818._0_8_ * (double)local_7d8._0_8_ +
                   -((double)local_8b8._0_8_ -
                    ((dStack_730 - (dStack_7b0 + local_738)) + 1.0) * dVar31) * dVar24 *
                   (double)local_898._0_8_) + local_8a8 * 2.302585092994046 * dVar23;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar24;
          pdVar6[0x1de] = pdVar6[0x1de] - dVar24;
          pdVar6[0x1df] = dVar24 + pdVar6[0x1df];
          local_8b8._0_8_ =
               local_a48[0x14] * -0.30000000000000004 +
               local_a48[0x12] + local_a48[0x12] +
               local_a48[0xb] * 0.5 + local_a48[5] * 5.0 + local_a48[0] + dVar30 + local_a48[10] +
               local_a48[0xc];
          local_7f8._0_8_ = local_a48[1] * local_a48[0x11];
          local_8a8 = exp(local_848 * -0.99 + dVar31 * -795.0823319714576);
          local_8a8 = local_8a8 * 521000000000.0;
          local_818._8_8_ = 0;
          local_818._0_8_ = dVar31 * -0.99 + local_998 * 795.0823319714576;
          dVar24 = exp(local_848 * -7.08 + dVar31 * -3364.003410904553);
          dVar24 = dVar24 * 1.99e+41 * (((double)local_8b8._0_8_ * 1e-12) / local_8a8);
          local_7d8._0_8_ = dVar24 / (dVar24 + 1.0);
          local_6a8 = ((dVar31 * -7.08 + local_998 * 3364.003410904553) - (double)local_818._0_8_) *
                      0.43429448190325176;
          uStack_6a0 = 0;
          local_888._8_8_ = 0;
          local_888._0_8_ = local_6a8 / (dVar24 + 1.0);
          local_708._0_8_ = log10(dVar24);
          local_898._0_8_ = exp(local_6d8 / -125.0);
          local_898._0_8_ = (double)local_898._0_8_ * 0.15780000000000005;
          dVar24 = exp(local_6d8 / -2219.0);
          dVar23 = exp(dVar31 * -6882.0);
          local_808._0_8_ = (double)local_898._0_8_ + dVar24 * 0.8422 + dVar23;
          local_8b8._0_8_ = log10((double)local_808._0_8_);
          dVar25 = (double)local_8b8._0_8_ * -1.27 + 0.75;
          local_6b8._0_8_ = (double)local_8b8._0_8_ * -0.67 + -0.4 + (double)local_708._0_8_;
          dVar26 = 1.0 / ((double)local_6b8._0_8_ * -0.14 + dVar25);
          local_6b8._0_8_ = (double)local_6b8._0_8_ * dVar26;
          local_6f0 = 1.0 / ((double)local_6b8._0_8_ * (double)local_6b8._0_8_ + 1.0);
          local_708._0_8_ = pow(10.0,(double)local_8b8._0_8_ * local_6f0);
          dVar27 = ((double)local_8b8._0_8_ + (double)local_8b8._0_8_) * local_6f0 * local_6f0 *
                   (double)local_6b8._0_8_ * dVar26;
          dVar26 = -dVar25 * dVar27 * dVar26;
          local_8b8._0_8_ =
               (dVar27 * (double)local_6b8._0_8_ * -1.27 + dVar26 * -0.67 + local_6f0) *
               (dVar23 * 6882.0 * local_998 +
               (dVar24 * 0.8422) / -2219.0 + (double)local_898._0_8_ / -125.0) *
               (0.43429448190325176 / (double)local_808._0_8_) + local_6a8 * dVar26 +
               (double)local_888._0_8_;
          local_898._0_8_ = local_a48[0x12];
          dVar24 = exp((local_868 + local_578) - local_558);
          dVar24 = local_8a8 / (dVar24 * (double)local_8c8._0_8_);
          dVar25 = (double)local_708._0_8_ * (double)local_7d8._0_8_;
          dVar23 = (local_8a8 * (double)local_7f8._0_8_ - (double)local_898._0_8_ * dVar24) * dVar25
          ;
          local_988[1] = local_988[1] - dVar23;
          local_988[0x11] = local_988[0x11] - dVar23;
          local_988[0x12] = dVar23 + local_988[0x12];
          local_678[0] = 0.0;
          local_678[1] = local_a48[0x11] * local_8a8 * dVar25 + 0.0;
          local_678[0x10] = 0.0;
          local_678[0xe] = 0.0;
          local_678[0xf] = 0.0;
          local_678[0xc] = 0.0;
          local_678[0xd] = 0.0;
          local_678[10] = 0.0;
          local_678[0xb] = 0.0;
          local_678[8] = 0.0;
          local_678[9] = 0.0;
          local_678[6] = 0.0;
          local_678[7] = 0.0;
          local_678[4] = 0.0;
          local_678[5] = 0.0;
          local_678[2] = 0.0;
          local_678[3] = 0.0;
          local_678[0x11] = local_8a8 * dVar25 * local_a48[1] + 0.0;
          local_678[0x12] = 0.0 - dVar24 * dVar25;
          local_678[0x13] = 0.0;
          local_678[0x14] = 0.0;
          pdVar11 = pdVar6 + 0x12;
          lVar10 = 0;
          do {
            pdVar11[-0x11] = pdVar11[-0x11] - local_678[lVar10];
            pdVar11[-1] = pdVar11[-1] - local_678[lVar10];
            *pdVar11 = local_678[lVar10] + *pdVar11;
            lVar10 = lVar10 + 1;
            pdVar11 = pdVar11 + 0x16;
          } while (lVar10 != 0x15);
          dVar24 = dVar25 * ((double)local_818._0_8_ * local_8a8 * (double)local_7f8._0_8_ +
                            -((double)local_818._0_8_ -
                             ((local_728 - (dStack_7b0 + dStack_730)) + 1.0) * dVar31) * dVar24 *
                            (double)local_898._0_8_) +
                   (double)local_8b8._0_8_ * 2.302585092994046 * dVar23;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar24;
          pdVar6[0x1df] = pdVar6[0x1df] - dVar24;
          pdVar6[0x1e0] = dVar24 + pdVar6[0x1e0];
          local_7f8._0_8_ = local_a48[0] * local_a48[0xb];
          local_8b8._0_8_ =
               local_a48[0x14] * -0.30000000000000004 +
               local_a48[0x12] + local_a48[0x12] +
               local_a48[0xb] * 0.5 + local_a48[5] * 5.0 + dVar30 + local_a48[0] + local_a48[10] +
               local_a48[0xc];
          dVar28 = local_848 * 1.5;
          local_8a8 = exp(dVar31 * -40056.04659805571 + dVar28);
          local_8a8 = local_8a8 * 43.0;
          local_7d8._8_8_ = 0;
          local_7d8._0_8_ = dVar31 * 1.5;
          local_898._0_8_ = local_998 * 40056.04659805571 + dVar31 * 1.5;
          local_898._8_8_ = uStack_990;
          dVar24 = exp(local_848 * -3.42 + dVar31 * -42446.32576062813);
          dVar24 = dVar24 * 5.07e+27 * (((double)local_8b8._0_8_ * 1e-12) / local_8a8);
          local_708._0_8_ =
               ((dVar31 * -3.42 + local_998 * 42446.32576062813) - (double)local_898._0_8_) *
               0.43429448190325176;
          local_708._8_8_ = 0;
          local_6a8 = (double)local_708._0_8_ / (dVar24 + 1.0);
          uStack_6a0 = 0;
          local_888._0_8_ = dVar24 / (dVar24 + 1.0);
          dVar24 = log10(dVar24);
          dVar23 = exp(local_6d8 / -197.0);
          local_818._0_8_ = dVar23 * 0.06799999999999995;
          dVar23 = exp(local_6d8 / -1540.0);
          dVar25 = exp(dVar31 * -10300.0);
          local_6f0 = (double)local_818._0_8_ + dVar23 * 0.932 + dVar25;
          local_8b8._0_8_ = log10(local_6f0);
          local_808._8_8_ = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
          local_808._0_8_ = (double)local_8b8._0_8_ * -1.27 + 0.75;
          dVar24 = (double)local_8b8._0_8_ * -0.67 + -0.4 + dVar24;
          local_6b8._0_8_ = 1.0 / (dVar24 * -0.14 + (double)local_808._0_8_);
          local_580 = dVar24 * (double)local_6b8._0_8_;
          local_538 = 1.0 / (local_580 * local_580 + 1.0);
          dVar24 = pow(10.0,(double)local_8b8._0_8_ * local_538);
          dVar27 = local_a48[0xe];
          dVar26 = ((double)local_8b8._0_8_ + (double)local_8b8._0_8_) * local_538 * local_538 *
                   local_580 * (double)local_6b8._0_8_;
          dVar29 = -(double)local_808._0_8_ * dVar26 * (double)local_6b8._0_8_;
          local_8b8._0_8_ =
               (dVar26 * local_580 * -1.27 + dVar29 * -0.67 + local_538) *
               (dVar25 * 10300.0 * local_998 +
               (dVar23 * 0.932) / -1540.0 + (double)local_818._0_8_ / -197.0) *
               (0.43429448190325176 / local_6f0) + (double)local_708._0_8_ * dVar29 + local_6a8;
          local_818._8_4_ = SUB84(dStack_680,0);
          local_818._0_8_ = dStack_680;
          local_818._12_4_ = (int)((ulong)dStack_680 >> 0x20);
          dVar23 = exp((dStack_680 + (double)local_838._0_8_) - local_688);
          dVar23 = local_8a8 / (dVar23 * (double)local_8c8._0_8_);
          dVar24 = dVar24 * (double)local_888._0_8_;
          dVar25 = (local_8a8 * (double)local_7f8._0_8_ - dVar27 * dVar23) * dVar24;
          local_988[0] = local_988[0] - dVar25;
          local_988[0xb] = local_988[0xb] - dVar25;
          local_988[0xe] = dVar25 + local_988[0xe];
          local_678[0] = local_a48[0xb] * local_8a8 * dVar24 + 0.0;
          local_678[1] = 0.0;
          local_678[2] = 0.0;
          local_678[3] = 0.0;
          local_678[4] = 0.0;
          local_678[5] = 0.0;
          local_678[6] = 0.0;
          local_678[7] = 0.0;
          local_678[8] = 0.0;
          local_678[9] = 0.0;
          local_678[10] = 0.0;
          local_678[0xb] = local_8a8 * dVar24 * local_a48[0] + 0.0;
          local_678[0xc] = 0.0;
          local_678[0xd] = 0.0;
          local_678[0xe] = 0.0 - dVar23 * dVar24;
          local_678[0x13] = 0.0;
          local_678[0x14] = 0.0;
          local_678[0x11] = 0.0;
          local_678[0x12] = 0.0;
          local_678[0xf] = 0.0;
          local_678[0x10] = 0.0;
          lVar10 = 0;
          do {
            pdVar12[-0xe] = pdVar12[-0xe] - local_678[lVar10];
            pdVar12[-3] = pdVar12[-3] - local_678[lVar10];
            *pdVar12 = local_678[lVar10] + *pdVar12;
            lVar10 = lVar10 + 1;
            pdVar12 = pdVar12 + 0x16;
          } while (lVar10 != 0x15);
          dVar24 = dVar24 * ((double)local_898._0_8_ * local_8a8 * (double)local_7f8._0_8_ +
                            -((double)local_898._0_8_ -
                             ((local_748 - (local_7b8 + dStack_760)) + 1.0) * dVar31) * dVar23 *
                            dVar27) + (double)local_8b8._0_8_ * 2.302585092994046 * dVar25;
          pdVar6[0x1ce] = pdVar6[0x1ce] - dVar24;
          pdVar6[0x1d9] = pdVar6[0x1d9] - dVar24;
          pdVar6[0x1dc] = dVar24 + pdVar6[0x1dc];
          local_8b8._0_8_ =
               local_a48[0x14] * -0.30000000000000004 +
               local_a48[0x12] + local_a48[0x12] +
               local_a48[0xb] * 0.5 + local_a48[5] * 5.0 + local_a48[0] + dVar30 + local_a48[10] +
               local_a48[0xc];
          local_888._0_8_ = local_a48[9] * local_a48[9];
          local_8a8 = exp(local_848 * -0.97 + dVar31 * -311.9943327989264);
          local_8a8 = local_8a8 * 21200000000.0;
          local_898._8_8_ = 0;
          local_898._0_8_ = dVar31 * -0.97 + local_998 * 311.9943327989264;
          dVar24 = exp(local_848 * -9.67 + dVar31 * -3130.0076613053584);
          dVar24 = dVar24 * 1.77e+50 * (((double)local_8b8._0_8_ * 1e-12) / local_8a8);
          local_708._0_8_ = dVar24 / (dVar24 + 1.0);
          dVar26 = ((dVar31 * -9.67 + local_998 * 3130.0076613053584) - (double)local_898._0_8_) *
                   0.43429448190325176;
          local_6a8 = dVar26 / (dVar24 + 1.0);
          uStack_6a0 = 0;
          dVar24 = log10(dVar24);
          dVar23 = exp(local_6d8 / -151.0);
          dVar25 = exp(local_6d8 / -1038.0);
          local_7f8._0_8_ = dVar25 * 0.5325;
          local_808._0_8_ = exp(dVar31 * -4970.0);
          local_580 = dVar23 * 0.4675 + (double)local_7f8._0_8_ + (double)local_808._0_8_;
          local_8b8._0_8_ = log10(local_580);
          local_6b8._8_8_ = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
          local_6b8._0_8_ = (double)local_8b8._0_8_ * -1.27 + 0.75;
          dVar24 = (double)local_8b8._0_8_ * -0.67 + -0.4 + dVar24;
          local_6f0 = 1.0 / (dVar24 * -0.14 + (double)local_6b8._0_8_);
          local_538 = dVar24 * local_6f0;
          local_370 = 1.0 / (local_538 * local_538 + 1.0);
          dVar24 = pow(10.0,(double)local_8b8._0_8_ * local_370);
          dVar25 = local_a48[0x12];
          dVar27 = ((double)local_8b8._0_8_ + (double)local_8b8._0_8_) * local_370 * local_370 *
                   local_538 * local_6f0;
          dVar29 = -(double)local_6b8._0_8_ * dVar27 * local_6f0;
          local_8b8._0_8_ =
               (dVar27 * local_538 * -1.27 + dVar29 * -0.67 + local_370) *
               ((double)local_808._0_8_ * 4970.0 * local_998 +
               (double)local_7f8._0_8_ / -1038.0 + (dVar23 * 0.4675) / -151.0) *
               (0.43429448190325176 / local_580) + dVar26 * dVar29 + local_6a8;
          local_6a8 = (double)local_7e8._0_8_ + (double)local_7e8._0_8_;
          dVar23 = exp(local_6a8 - local_558);
          dVar23 = local_8a8 / (dVar23 * (double)local_8c8._0_8_);
          dVar24 = dVar24 * (double)local_708._0_8_;
          dVar27 = (local_8a8 * (double)local_888._0_8_ - dVar25 * dVar23) * dVar24;
          local_988[9] = local_988[9] - (dVar27 + dVar27);
          local_988[0x12] = dVar27 + local_988[0x12];
          local_678[0] = 0.0;
          local_678[1] = 0.0;
          local_678[2] = 0.0;
          local_678[3] = 0.0;
          local_678[4] = 0.0;
          local_678[5] = 0.0;
          local_678[6] = 0.0;
          local_678[7] = 0.0;
          local_678[8] = 0.0;
          local_678[9] = (local_8a8 * dVar24 + local_8a8 * dVar24) * local_a48[9] + 0.0;
          local_678[0x10] = 0.0;
          local_678[0x11] = 0.0;
          local_678[0xe] = 0.0;
          local_678[0xf] = 0.0;
          local_678[0xc] = 0.0;
          local_678[0xd] = 0.0;
          local_678[10] = 0.0;
          local_678[0xb] = 0.0;
          local_678[0x12] = 0.0 - dVar23 * dVar24;
          local_678[0x13] = 0.0;
          local_678[0x14] = 0.0;
          lVar10 = 0;
          do {
            *pdVar13 = *pdVar13 - (local_678[lVar10] + local_678[lVar10]);
            pdVar13[9] = local_678[lVar10] + pdVar13[9];
            lVar10 = lVar10 + 1;
            pdVar13 = pdVar13 + 0x16;
          } while (lVar10 != 0x15);
          dVar24 = dVar24 * ((double)local_898._0_8_ * local_8a8 * (double)local_888._0_8_ +
                            -((double)local_898._0_8_ -
                             ((local_728 - (dStack_770 + dStack_770)) + 1.0) * dVar31) * dVar23 *
                            dVar25) + (double)local_8b8._0_8_ * 2.302585092994046 * dVar27;
          pdVar6[0x1d7] = pdVar6[0x1d7] - (dVar24 + dVar24);
          pdVar6[0x1e0] = dVar24 + pdVar6[0x1e0];
          local_8b8._8_8_ = 0;
          local_8b8._0_8_ = local_a48[1] * local_a48[2];
          local_8a8 = local_a48[0x12] + local_a48[0x12] +
                      local_a48[0xb] * 0.5 +
                      local_a48[5] * 5.0 + local_a48[0] + dVar30 + local_a48[10] + local_a48[0xc];
          uStack_8a0 = 0;
          dVar24 = local_878._0_8_ - local_848;
          local_898._8_8_ = 0;
          local_898._0_8_ = local_a48[0x14];
          local_708._8_4_ = local_878._8_4_;
          local_708._0_8_ = dVar24;
          local_708._12_4_ = local_878._12_4_;
          dVar24 = exp(dVar24);
          dVar23 = local_a48[4];
          local_888._8_4_ = extraout_XMM0_Dc_02;
          local_888._0_8_ = dVar24 * 500000.0;
          local_888._12_4_ = extraout_XMM0_Dd_02;
          local_7f8._8_4_ = local_858._8_4_;
          local_7f8._0_8_ = local_858._0_8_ - dVar31;
          local_7f8._12_4_ = local_858._12_4_;
          dVar24 = exp(((double)local_8d8._0_8_ + local_868) - (double)local_828._0_8_);
          dVar24 = (double)local_888._0_8_ / (dVar24 * (double)local_8c8._0_8_);
          local_8a8 = (double)local_898._0_8_ * -0.30000000000000004 + local_8a8;
          local_678[3] = (double)local_8b8._0_8_ * (double)local_888._0_8_ + -dVar24 * dVar23;
          dVar25 = local_8a8 * local_678[3];
          local_988[1] = local_988[1] - dVar25;
          local_988[2] = local_988[2] - dVar25;
          local_988[4] = dVar25 + local_988[4];
          local_678[1] = (double)local_888._0_8_ * local_8a8 * local_a48[2] + local_678[3];
          local_678[2] = (double)local_888._0_8_ * local_8a8 * local_a48[1] + local_678[3];
          local_678[4] = local_678[3] - dVar24 * local_8a8;
          local_678[5] = local_678[3] * 6.0;
          local_678[8] = local_678[3];
          local_678[9] = local_678[3];
          local_678[6] = local_678[3];
          local_678[7] = local_678[3];
          local_678[0] = local_678[3] * 2.0;
          local_678[10] = local_678[0];
          local_678[0xb] = local_678[3] * 1.5;
          local_678[0xc] = local_678[0];
          local_678[0xf] = local_678[3];
          local_678[0x10] = local_678[3];
          local_678[0xd] = local_678[3];
          local_678[0xe] = local_678[3];
          local_678[0x11] = local_678[3];
          local_678[0x12] = local_678[3] * 3.0;
          local_678[0x13] = local_678[3];
          local_678[0x14] = local_678[3] * 0.7;
          pdVar13 = pdVar6 + 1;
          lVar10 = 0;
          pdVar12 = pdVar13;
          do {
            *pdVar12 = *pdVar12 - local_678[lVar10];
            pdVar12[1] = pdVar12[1] - local_678[lVar10];
            pdVar12[3] = local_678[lVar10] + pdVar12[3];
            lVar10 = lVar10 + 1;
            pdVar12 = pdVar12 + 0x16;
          } while (lVar10 != 0x15);
          local_8a8 = ((double)local_7f8._0_8_ * (double)local_888._0_8_ * (double)local_8b8._0_8_ -
                      ((double)local_7f8._0_8_ -
                      ((local_798 - (dStack_7b0 + local_7a8)) + 1.0) * dVar31) * dVar24 * dVar23) *
                      local_8a8;
          auVar7._8_4_ = SUB84(pdVar6[0x1d0] - local_8a8,0);
          auVar7._0_8_ = pdVar6[0x1cf] - local_8a8;
          auVar7._12_4_ = (int)((ulong)(pdVar6[0x1d0] - local_8a8) >> 0x20);
          *(undefined1 (*) [16])(pdVar6 + 0x1cf) = auVar7;
          pdVar6[0x1d2] = local_8a8 + pdVar6[0x1d2];
          local_898._8_8_ = 0;
          local_898._0_8_ =
               local_a48[0x14] * -0.5 +
               local_a48[0x12] + local_a48[0x12] +
               local_a48[0xc] * 2.5 +
               local_a48[0xb] * 0.5 +
               local_a48[5] * 5.0 + local_a48[3] * 5.0 + local_a48[0] + dVar30 + local_a48[10];
          dVar27 = local_a48[0xb] * local_a48[2];
          local_8a8 = local_848 * 0.0;
          uStack_8a0 = uStack_840;
          dVar24 = exp(dVar31 * -1509.64999741416 + local_8a8);
          dVar24 = dVar24 * 602.0;
          local_8b8._8_8_ = 0;
          local_8b8._0_8_ = dVar31 * 0.0;
          dVar25 = local_998 * 1509.64999741416 + dVar31 * 0.0;
          local_888._0_8_ = local_a48[0xc];
          dVar23 = exp(((double)local_818._0_8_ + (double)local_8d8._0_8_) - local_568);
          dVar23 = dVar24 / (dVar23 * (double)local_8c8._0_8_);
          local_678[1] = dVar24 * dVar27 - (double)local_888._0_8_ * dVar23;
          dVar26 = (double)local_898._0_8_ * local_678[1];
          local_988[2] = local_988[2] - dVar26;
          local_988[0xb] = local_988[0xb] - dVar26;
          local_988[0xc] = dVar26 + local_988[0xc];
          local_678[0] = local_678[1] + local_678[1];
          local_678[2] = local_a48[0xb] * dVar24 * (double)local_898._0_8_ + local_678[1];
          local_678[3] = local_678[1] * 6.0;
          local_678[4] = local_678[1];
          local_678[5] = local_678[1] * 6.0;
          local_678[8] = local_678[1];
          local_678[9] = local_678[1];
          local_678[6] = local_678[1];
          local_678[7] = local_678[1];
          local_678[10] = local_678[1] + local_678[1];
          local_678[0xb] = local_678[1] * 1.5 + dVar24 * (double)local_898._0_8_ * local_a48[2];
          local_678[0xc] = local_678[1] * 3.5 + (double)local_898._0_8_ * -dVar23;
          local_678[0xf] = local_678[1];
          local_678[0x10] = local_678[1];
          local_678[0xd] = local_678[1];
          local_678[0xe] = local_678[1];
          local_678[0x11] = local_678[1];
          local_678[0x12] = local_678[1] * 3.0;
          local_678[0x13] = local_678[1];
          local_678[0x14] = local_678[1] * 0.5;
          pdVar12 = pdVar6 + 0xc;
          lVar10 = 0;
          do {
            pdVar12[-10] = pdVar12[-10] - local_678[lVar10];
            pdVar12[-1] = pdVar12[-1] - local_678[lVar10];
            *pdVar12 = local_678[lVar10] + *pdVar12;
            lVar10 = lVar10 + 1;
            pdVar12 = pdVar12 + 0x16;
          } while (lVar10 != 0x15);
          dVar24 = (double)local_898._0_8_ *
                   (dVar25 * dVar24 * dVar27 -
                   (dVar25 - ((local_758 - (local_7a8 + dStack_760)) + 1.0) * dVar31) * dVar23 *
                   (double)local_888._0_8_);
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar24;
          pdVar6[0x1d9] = pdVar6[0x1d9] - dVar24;
          pdVar6[0x1da] = dVar24 + pdVar6[0x1da];
          local_888._0_8_ =
               ((local_a48[0x12] * 0.5 +
                local_a48[0xc] * 0.5 +
                local_a48[0xb] * -0.25 + ((dVar30 - local_a48[3]) - local_a48[5])) - local_a48[0x13]
               ) - local_a48[0x14];
          dVar26 = local_a48[3] * local_a48[1];
          local_6b8._0_8_ = exp(local_848 * -0.86 + (double)local_878._0_8_);
          dVar25 = local_a48[6];
          local_6b8._0_8_ = (double)local_6b8._0_8_ * 2800000.0;
          local_808._8_8_ = 0;
          local_808._0_8_ = dVar31 * -0.86 + (double)local_858._0_8_;
          local_898._8_4_ = local_6e8._8_4_;
          local_898._0_8_ = local_6e8._8_8_;
          local_898._12_4_ = local_6e8._12_4_;
          dVar24 = (local_6e8._8_8_ + local_868) - local_5c8;
          dVar23 = exp(dVar24);
          dVar23 = (double)local_6b8._0_8_ / (dVar23 * (double)local_8c8._0_8_);
          local_678[0] = (double)local_6b8._0_8_ * dVar26 - dVar25 * dVar23;
          dVar27 = (double)local_888._0_8_ * local_678[0];
          local_988[1] = local_988[1] - dVar27;
          local_988[3] = local_988[3] - dVar27;
          local_988[6] = dVar27 + local_988[6];
          local_678[1] = local_a48[3] * (double)local_6b8._0_8_ * (double)local_888._0_8_ +
                         local_678[0];
          local_678[2] = local_678[0];
          local_678[3] = (double)local_6b8._0_8_ * (double)local_888._0_8_ * local_a48[1];
          local_678[4] = local_678[0];
          local_678[5] = 0.0;
          local_678[6] = local_678[0] - dVar23 * (double)local_888._0_8_;
          local_678[9] = local_678[0];
          local_678[10] = local_678[0];
          local_678[7] = local_678[0];
          local_678[8] = local_678[0];
          local_678[0xb] = local_678[0] * 0.75;
          local_678[0xc] = local_678[0] * 1.5;
          local_678[0xf] = local_678[0];
          local_678[0x10] = local_678[0];
          local_678[0xd] = local_678[0];
          local_678[0xe] = local_678[0];
          local_678[0x11] = local_678[0];
          local_678[0x12] = local_678[0] * 1.5;
          local_678[0x13] = 0.0;
          local_678[0x14] = 0.0;
          lVar10 = 0;
          pdVar12 = pdVar13;
          do {
            *pdVar12 = *pdVar12 - local_678[lVar10];
            pdVar12[2] = pdVar12[2] - local_678[lVar10];
            pdVar12[5] = local_678[lVar10] + pdVar12[5];
            lVar10 = lVar10 + 1;
            pdVar12 = pdVar12 + 0x16;
          } while (lVar10 != 0x15);
          dVar23 = (double)local_888._0_8_ *
                   ((double)local_808._0_8_ * (double)local_6b8._0_8_ * dVar26 -
                   ((double)local_808._0_8_ -
                   ((local_788 - (dStack_7b0 + dStack_7a0)) + 1.0) * dVar31) * dVar23 * dVar25);
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar23;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar23;
          pdVar6[0x1d4] = dVar23 + pdVar6[0x1d4];
          dVar23 = local_a48[3] * local_a48[3] * local_a48[1];
          dVar27 = local_848 * -1.72 + (double)local_878._0_8_;
          dVar25 = exp(dVar27);
          local_6b8._0_8_ = dVar25 * 300000000.0;
          local_888._8_8_ = 0;
          local_888._0_8_ = dVar31 * -1.72 + (double)local_858._0_8_;
          local_808._0_8_ = local_a48[3] * local_a48[6];
          dVar25 = exp(dVar24);
          dVar25 = (double)local_6b8._0_8_ / (dVar25 * (double)local_8c8._0_8_);
          dVar26 = (double)local_6b8._0_8_ * dVar23 - (double)local_808._0_8_ * dVar25;
          local_988[1] = local_988[1] - dVar26;
          local_988[3] = local_988[3] - dVar26;
          local_988[6] = dVar26 + local_988[6];
          dVar26 = local_a48[3] * local_a48[3] * (double)local_6b8._0_8_;
          pdVar6[0x17] = pdVar6[0x17] - dVar26;
          pdVar6[0x19] = pdVar6[0x19] - dVar26;
          pdVar6[0x1c] = dVar26 + pdVar6[0x1c];
          dVar26 = ((double)local_6b8._0_8_ * local_a48[1] + (double)local_6b8._0_8_ * local_a48[1])
                   * local_a48[3] - dVar25 * local_a48[6];
          pdVar6[0x43] = pdVar6[0x43] - dVar26;
          pdVar6[0x45] = pdVar6[0x45] - dVar26;
          dVar23 = (double)local_888._0_8_ * (double)local_6b8._0_8_ * dVar23 -
                   ((double)local_888._0_8_ -
                   (((dStack_7a0 + local_788) - (dStack_7a0 + dStack_7a0 + dStack_7b0)) + 1.0) *
                   dVar31) * dVar25 * (double)local_808._0_8_;
          pdVar6[0x48] = dVar26 + pdVar6[0x48];
          dVar25 = -dVar25 * local_a48[3];
          pdVar6[0x85] = pdVar6[0x85] - dVar25;
          pdVar6[0x87] = pdVar6[0x87] - dVar25;
          pdVar6[0x8a] = dVar25 + pdVar6[0x8a];
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar23;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar23;
          pdVar6[0x1d4] = dVar23 + pdVar6[0x1d4];
          dVar29 = local_a48[3] * local_a48[1] * local_a48[5];
          local_6f0 = exp(local_848 * -0.76 + (double)local_878._0_8_);
          local_6f0 = local_6f0 * 9380000.0;
          local_6b8._8_8_ = 0;
          local_6b8._0_8_ = dVar31 * -0.76 + (double)local_858._0_8_;
          local_808._0_8_ = local_a48[5] * local_a48[6];
          dVar23 = exp(dVar24);
          dVar23 = local_6f0 / (dVar23 * (double)local_8c8._0_8_);
          dVar25 = local_6f0 * dVar29 - (double)local_808._0_8_ * dVar23;
          local_988[1] = local_988[1] - dVar25;
          local_988[3] = local_988[3] - dVar25;
          local_988[6] = dVar25 + local_988[6];
          dVar25 = local_6f0 * local_a48[3] * local_a48[5];
          pdVar6[0x17] = pdVar6[0x17] - dVar25;
          pdVar6[0x19] = pdVar6[0x19] - dVar25;
          pdVar6[0x1c] = dVar25 + pdVar6[0x1c];
          dVar25 = -dVar23 * local_a48[5];
          dVar26 = local_a48[5] * local_6f0 * local_a48[1];
          pdVar6[0x43] = pdVar6[0x43] - dVar26;
          pdVar6[0x45] = pdVar6[0x45] - dVar26;
          dVar29 = (double)local_6b8._0_8_ * local_6f0 * dVar29 -
                   ((double)local_6b8._0_8_ -
                   (((dStack_790 + local_788) - (dStack_7b0 + dStack_7a0 + dStack_790)) + 1.0) *
                   dVar31) * dVar23 * (double)local_808._0_8_;
          pdVar6[0x48] = dVar26 + pdVar6[0x48];
          dVar23 = local_6f0 * local_a48[1] * local_a48[3] - dVar23 * local_a48[6];
          pdVar6[0x6f] = pdVar6[0x6f] - dVar23;
          pdVar6[0x71] = pdVar6[0x71] - dVar23;
          pdVar6[0x74] = dVar23 + pdVar6[0x74];
          pdVar6[0x85] = pdVar6[0x85] - dVar25;
          pdVar6[0x87] = pdVar6[0x87] - dVar25;
          pdVar6[0x8a] = dVar25 + pdVar6[0x8a];
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar29;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar29;
          pdVar6[0x1d4] = dVar29 + pdVar6[0x1d4];
          dVar29 = local_a48[3] * local_a48[1] * local_a48[0x13];
          local_808._0_8_ = exp(dVar27);
          local_808._0_8_ = (double)local_808._0_8_ * 375000000.0;
          dVar23 = local_a48[6] * local_a48[0x13];
          dVar25 = exp(dVar24);
          dVar25 = (double)local_808._0_8_ / (dVar25 * (double)local_8c8._0_8_);
          dVar27 = (double)local_808._0_8_ * dVar29 - dVar23 * dVar25;
          local_988[1] = local_988[1] - dVar27;
          local_988[3] = local_988[3] - dVar27;
          local_988[6] = dVar27 + local_988[6];
          dVar27 = (double)local_808._0_8_ * local_a48[3] * local_a48[0x13];
          pdVar6[0x17] = pdVar6[0x17] - dVar27;
          pdVar6[0x19] = pdVar6[0x19] - dVar27;
          pdVar6[0x1c] = dVar27 + pdVar6[0x1c];
          dVar27 = -dVar25 * local_a48[0x13];
          dVar26 = local_a48[0x13] * (double)local_808._0_8_ * local_a48[1];
          pdVar6[0x43] = pdVar6[0x43] - dVar26;
          pdVar6[0x45] = pdVar6[0x45] - dVar26;
          pdVar6[0x48] = dVar26 + pdVar6[0x48];
          pdVar6[0x85] = pdVar6[0x85] - dVar27;
          pdVar6[0x87] = pdVar6[0x87] - dVar27;
          pdVar6[0x8a] = dVar27 + pdVar6[0x8a];
          dVar27 = (double)local_888._0_8_ * (double)local_808._0_8_ * dVar29 -
                   ((double)local_888._0_8_ -
                   (((dStack_720 + local_788) - (dStack_7b0 + dStack_7a0 + dStack_720)) + 1.0) *
                   dVar31) * dVar25 * dVar23;
          dVar23 = (double)local_808._0_8_ * local_a48[1] * local_a48[3] - dVar25 * local_a48[6];
          pdVar6[0x1a3] = pdVar6[0x1a3] - dVar23;
          pdVar6[0x1a5] = pdVar6[0x1a5] - dVar23;
          pdVar6[0x1a8] = dVar23 + pdVar6[0x1a8];
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar27;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar27;
          pdVar6[0x1d4] = dVar27 + pdVar6[0x1d4];
          local_888._0_8_ = local_a48[3] * local_a48[1] * local_a48[0x14];
          dVar23 = exp((double)local_6c8._0_8_);
          dVar23 = dVar23 * 700000.0;
          local_6c8._0_8_ = local_a48[6] * local_a48[0x14];
          dVar24 = exp(dVar24);
          dVar24 = dVar23 / (dVar24 * (double)local_8c8._0_8_);
          dVar25 = dVar23 * (double)local_888._0_8_ - (double)local_6c8._0_8_ * dVar24;
          local_988[1] = local_988[1] - dVar25;
          local_988[3] = local_988[3] - dVar25;
          local_988[6] = dVar25 + local_988[6];
          dVar25 = dVar23 * local_a48[3] * local_a48[0x14];
          pdVar6[0x17] = pdVar6[0x17] - dVar25;
          pdVar6[0x19] = pdVar6[0x19] - dVar25;
          pdVar6[0x1c] = dVar25 + pdVar6[0x1c];
          dVar25 = local_a48[0x14] * dVar23 * local_a48[1];
          pdVar6[0x43] = pdVar6[0x43] - dVar25;
          pdVar6[0x45] = pdVar6[0x45] - dVar25;
          pdVar6[0x48] = dVar25 + pdVar6[0x48];
          dVar25 = -dVar24 * local_a48[0x14];
          pdVar6[0x85] = pdVar6[0x85] - dVar25;
          pdVar6[0x87] = pdVar6[0x87] - dVar25;
          pdVar6[0x8a] = dVar25 + pdVar6[0x8a];
          dVar25 = (double)local_698._0_8_ * dVar23 * (double)local_888._0_8_ -
                   ((double)local_698._0_8_ -
                   (((local_718 + local_788) - (dStack_7b0 + dStack_7a0 + local_718)) + 1.0) *
                   dVar31) * dVar24 * (double)local_6c8._0_8_;
          dVar24 = dVar23 * local_a48[1] * local_a48[3] - dVar24 * local_a48[6];
          pdVar6[0x1b9] = pdVar6[0x1b9] - dVar24;
          pdVar6[0x1bb] = pdVar6[0x1bb] - dVar24;
          pdVar6[0x1be] = dVar24 + pdVar6[0x1be];
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar25;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar25;
          pdVar6[0x1d4] = dVar25 + pdVar6[0x1d4];
          dVar25 = local_a48[0x14] * -0.37 +
                   local_a48[0x12] + local_a48[0x12] +
                   ((((dVar30 - local_a48[0]) - local_a48[5]) + local_a48[10]) - local_a48[0xc]);
          local_888._0_8_ = local_a48[1] * local_a48[1];
          dVar24 = exp((double)local_708._0_8_);
          local_6c8._0_8_ = local_a48[0];
          dVar23 = (local_868 + local_868) - (double)local_838._0_8_;
          local_698._8_4_ = SUB84(dStack_860,0);
          local_698._0_8_ = dVar23;
          local_698._12_4_ = (int)((ulong)dStack_860 >> 0x20);
          local_708._0_8_ = dVar24 * 1000000.0;
          dVar24 = exp(dVar23);
          dVar24 = (double)local_708._0_8_ / (dVar24 * (double)local_8c8._0_8_);
          local_678[2] = (double)local_708._0_8_ * (double)local_888._0_8_ -
                         (double)local_6c8._0_8_ * dVar24;
          dVar23 = dVar25 * local_678[2];
          local_988[0] = local_988[0] + dVar23;
          local_988[1] = local_988[1] - (dVar23 + dVar23);
          local_678[0] = -dVar24 * dVar25;
          local_678[1] = ((double)local_708._0_8_ * dVar25 + (double)local_708._0_8_ * dVar25) *
                         local_a48[1] + local_678[2];
          local_678[3] = local_678[2];
          local_678[4] = local_678[2];
          local_678[5] = 0.0;
          local_678[8] = local_678[2];
          local_678[9] = local_678[2];
          local_678[6] = local_678[2];
          local_678[7] = local_678[2];
          local_678[10] = local_678[2] + local_678[2];
          local_678[0xb] = local_678[2];
          local_678[0xc] = 0.0;
          local_678[0xf] = local_678[2];
          local_678[0x10] = local_678[2];
          local_678[0xd] = local_678[2];
          local_678[0xe] = local_678[2];
          local_678[0x11] = local_678[2];
          local_678[0x12] = local_678[2] * 3.0;
          local_678[0x13] = local_678[2];
          local_678[0x14] = local_678[2] * 0.63;
          lVar10 = 0;
          do {
            pdVar13[-1] = local_678[lVar10] + pdVar13[-1];
            *pdVar13 = *pdVar13 - (local_678[lVar10] + local_678[lVar10]);
            lVar10 = lVar10 + 1;
            pdVar13 = pdVar13 + 0x16;
          } while (lVar10 != 0x15);
          dVar25 = dVar25 * ((double)local_7f8._0_8_ * (double)local_708._0_8_ *
                             (double)local_888._0_8_ -
                            ((double)local_7f8._0_8_ -
                            ((local_7b8 - (dStack_7b0 + dStack_7b0)) + 1.0) * dVar31) * dVar24 *
                            (double)local_6c8._0_8_);
          pdVar6[0x1ce] = pdVar6[0x1ce] + dVar25;
          pdVar6[0x1cf] = pdVar6[0x1cf] - (dVar25 + dVar25);
          dVar24 = local_a48[1] * local_a48[1] * local_a48[0];
          local_6c8._0_8_ = exp(local_848 * -0.6 + (double)local_878._0_8_);
          local_6c8._0_8_ = (double)local_6c8._0_8_ * 90000.0;
          local_7f8._8_8_ = 0;
          local_7f8._0_8_ = dVar31 * -0.6 + (double)local_858._0_8_;
          local_888._0_8_ = local_a48[0] * local_a48[0];
          dVar23 = exp((double)local_698._0_8_);
          dVar23 = (double)local_6c8._0_8_ / (dVar23 * (double)local_8c8._0_8_);
          dVar25 = (double)local_6c8._0_8_ * dVar24 - (double)local_888._0_8_ * dVar23;
          local_988[0] = local_988[0] + dVar25;
          local_988[1] = local_988[1] - (dVar25 + dVar25);
          dVar25 = local_a48[1] * local_a48[1] * (double)local_6c8._0_8_ +
                   dVar23 * -2.0 * local_a48[0];
          *pdVar6 = *pdVar6 + dVar25;
          pdVar6[1] = pdVar6[1] - (dVar25 + dVar25);
          dVar23 = (double)local_7f8._0_8_ * (double)local_6c8._0_8_ * dVar24 -
                   ((double)local_7f8._0_8_ -
                   (((local_7b8 + local_7b8) - (dStack_7b0 + dStack_7b0 + local_7b8)) + 1.0) *
                   dVar31) * dVar23 * (double)local_888._0_8_;
          dVar24 = ((double)local_6c8._0_8_ * local_a48[0] + (double)local_6c8._0_8_ * local_a48[0])
                   * local_a48[1];
          pdVar6[0x16] = pdVar6[0x16] + dVar24;
          pdVar6[0x17] = pdVar6[0x17] - (dVar24 + dVar24);
          pdVar6[0x1ce] = pdVar6[0x1ce] + dVar23;
          pdVar6[0x1cf] = pdVar6[0x1cf] - (dVar23 + dVar23);
          dVar25 = local_a48[1] * local_a48[1] * local_a48[5];
          dVar24 = exp(local_848 * -1.25 + (double)local_878._0_8_);
          local_6c8._0_8_ = dVar24 * 60000000.0;
          local_888._8_8_ = 0;
          local_888._0_8_ = dVar31 * -1.25 + (double)local_858._0_8_;
          local_7f8._0_8_ = local_a48[0] * local_a48[5];
          dVar24 = exp((double)local_698._0_8_);
          dVar24 = (double)local_6c8._0_8_ / (dVar24 * (double)local_8c8._0_8_);
          dVar23 = (double)local_6c8._0_8_ * dVar25 - (double)local_7f8._0_8_ * dVar24;
          local_988[0] = local_988[0] + dVar23;
          local_988[1] = local_988[1] - (dVar23 + dVar23);
          dVar23 = -dVar24 * local_a48[5];
          *pdVar6 = *pdVar6 + dVar23;
          pdVar6[1] = pdVar6[1] - (dVar23 + dVar23);
          dVar23 = ((double)local_6c8._0_8_ + (double)local_6c8._0_8_) * local_a48[1] * local_a48[5]
          ;
          dVar25 = (double)local_888._0_8_ * (double)local_6c8._0_8_ * dVar25 -
                   ((double)local_888._0_8_ -
                   (((dStack_790 + local_7b8) - (dStack_7b0 + dStack_7b0 + dStack_790)) + 1.0) *
                   dVar31) * dVar24 * (double)local_7f8._0_8_;
          pdVar6[0x16] = pdVar6[0x16] + dVar23;
          pdVar6[0x17] = pdVar6[0x17] - (dVar23 + dVar23);
          dVar24 = (double)local_6c8._0_8_ * local_a48[1] * local_a48[1] - dVar24 * local_a48[0];
          pdVar6[0x6e] = pdVar6[0x6e] + dVar24;
          pdVar6[0x6f] = pdVar6[0x6f] - (dVar24 + dVar24);
          pdVar6[0x1ce] = pdVar6[0x1ce] + dVar25;
          pdVar6[0x1cf] = pdVar6[0x1cf] - (dVar25 + dVar25);
          local_708._0_8_ = local_a48[1] * local_a48[1] * local_a48[0xc];
          local_888._0_8_ = local_848 + local_848;
          local_888._8_8_ = uStack_840;
          dVar24 = local_878._0_8_ - (double)local_888._0_8_;
          local_7f8._8_4_ = local_878._8_4_;
          local_7f8._0_8_ = dVar24;
          local_7f8._12_4_ = local_878._12_4_;
          dVar24 = exp(dVar24);
          dVar24 = dVar24 * 550000000.0;
          local_6c8._8_8_ = 0;
          local_6c8._0_8_ = dVar31 + dVar31;
          dVar27 = (double)local_858._0_8_ - (dVar31 + dVar31);
          dVar23 = local_a48[0] * local_a48[0xc];
          dVar25 = exp((double)local_698._0_8_);
          dVar25 = dVar24 / (dVar25 * (double)local_8c8._0_8_);
          dVar26 = dVar24 * (double)local_708._0_8_ - dVar23 * dVar25;
          dVar23 = dVar27 * dVar24 * (double)local_708._0_8_ -
                   (dVar27 - (((local_758 + local_7b8) - (dStack_7b0 + dStack_7b0 + local_758)) +
                             1.0) * dVar31) * dVar25 * dVar23;
          local_988[0] = local_988[0] + dVar26;
          local_988[1] = local_988[1] - (dVar26 + dVar26);
          dVar26 = -dVar25 * local_a48[0xc];
          *pdVar6 = *pdVar6 + dVar26;
          pdVar6[1] = pdVar6[1] - (dVar26 + dVar26);
          dVar26 = (dVar24 + dVar24) * local_a48[1] * local_a48[0xc];
          pdVar6[0x16] = pdVar6[0x16] + dVar26;
          pdVar6[0x17] = pdVar6[0x17] - (dVar26 + dVar26);
          dVar24 = local_a48[1] * local_a48[1] * dVar24 - dVar25 * local_a48[0];
          pdVar6[0x108] = pdVar6[0x108] + dVar24;
          pdVar6[0x109] = pdVar6[0x109] - (dVar24 + dVar24);
          pdVar6[0x1ce] = pdVar6[0x1ce] + dVar23;
          pdVar6[0x1cf] = pdVar6[0x1cf] - (dVar23 + dVar23);
          local_708._0_8_ =
               local_a48[0x14] * -0.62 +
               local_a48[0x12] + local_a48[0x12] +
               local_a48[5] * 2.65 + local_a48[0] * -0.27 + dVar30 + local_a48[10];
          dVar26 = local_a48[1] * local_a48[4];
          dVar24 = exp((double)local_7f8._0_8_);
          dVar24 = dVar24 * 22000000000.0;
          local_7f8._0_8_ = local_a48[5];
          local_698._8_8_ = dStack_5c0;
          local_698._0_8_ = dStack_5c0;
          dVar23 = exp(((double)local_828._0_8_ + local_868) - dStack_5c0);
          dVar23 = dVar24 / (dVar23 * (double)local_8c8._0_8_);
          local_678[2] = dVar24 * dVar26 - (double)local_7f8._0_8_ * dVar23;
          dVar25 = (double)local_708._0_8_ * local_678[2];
          local_988[1] = local_988[1] - dVar25;
          local_988[4] = local_988[4] - dVar25;
          local_988[5] = dVar25 + local_988[5];
          local_678[0] = local_678[2] * 0.73;
          local_678[1] = dVar24 * (double)local_708._0_8_ * local_a48[4] + local_678[2];
          local_678[3] = local_678[2];
          local_678[4] = local_678[2] + local_a48[1] * dVar24 * (double)local_708._0_8_;
          local_678[5] = -dVar23 * (double)local_708._0_8_ + local_678[2] * 3.65;
          local_678[8] = local_678[2];
          local_678[9] = local_678[2];
          local_678[6] = local_678[2];
          local_678[7] = local_678[2];
          local_678[10] = local_678[2] + local_678[2];
          local_678[0xd] = local_678[2];
          local_678[0xe] = local_678[2];
          local_678[0xb] = local_678[2];
          local_678[0xc] = local_678[2];
          local_678[0xf] = local_678[2];
          local_678[0x10] = local_678[2];
          local_678[0x11] = local_678[2];
          local_678[0x12] = local_678[2] * 3.0;
          local_678[0x13] = local_678[2];
          local_678[0x14] = local_678[2] * 0.38;
          pdVar13 = pdVar6 + 5;
          lVar10 = 0;
          do {
            pdVar13[-4] = pdVar13[-4] - local_678[lVar10];
            pdVar13[-1] = pdVar13[-1] - local_678[lVar10];
            *pdVar13 = local_678[lVar10] + *pdVar13;
            lVar10 = lVar10 + 1;
            pdVar13 = pdVar13 + 0x16;
          } while (lVar10 != 0x15);
          dVar24 = (double)local_708._0_8_ *
                   (dVar27 * dVar24 * dVar26 -
                   (dVar27 - ((dStack_790 - (dStack_7b0 + local_798)) + 1.0) * dVar31) * dVar23 *
                   (double)local_7f8._0_8_);
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar24;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar24;
          pdVar6[0x1d3] = dVar24 + pdVar6[0x1d3];
          dVar24 = local_a48[5] * local_a48[0xd];
          dVar23 = dVar31 * -8554.68331868024 - local_848;
          local_808._0_8_ = exp(dVar23);
          local_808._0_8_ = (double)local_808._0_8_ * 2244000000000.0;
          local_8c8._8_4_ = (int)uStack_990;
          local_8c8._0_8_ = local_998 * 8554.68331868024 - dVar31;
          local_8c8._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          dVar26 = local_a48[1] * local_a48[5] * local_a48[0xb];
          local_708._8_8_ = -dStack_860;
          local_708._0_8_ = -local_868;
          dVar25 = (-local_868 - (double)local_818._0_8_) + (double)local_7c8._0_8_;
          local_7f8._8_4_ = SUB84(dStack_860,0);
          local_7f8._0_8_ = dVar25;
          local_7f8._12_4_ = (int)((ulong)-dStack_860 >> 0x20);
          dVar25 = exp(dVar25);
          dVar27 = local_a48[0xd];
          dVar29 = (double)local_808._0_8_ / (dVar25 * local_5a0);
          dVar25 = (double)local_808._0_8_ * dVar24 - dVar26 * dVar29;
          dVar24 = (double)local_8c8._0_8_ * (double)local_808._0_8_ * dVar24 -
                   ((double)local_8c8._0_8_ -
                   (((dStack_790 + dStack_7b0 + dStack_760) - (dStack_750 + dStack_790)) + -1.0) *
                   dVar31) * dVar29 * dVar26;
          local_988[1] = local_988[1] + dVar25;
          local_988[0xb] = local_988[0xb] + dVar25;
          local_988[0xd] = local_988[0xd] - dVar25;
          dVar25 = -dVar29 * local_a48[5] * local_a48[0xb];
          pdVar6[0x17] = pdVar6[0x17] + dVar25;
          pdVar6[0x21] = pdVar6[0x21] + dVar25;
          pdVar6[0x23] = pdVar6[0x23] - dVar25;
          dVar25 = local_a48[1] * -dVar29;
          dVar26 = (double)local_808._0_8_ * local_a48[0xd] + local_a48[0xb] * dVar25;
          pdVar6[0x6f] = pdVar6[0x6f] + dVar26;
          pdVar6[0x79] = pdVar6[0x79] + dVar26;
          pdVar6[0x7b] = pdVar6[0x7b] - dVar26;
          dVar25 = dVar25 * local_a48[5];
          pdVar6[0xf3] = pdVar6[0xf3] + dVar25;
          pdVar6[0xfd] = pdVar6[0xfd] + dVar25;
          pdVar6[0xff] = pdVar6[0xff] - dVar25;
          dVar25 = (double)local_808._0_8_ * local_a48[5];
          pdVar6[0x11f] = pdVar6[0x11f] + dVar25;
          pdVar6[0x129] = pdVar6[0x129] + dVar25;
          pdVar6[299] = pdVar6[299] - dVar25;
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar24;
          pdVar6[0x1d9] = pdVar6[0x1d9] + dVar24;
          pdVar6[0x1db] = pdVar6[0x1db] - dVar24;
          dVar30 = local_a48[0x12] + local_a48[0x12] +
                   local_a48[0xb] * 0.5 + ((dVar30 + local_a48[0]) - local_a48[5]) + local_a48[10] +
                   local_a48[0xc];
          dVar24 = exp(dVar23);
          dVar24 = dVar24 * 187000000000.0;
          dVar23 = local_a48[1] * local_a48[0xb];
          dVar25 = exp((double)local_7f8._0_8_);
          dVar25 = dVar24 / (dVar25 * local_5a0);
          local_678[2] = dVar24 * dVar27 - dVar23 * dVar25;
          dVar26 = dVar30 * local_678[2];
          local_988[1] = local_988[1] + dVar26;
          local_988[0xb] = local_988[0xb] + dVar26;
          local_988[0xd] = local_988[0xd] - dVar26;
          local_678[0] = local_678[2] + local_678[2];
          local_678[1] = local_a48[0xb] * -dVar25 * dVar30 + local_678[2];
          local_678[3] = local_678[2];
          local_678[4] = local_678[2];
          local_678[5] = 0.0;
          local_678[8] = local_678[2];
          local_678[9] = local_678[2];
          local_678[6] = local_678[2];
          local_678[7] = local_678[2];
          local_678[10] = local_678[0];
          local_678[0xb] = local_678[2] * 1.5 + -dVar25 * dVar30 * local_a48[1];
          local_678[0xc] = local_678[0];
          local_678[0xd] = dVar24 * dVar30 + local_678[2];
          local_678[0x10] = local_678[2];
          local_678[0x11] = local_678[2];
          local_678[0xe] = local_678[2];
          local_678[0xf] = local_678[2];
          local_678[0x12] = local_678[2] * 3.0;
          local_678[0x13] = local_678[2];
          local_678[0x14] = local_678[2];
          pdVar13 = pdVar6 + 0xd;
          lVar10 = 0;
          do {
            pdVar13[-0xc] = local_678[lVar10] + pdVar13[-0xc];
            pdVar13[-2] = local_678[lVar10] + pdVar13[-2];
            *pdVar13 = *pdVar13 - local_678[lVar10];
            lVar10 = lVar10 + 1;
            pdVar13 = pdVar13 + 0x16;
          } while (lVar10 != 0x15);
          dVar30 = dVar30 * ((double)local_8c8._0_8_ * dVar24 * dVar27 -
                            ((double)local_8c8._0_8_ -
                            (((dStack_7b0 + dStack_760) - dStack_750) + -1.0) * dVar31) * dVar25 *
                            dVar23);
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d9] = pdVar6[0x1d9] + dVar30;
          pdVar6[0x1db] = pdVar6[0x1db] - dVar30;
          local_8c8._0_8_ = local_a48[0] * local_a48[2];
          dVar30 = exp(local_848 * 2.67 + dVar31 * -3165.232827911689);
          dVar30 = dVar30 * 0.05;
          dVar25 = dVar31 * 2.67 + local_998 * 3165.232827911689;
          dVar24 = local_a48[1] * local_a48[4];
          local_7f8._0_8_ = (double)local_838._0_8_ - local_868;
          dVar23 = exp(((double)local_8d8._0_8_ + ((double)local_838._0_8_ - local_868)) -
                       (double)local_828._0_8_);
          dVar23 = dVar30 / dVar23;
          dVar27 = dVar30 * (double)local_8c8._0_8_ - dVar24 * dVar23;
          local_988[0] = local_988[0] - dVar27;
          local_988[1] = local_988[1] + dVar27;
          local_988[2] = local_988[2] - dVar27;
          local_988[4] = dVar27 + local_988[4];
          dVar27 = local_a48[2] * dVar30;
          *pdVar6 = *pdVar6 - dVar27;
          pdVar6[1] = pdVar6[1] + dVar27;
          pdVar6[2] = pdVar6[2] - dVar27;
          pdVar6[4] = dVar27 + pdVar6[4];
          dVar27 = local_a48[4] * -dVar23;
          pdVar6[0x16] = pdVar6[0x16] - dVar27;
          pdVar6[0x17] = pdVar6[0x17] + dVar27;
          pdVar6[0x18] = pdVar6[0x18] - dVar27;
          pdVar6[0x1a] = dVar27 + pdVar6[0x1a];
          dVar27 = dVar30 * local_a48[0];
          pdVar6[0x2c] = pdVar6[0x2c] - dVar27;
          pdVar6[0x2d] = pdVar6[0x2d] + dVar27;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar27;
          dVar24 = dVar25 * dVar30 * (double)local_8c8._0_8_ -
                   (dVar25 - ((dStack_7b0 + local_798) - (local_7b8 + local_7a8)) * dVar31) * dVar23
                   * dVar24;
          pdVar6[0x30] = dVar27 + pdVar6[0x30];
          dVar30 = -dVar23 * local_a48[1];
          pdVar6[0x58] = pdVar6[0x58] - dVar30;
          pdVar6[0x59] = pdVar6[0x59] + dVar30;
          pdVar6[0x5a] = pdVar6[0x5a] - dVar30;
          pdVar6[0x5c] = dVar30 + pdVar6[0x5c];
          pdVar6[0x1ce] = pdVar6[0x1ce] - dVar24;
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar24;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar24;
          pdVar6[0x1d2] = dVar24 + pdVar6[0x1d2];
          local_8c8._0_8_ = local_a48[2] * local_a48[6];
          uVar22 = local_878._12_4_;
          dVar30 = local_878._0_8_ + local_8a8;
          local_878._8_4_ = local_878._8_4_;
          local_878._0_8_ = dVar30;
          local_878._12_4_ = uVar22;
          dVar30 = exp(dVar30);
          dVar30 = dVar30 * 20000000.0;
          uVar22 = local_858._12_4_;
          local_858._8_4_ = local_858._8_4_;
          local_858._0_8_ = local_858._0_8_ + (double)local_8b8._0_8_;
          local_858._12_4_ = uVar22;
          dVar24 = local_a48[3] * local_a48[4];
          dVar23 = exp((((double)local_8d8._0_8_ - (double)local_898._0_8_) -
                       (double)local_828._0_8_) + local_5c8);
          dVar23 = dVar30 / dVar23;
          dVar25 = dVar30 * (double)local_8c8._0_8_ - dVar24 * dVar23;
          dVar24 = (double)local_858._0_8_ * dVar30 * (double)local_8c8._0_8_ -
                   ((double)local_858._0_8_ -
                   ((local_798 + dStack_7a0) - (local_788 + local_7a8)) * dVar31) * dVar23 * dVar24;
          local_988[2] = local_988[2] - dVar25;
          local_988[3] = dVar25 + local_988[3];
          local_988[4] = dVar25 + local_988[4];
          local_988[6] = local_988[6] - dVar25;
          dVar25 = local_a48[6] * dVar30;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar25;
          pdVar6[0x2f] = dVar25 + pdVar6[0x2f];
          pdVar6[0x30] = dVar25 + pdVar6[0x30];
          pdVar6[0x32] = pdVar6[0x32] - dVar25;
          dVar25 = local_a48[4] * -dVar23;
          pdVar6[0x44] = pdVar6[0x44] - dVar25;
          pdVar6[0x45] = dVar25 + pdVar6[0x45];
          pdVar6[0x46] = dVar25 + pdVar6[0x46];
          pdVar6[0x48] = pdVar6[0x48] - dVar25;
          dVar23 = -dVar23 * local_a48[3];
          pdVar6[0x5a] = pdVar6[0x5a] - dVar23;
          pdVar6[0x5b] = dVar23 + pdVar6[0x5b];
          pdVar6[0x5c] = dVar23 + pdVar6[0x5c];
          pdVar6[0x5e] = pdVar6[0x5e] - dVar23;
          dVar30 = dVar30 * local_a48[2];
          pdVar6[0x86] = pdVar6[0x86] - dVar30;
          pdVar6[0x87] = dVar30 + pdVar6[0x87];
          pdVar6[0x88] = dVar30 + pdVar6[0x88];
          pdVar6[0x8a] = pdVar6[0x8a] - dVar30;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar24;
          pdVar6[0x1d1] = dVar24 + pdVar6[0x1d1];
          pdVar6[0x1d2] = dVar24 + pdVar6[0x1d2];
          pdVar6[0x1d4] = pdVar6[0x1d4] - dVar24;
          local_8c8._0_8_ = local_a48[2] * local_a48[7];
          dVar30 = exp((double)local_878._0_8_);
          dVar30 = dVar30 * 80000000.0;
          dVar24 = local_a48[1] * local_a48[0xd];
          dVar26 = (double)local_8d8._0_8_ - local_868;
          dVar23 = exp(((double)local_6e8._0_8_ + dVar26) - (double)local_7c8._0_8_);
          dVar23 = dVar30 / dVar23;
          dVar25 = dVar30 * (double)local_8c8._0_8_ - dVar24 * dVar23;
          local_988[1] = local_988[1] + dVar25;
          local_988[2] = local_988[2] - dVar25;
          local_988[7] = local_988[7] - dVar25;
          local_988[0xd] = dVar25 + local_988[0xd];
          dVar25 = local_a48[0xd] * -dVar23;
          pdVar6[0x17] = pdVar6[0x17] + dVar25;
          pdVar6[0x18] = pdVar6[0x18] - dVar25;
          pdVar6[0x1d] = pdVar6[0x1d] - dVar25;
          pdVar6[0x23] = dVar25 + pdVar6[0x23];
          dVar25 = local_a48[7] * dVar30;
          pdVar6[0x2d] = pdVar6[0x2d] + dVar25;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar25;
          pdVar6[0x33] = pdVar6[0x33] - dVar25;
          pdVar6[0x39] = dVar25 + pdVar6[0x39];
          dVar25 = dVar30 * local_a48[2];
          pdVar6[0x9b] = pdVar6[0x9b] + dVar25;
          pdVar6[0x9c] = pdVar6[0x9c] - dVar25;
          pdVar6[0xa1] = pdVar6[0xa1] - dVar25;
          pdVar6[0xa7] = dVar25 + pdVar6[0xa7];
          dVar25 = -dVar23 * local_a48[1];
          dVar30 = (double)local_858._0_8_ * dVar30 * (double)local_8c8._0_8_ -
                   ((double)local_858._0_8_ -
                   ((dStack_7b0 + dStack_750) - (local_7a8 + dStack_780)) * dVar31) * dVar23 *
                   dVar24;
          pdVar6[0x11f] = pdVar6[0x11f] + dVar25;
          pdVar6[0x120] = pdVar6[0x120] - dVar25;
          pdVar6[0x125] = pdVar6[0x125] - dVar25;
          pdVar6[299] = dVar25 + pdVar6[299];
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar30;
          pdVar6[0x1d5] = pdVar6[0x1d5] - dVar30;
          pdVar6[0x1db] = dVar30 + pdVar6[0x1db];
          dVar27 = local_a48[2] * local_a48[8];
          dVar30 = exp((double)local_878._0_8_);
          dVar30 = dVar30 * 15000000.0;
          dVar24 = local_a48[1] * local_a48[0xd];
          local_8c8._8_4_ = local_8d8._8_4_;
          local_8c8._0_8_ = local_8d8._8_8_;
          local_8c8._12_4_ = local_8d8._12_4_;
          dVar23 = exp((local_8d8._8_8_ + dVar26) - (double)local_7c8._0_8_);
          dVar23 = dVar30 / dVar23;
          dVar25 = dVar30 * dVar27 - dVar24 * dVar23;
          local_988[1] = local_988[1] + dVar25;
          local_988[2] = local_988[2] - dVar25;
          local_988[8] = local_988[8] - dVar25;
          local_988[0xd] = dVar25 + local_988[0xd];
          dVar25 = local_a48[0xd] * -dVar23;
          pdVar6[0x17] = pdVar6[0x17] + dVar25;
          pdVar6[0x18] = pdVar6[0x18] - dVar25;
          pdVar6[0x1e] = pdVar6[0x1e] - dVar25;
          pdVar6[0x23] = dVar25 + pdVar6[0x23];
          dVar25 = local_a48[8] * dVar30;
          pdVar6[0x2d] = pdVar6[0x2d] + dVar25;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar25;
          pdVar6[0x34] = pdVar6[0x34] - dVar25;
          pdVar6[0x39] = dVar25 + pdVar6[0x39];
          dVar25 = dVar30 * local_a48[2];
          pdVar6[0xb1] = pdVar6[0xb1] + dVar25;
          pdVar6[0xb2] = pdVar6[0xb2] - dVar25;
          pdVar6[0xb8] = pdVar6[0xb8] - dVar25;
          pdVar6[0xbd] = dVar25 + pdVar6[0xbd];
          dVar25 = -dVar23 * local_a48[1];
          dVar30 = (double)local_858._0_8_ * dVar30 * dVar27 -
                   ((double)local_858._0_8_ -
                   ((dStack_7b0 + dStack_750) - (local_7a8 + local_778)) * dVar31) * dVar23 * dVar24
          ;
          pdVar6[0x11f] = pdVar6[0x11f] + dVar25;
          pdVar6[0x120] = pdVar6[0x120] - dVar25;
          pdVar6[0x126] = pdVar6[0x126] - dVar25;
          pdVar6[299] = dVar25 + pdVar6[299];
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar30;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar30;
          pdVar6[0x1db] = dVar30 + pdVar6[0x1db];
          dVar30 = local_a48[2] * local_a48[9];
          dVar24 = exp((double)local_878._0_8_);
          dVar25 = local_a48[1] * local_a48[0xe];
          dVar24 = dVar24 * 84300000.0;
          dVar23 = exp(((double)local_7e8._0_8_ + dVar26) - local_688);
          dVar23 = dVar24 / dVar23;
          dVar27 = dVar24 * dVar30 - dVar25 * dVar23;
          local_988[1] = local_988[1] + dVar27;
          local_988[2] = local_988[2] - dVar27;
          local_988[9] = local_988[9] - dVar27;
          local_988[0xe] = dVar27 + local_988[0xe];
          dVar27 = local_a48[0xe] * -dVar23;
          pdVar6[0x17] = pdVar6[0x17] + dVar27;
          pdVar6[0x18] = pdVar6[0x18] - dVar27;
          pdVar6[0x1f] = pdVar6[0x1f] - dVar27;
          pdVar6[0x24] = dVar27 + pdVar6[0x24];
          dVar27 = local_a48[9] * dVar24;
          pdVar6[0x2d] = pdVar6[0x2d] + dVar27;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar27;
          pdVar6[0x35] = pdVar6[0x35] - dVar27;
          pdVar6[0x3a] = dVar27 + pdVar6[0x3a];
          dVar27 = dVar24 * local_a48[2];
          pdVar6[199] = pdVar6[199] + dVar27;
          pdVar6[200] = pdVar6[200] - dVar27;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar27;
          pdVar6[0xd4] = dVar27 + pdVar6[0xd4];
          dVar27 = -dVar23 * local_a48[1];
          dVar30 = (double)local_858._0_8_ * dVar24 * dVar30 -
                   ((double)local_858._0_8_ -
                   ((dStack_7b0 + local_748) - (local_7a8 + dStack_770)) * dVar31) * dVar23 * dVar25
          ;
          pdVar6[0x135] = pdVar6[0x135] + dVar27;
          pdVar6[0x136] = pdVar6[0x136] - dVar27;
          pdVar6[0x13d] = pdVar6[0x13d] - dVar27;
          pdVar6[0x142] = dVar27 + pdVar6[0x142];
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar30;
          pdVar6[0x1dc] = dVar30 + pdVar6[0x1dc];
          dVar30 = local_a48[2] * local_a48[10];
          dVar24 = exp(dVar28 + dVar31 * -4327.663325920592);
          dVar24 = dVar24 * 1020.0;
          local_7d8._0_8_ = (double)local_7d8._0_8_ + local_998 * 4327.663325920592;
          dVar23 = local_a48[4] * local_a48[9];
          dVar25 = (double)local_8d8._0_8_ - (double)local_828._0_8_;
          dVar27 = exp((dVar25 - (double)local_7e8._0_8_) + local_598);
          dVar27 = dVar24 / dVar27;
          dVar28 = dVar24 * dVar30 - dVar23 * dVar27;
          local_988[2] = local_988[2] - dVar28;
          local_988[4] = local_988[4] + dVar28;
          local_988[10] = local_988[10] - dVar28;
          local_988[9] = dVar28 + local_988[9];
          dVar28 = local_a48[10] * dVar24;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar28;
          pdVar6[0x30] = pdVar6[0x30] + dVar28;
          pdVar6[0x35] = dVar28 + pdVar6[0x35];
          pdVar6[0x36] = pdVar6[0x36] - dVar28;
          dVar28 = local_a48[9] * -dVar27;
          pdVar6[0x5a] = pdVar6[0x5a] - dVar28;
          pdVar6[0x5c] = pdVar6[0x5c] + dVar28;
          pdVar6[0x61] = pdVar6[0x61] + dVar28;
          pdVar6[0x62] = pdVar6[0x62] - dVar28;
          dVar28 = -dVar27 * local_a48[4];
          pdVar6[200] = pdVar6[200] - dVar28;
          pdVar6[0xca] = pdVar6[0xca] + dVar28;
          pdVar6[0xcf] = pdVar6[0xcf] + dVar28;
          pdVar6[0xd0] = pdVar6[0xd0] - dVar28;
          dVar28 = dVar24 * local_a48[2];
          dVar30 = (double)local_7d8._0_8_ * dVar24 * dVar30 -
                   ((double)local_7d8._0_8_ -
                   ((local_798 + dStack_770) - (local_7a8 + local_768)) * dVar31) * dVar27 * dVar23;
          pdVar6[0xde] = pdVar6[0xde] - dVar28;
          pdVar6[0xe0] = pdVar6[0xe0] + dVar28;
          pdVar6[0xe5] = pdVar6[0xe5] + dVar28;
          pdVar6[0xe6] = pdVar6[0xe6] - dVar28;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] + dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] + dVar30;
          pdVar6[0x1d8] = pdVar6[0x1d8] - dVar30;
          local_7d8._0_8_ = local_a48[2] * local_a48[0xd];
          dVar30 = exp((double)local_878._0_8_);
          dVar24 = local_a48[4] * local_a48[0xb];
          dVar30 = dVar30 * 30000000.0;
          dVar23 = exp((dVar25 - (double)local_818._0_8_) + (double)local_7c8._0_8_);
          dVar23 = dVar30 / dVar23;
          dVar27 = dVar30 * (double)local_7d8._0_8_ - dVar24 * dVar23;
          local_988[2] = local_988[2] - dVar27;
          local_988[4] = local_988[4] + dVar27;
          local_988[0xd] = local_988[0xd] - dVar27;
          local_988[0xb] = dVar27 + local_988[0xb];
          dVar27 = local_a48[0xd] * dVar30;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar27;
          pdVar6[0x30] = pdVar6[0x30] + dVar27;
          pdVar6[0x37] = dVar27 + pdVar6[0x37];
          pdVar6[0x39] = pdVar6[0x39] - dVar27;
          dVar27 = local_a48[0xb] * -dVar23;
          pdVar6[0x5a] = pdVar6[0x5a] - dVar27;
          pdVar6[0x5c] = pdVar6[0x5c] + dVar27;
          pdVar6[99] = pdVar6[99] + dVar27;
          pdVar6[0x65] = pdVar6[0x65] - dVar27;
          dVar27 = -dVar23 * local_a48[4];
          pdVar6[0xf4] = pdVar6[0xf4] - dVar27;
          pdVar6[0xf6] = pdVar6[0xf6] + dVar27;
          pdVar6[0xfd] = pdVar6[0xfd] + dVar27;
          pdVar6[0xff] = pdVar6[0xff] - dVar27;
          dVar27 = dVar30 * local_a48[2];
          dVar30 = (double)local_858._0_8_ * dVar30 * (double)local_7d8._0_8_ -
                   ((double)local_858._0_8_ -
                   ((local_798 + dStack_760) - (local_7a8 + dStack_750)) * dVar31) * dVar23 * dVar24
          ;
          pdVar6[0x120] = pdVar6[0x120] - dVar27;
          pdVar6[0x122] = pdVar6[0x122] + dVar27;
          pdVar6[0x129] = pdVar6[0x129] + dVar27;
          pdVar6[299] = pdVar6[299] - dVar27;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] + dVar30;
          pdVar6[0x1d9] = pdVar6[0x1d9] + dVar30;
          pdVar6[0x1db] = pdVar6[0x1db] - dVar30;
          local_7d8._0_8_ = local_a48[2] * local_a48[0xd];
          dVar30 = exp((double)local_878._0_8_);
          dVar30 = dVar30 * 30000000.0;
          dVar24 = local_a48[1] * local_a48[0xc];
          dVar23 = exp((dVar26 - local_568) + (double)local_7c8._0_8_);
          dVar23 = dVar30 / dVar23;
          dVar27 = dVar30 * (double)local_7d8._0_8_ - dVar24 * dVar23;
          local_988[1] = local_988[1] + dVar27;
          local_988[2] = local_988[2] - dVar27;
          local_988[0xd] = local_988[0xd] - dVar27;
          local_988[0xc] = dVar27 + local_988[0xc];
          dVar27 = local_a48[0xc] * -dVar23;
          pdVar6[0x17] = pdVar6[0x17] + dVar27;
          pdVar6[0x18] = pdVar6[0x18] - dVar27;
          pdVar6[0x22] = dVar27 + pdVar6[0x22];
          pdVar6[0x23] = pdVar6[0x23] - dVar27;
          dVar27 = local_a48[0xd] * dVar30;
          pdVar6[0x2d] = pdVar6[0x2d] + dVar27;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar27;
          pdVar6[0x38] = pdVar6[0x38] + dVar27;
          pdVar6[0x39] = pdVar6[0x39] - dVar27;
          dVar27 = -dVar23 * local_a48[1];
          pdVar6[0x109] = pdVar6[0x109] + dVar27;
          pdVar6[0x10a] = pdVar6[0x10a] - dVar27;
          pdVar6[0x114] = pdVar6[0x114] + dVar27;
          pdVar6[0x115] = pdVar6[0x115] - dVar27;
          dVar27 = dVar30 * local_a48[2];
          dVar30 = (double)local_858._0_8_ * dVar30 * (double)local_7d8._0_8_ -
                   ((double)local_858._0_8_ -
                   ((dStack_7b0 + local_758) - (local_7a8 + dStack_750)) * dVar31) * dVar23 * dVar24
          ;
          pdVar6[0x11f] = pdVar6[0x11f] + dVar27;
          pdVar6[0x120] = pdVar6[0x120] - dVar27;
          pdVar6[0x12a] = pdVar6[0x12a] + dVar27;
          pdVar6[299] = pdVar6[299] - dVar27;
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar30;
          pdVar6[0x1da] = pdVar6[0x1da] + dVar30;
          pdVar6[0x1db] = pdVar6[0x1db] - dVar30;
          dVar30 = local_a48[2] * local_a48[0xe];
          dVar24 = exp(dVar31 * -1781.3869969487089 + local_8a8);
          dVar24 = dVar24 * 39000000.0;
          local_7d8._0_8_ = local_a48[4] * local_a48[0xd];
          dVar23 = local_998 * 1781.3869969487089 + (double)local_8b8._0_8_;
          dVar27 = exp((dVar25 - (double)local_7c8._0_8_) + local_688);
          dVar27 = dVar24 / dVar27;
          dVar26 = dVar24 * dVar30 - (double)local_7d8._0_8_ * dVar27;
          dVar23 = dVar23 * dVar24 * dVar30 -
                   (dVar23 - ((local_798 + dStack_750) - (local_7a8 + local_748)) * dVar31) * dVar27
                   * (double)local_7d8._0_8_;
          local_988[2] = local_988[2] - dVar26;
          local_988[4] = local_988[4] + dVar26;
          local_988[0xe] = local_988[0xe] - dVar26;
          local_988[0xd] = dVar26 + local_988[0xd];
          dVar30 = local_a48[0xe] * dVar24;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar30;
          pdVar6[0x30] = pdVar6[0x30] + dVar30;
          pdVar6[0x39] = dVar30 + pdVar6[0x39];
          pdVar6[0x3a] = pdVar6[0x3a] - dVar30;
          dVar30 = local_a48[0xd] * -dVar27;
          pdVar6[0x5a] = pdVar6[0x5a] - dVar30;
          pdVar6[0x5c] = pdVar6[0x5c] + dVar30;
          pdVar6[0x65] = pdVar6[0x65] + dVar30;
          pdVar6[0x66] = pdVar6[0x66] - dVar30;
          dVar30 = -dVar27 * local_a48[4];
          pdVar6[0x120] = pdVar6[0x120] - dVar30;
          pdVar6[0x122] = pdVar6[0x122] + dVar30;
          pdVar6[299] = pdVar6[299] + dVar30;
          pdVar6[300] = pdVar6[300] - dVar30;
          dVar24 = dVar24 * local_a48[2];
          pdVar6[0x136] = pdVar6[0x136] - dVar24;
          pdVar6[0x138] = pdVar6[0x138] + dVar24;
          pdVar6[0x141] = pdVar6[0x141] + dVar24;
          pdVar6[0x142] = pdVar6[0x142] - dVar24;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar23;
          pdVar6[0x1d2] = pdVar6[0x1d2] + dVar23;
          pdVar6[0x1db] = pdVar6[0x1db] + dVar23;
          pdVar6[0x1dc] = pdVar6[0x1dc] - dVar23;
          local_7d8._0_8_ = local_a48[2] * local_a48[0x10];
          dVar30 = exp(local_848 * 1.83 + dVar31 * -110.7076664770384);
          dVar30 = dVar30 * 19.2;
          dVar26 = dVar31 * 1.83 + local_998 * 110.7076664770384;
          dVar24 = local_a48[9] * local_a48[0xd];
          dVar23 = (double)local_8d8._0_8_ - (double)local_7e8._0_8_;
          dVar27 = exp((dVar23 - (double)local_7c8._0_8_) + local_548);
          dVar27 = dVar30 / dVar27;
          dVar28 = dVar30 * (double)local_7d8._0_8_ - dVar24 * dVar27;
          local_988[2] = local_988[2] - dVar28;
          local_988[9] = local_988[9] + dVar28;
          local_988[0x10] = local_988[0x10] - dVar28;
          local_988[0xd] = dVar28 + local_988[0xd];
          dVar28 = local_a48[0x10] * dVar30;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar28;
          pdVar6[0x35] = pdVar6[0x35] + dVar28;
          pdVar6[0x39] = dVar28 + pdVar6[0x39];
          pdVar6[0x3c] = pdVar6[0x3c] - dVar28;
          dVar28 = local_a48[0xd] * -dVar27;
          pdVar6[200] = pdVar6[200] - dVar28;
          pdVar6[0xcf] = pdVar6[0xcf] + dVar28;
          pdVar6[0xd3] = pdVar6[0xd3] + dVar28;
          pdVar6[0xd6] = pdVar6[0xd6] - dVar28;
          dVar28 = -dVar27 * local_a48[9];
          pdVar6[0x120] = pdVar6[0x120] - dVar28;
          pdVar6[0x127] = pdVar6[0x127] + dVar28;
          pdVar6[299] = pdVar6[299] + dVar28;
          pdVar6[0x12e] = pdVar6[0x12e] - dVar28;
          dVar28 = dVar30 * local_a48[2];
          dVar30 = dVar26 * dVar30 * (double)local_7d8._0_8_ -
                   (dVar26 - ((dStack_770 + dStack_750) - (local_7a8 + local_738)) * dVar31) *
                   dVar27 * dVar24;
          pdVar6[0x162] = pdVar6[0x162] - dVar28;
          pdVar6[0x169] = pdVar6[0x169] + dVar28;
          pdVar6[0x16d] = pdVar6[0x16d] + dVar28;
          pdVar6[0x170] = pdVar6[0x170] - dVar28;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] + dVar30;
          pdVar6[0x1db] = pdVar6[0x1db] + dVar30;
          pdVar6[0x1de] = pdVar6[0x1de] - dVar30;
          local_7d8._0_8_ = local_a48[2] * local_a48[0x11];
          dVar30 = exp((double)local_878._0_8_);
          dVar30 = dVar30 * 132000000.0;
          dVar24 = local_a48[9] * local_a48[0xe];
          dVar23 = exp((dVar23 - local_688) + local_578);
          dVar23 = dVar30 / dVar23;
          dVar27 = dVar30 * (double)local_7d8._0_8_ - dVar24 * dVar23;
          dVar24 = (double)local_858._0_8_ * dVar30 * (double)local_7d8._0_8_ -
                   ((double)local_858._0_8_ -
                   ((dStack_770 + local_748) - (local_7a8 + dStack_730)) * dVar31) * dVar23 * dVar24
          ;
          local_988[2] = local_988[2] - dVar27;
          local_988[9] = local_988[9] + dVar27;
          local_988[0x11] = local_988[0x11] - dVar27;
          local_988[0xe] = dVar27 + local_988[0xe];
          dVar27 = local_a48[0x11] * dVar30;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar27;
          pdVar6[0x35] = pdVar6[0x35] + dVar27;
          pdVar6[0x3a] = dVar27 + pdVar6[0x3a];
          pdVar6[0x3d] = pdVar6[0x3d] - dVar27;
          dVar27 = local_a48[0xe] * -dVar23;
          pdVar6[200] = pdVar6[200] - dVar27;
          pdVar6[0xcf] = pdVar6[0xcf] + dVar27;
          pdVar6[0xd4] = pdVar6[0xd4] + dVar27;
          pdVar6[0xd7] = pdVar6[0xd7] - dVar27;
          dVar23 = -dVar23 * local_a48[9];
          pdVar6[0x136] = pdVar6[0x136] - dVar23;
          pdVar6[0x13d] = pdVar6[0x13d] + dVar23;
          pdVar6[0x142] = pdVar6[0x142] + dVar23;
          pdVar6[0x145] = pdVar6[0x145] - dVar23;
          dVar30 = dVar30 * local_a48[2];
          pdVar6[0x178] = pdVar6[0x178] - dVar30;
          pdVar6[0x17f] = pdVar6[0x17f] + dVar30;
          pdVar6[0x184] = pdVar6[0x184] + dVar30;
          pdVar6[0x187] = pdVar6[0x187] - dVar30;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar24;
          pdVar6[0x1d7] = pdVar6[0x1d7] + dVar24;
          pdVar6[0x1dc] = pdVar6[0x1dc] + dVar24;
          pdVar6[0x1df] = pdVar6[0x1df] - dVar24;
          dVar30 = local_a48[2] * local_a48[0x12];
          dVar24 = exp(local_848 * 1.92 + dVar31 * -2863.302828428857);
          dVar24 = dVar24 * 89.8;
          dVar27 = dVar31 * 1.92 + local_998 * 2863.302828428857;
          local_7d8._0_8_ = local_a48[4] * local_a48[0x11];
          dVar23 = exp((dVar25 - local_578) + local_558);
          dVar23 = dVar24 / dVar23;
          dVar25 = dVar24 * dVar30 - (double)local_7d8._0_8_ * dVar23;
          local_988[2] = local_988[2] - dVar25;
          local_988[4] = local_988[4] + dVar25;
          local_988[0x12] = local_988[0x12] - dVar25;
          local_988[0x11] = dVar25 + local_988[0x11];
          dVar25 = local_a48[0x12] * dVar24;
          pdVar6[0x2e] = pdVar6[0x2e] - dVar25;
          pdVar6[0x30] = pdVar6[0x30] + dVar25;
          pdVar6[0x3d] = dVar25 + pdVar6[0x3d];
          pdVar6[0x3e] = pdVar6[0x3e] - dVar25;
          dVar25 = local_a48[0x11] * -dVar23;
          pdVar6[0x5a] = pdVar6[0x5a] - dVar25;
          pdVar6[0x5c] = pdVar6[0x5c] + dVar25;
          pdVar6[0x69] = pdVar6[0x69] + dVar25;
          pdVar6[0x6a] = pdVar6[0x6a] - dVar25;
          dVar25 = -dVar23 * local_a48[4];
          pdVar6[0x178] = pdVar6[0x178] - dVar25;
          pdVar6[0x17a] = pdVar6[0x17a] + dVar25;
          pdVar6[0x187] = pdVar6[0x187] + dVar25;
          pdVar6[0x188] = pdVar6[0x188] - dVar25;
          dVar25 = dVar24 * local_a48[2];
          dVar30 = dVar27 * dVar24 * dVar30 -
                   (dVar27 - ((local_798 + dStack_730) - (local_7a8 + local_728)) * dVar31) * dVar23
                   * (double)local_7d8._0_8_;
          pdVar6[0x18e] = pdVar6[0x18e] - dVar25;
          pdVar6[400] = pdVar6[400] + dVar25;
          pdVar6[0x19d] = pdVar6[0x19d] + dVar25;
          pdVar6[0x19e] = pdVar6[0x19e] - dVar25;
          pdVar6[0x1d0] = pdVar6[0x1d0] - dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] + dVar30;
          pdVar6[0x1df] = pdVar6[0x1df] + dVar30;
          pdVar6[0x1e0] = pdVar6[0x1e0] - dVar30;
          dVar30 = local_a48[3] * local_a48[0xb];
          dVar24 = exp(dVar31 * -24053.756625465616 + local_8a8);
          dVar24 = dVar24 * 2500000.0;
          dVar23 = local_998 * 24053.756625465616 + (double)local_8b8._0_8_;
          dVar25 = local_a48[2] * local_a48[0xc];
          local_7d8._0_8_ = (double)local_898._0_8_ - (double)local_8d8._0_8_;
          dVar27 = exp(((double)local_818._0_8_ +
                       ((double)local_898._0_8_ - (double)local_8d8._0_8_)) - local_568);
          dVar27 = dVar24 / dVar27;
          dVar26 = dVar24 * dVar30 - dVar25 * dVar27;
          local_988[2] = local_988[2] + dVar26;
          local_988[3] = local_988[3] - dVar26;
          local_988[0xb] = local_988[0xb] - dVar26;
          local_988[0xc] = dVar26 + local_988[0xc];
          dVar26 = local_a48[0xc] * -dVar27;
          pdVar6[0x2e] = pdVar6[0x2e] + dVar26;
          pdVar6[0x2f] = pdVar6[0x2f] - dVar26;
          pdVar6[0x37] = pdVar6[0x37] - dVar26;
          pdVar6[0x38] = dVar26 + pdVar6[0x38];
          dVar26 = local_a48[0xb] * dVar24;
          pdVar6[0x44] = pdVar6[0x44] + dVar26;
          pdVar6[0x45] = pdVar6[0x45] - dVar26;
          pdVar6[0x4d] = pdVar6[0x4d] - dVar26;
          pdVar6[0x4e] = dVar26 + pdVar6[0x4e];
          dVar26 = dVar24 * local_a48[3];
          pdVar6[0xf4] = pdVar6[0xf4] + dVar26;
          pdVar6[0xf5] = pdVar6[0xf5] - dVar26;
          pdVar6[0xfd] = pdVar6[0xfd] - dVar26;
          pdVar6[0xfe] = dVar26 + pdVar6[0xfe];
          dVar26 = -dVar27 * local_a48[2];
          dVar30 = dVar23 * dVar24 * dVar30 -
                   (dVar23 - ((local_7a8 + local_758) - (dStack_7a0 + dStack_760)) * dVar31) *
                   dVar27 * dVar25;
          pdVar6[0x10a] = pdVar6[0x10a] + dVar26;
          pdVar6[0x10b] = pdVar6[0x10b] - dVar26;
          pdVar6[0x113] = pdVar6[0x113] - dVar26;
          pdVar6[0x114] = dVar26 + pdVar6[0x114];
          pdVar6[0x1d0] = pdVar6[0x1d0] + dVar30;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar30;
          pdVar6[0x1d9] = pdVar6[0x1d9] - dVar30;
          pdVar6[0x1da] = dVar30 + pdVar6[0x1da];
          dVar30 = local_a48[3] * local_a48[0xe];
          dVar24 = exp(dVar31 * -20128.6666321888 + local_8a8);
          dVar24 = dVar24 * 100000000.0;
          dVar23 = local_998 * 20128.6666321888 + (double)local_8b8._0_8_;
          dVar25 = local_a48[6] * local_a48[0xd];
          dVar27 = (double)local_898._0_8_ - local_5c8;
          dVar26 = exp((dVar27 - (double)local_7c8._0_8_) + local_688);
          dVar26 = dVar24 / dVar26;
          dVar28 = dVar24 * dVar30 - dVar25 * dVar26;
          local_988[3] = local_988[3] - dVar28;
          local_988[6] = local_988[6] + dVar28;
          local_988[0xe] = local_988[0xe] - dVar28;
          local_988[0xd] = dVar28 + local_988[0xd];
          dVar28 = local_a48[0xe] * dVar24;
          pdVar6[0x45] = pdVar6[0x45] - dVar28;
          pdVar6[0x48] = pdVar6[0x48] + dVar28;
          pdVar6[0x4f] = dVar28 + pdVar6[0x4f];
          pdVar6[0x50] = pdVar6[0x50] - dVar28;
          dVar28 = local_a48[0xd] * -dVar26;
          pdVar6[0x87] = pdVar6[0x87] - dVar28;
          pdVar6[0x8a] = pdVar6[0x8a] + dVar28;
          pdVar6[0x91] = pdVar6[0x91] + dVar28;
          pdVar6[0x92] = pdVar6[0x92] - dVar28;
          dVar28 = -dVar26 * local_a48[6];
          pdVar6[0x121] = pdVar6[0x121] - dVar28;
          pdVar6[0x124] = pdVar6[0x124] + dVar28;
          pdVar6[299] = pdVar6[299] + dVar28;
          pdVar6[300] = pdVar6[300] - dVar28;
          dVar28 = dVar24 * local_a48[3];
          dVar30 = dVar23 * dVar24 * dVar30 -
                   (dVar23 - ((local_788 + dStack_750) - (dStack_7a0 + local_748)) * dVar31) *
                   dVar26 * dVar25;
          pdVar6[0x137] = pdVar6[0x137] - dVar28;
          pdVar6[0x13a] = pdVar6[0x13a] + dVar28;
          pdVar6[0x141] = pdVar6[0x141] + dVar28;
          pdVar6[0x142] = pdVar6[0x142] - dVar28;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar30;
          pdVar6[0x1d4] = pdVar6[0x1d4] + dVar30;
          pdVar6[0x1db] = pdVar6[0x1db] + dVar30;
          pdVar6[0x1dc] = pdVar6[0x1dc] - dVar30;
          dVar30 = local_a48[1] * local_a48[3];
          dVar24 = exp(dVar31 * -7252.86180424343 + local_8a8);
          dVar24 = dVar24 * 83000000.0;
          dVar23 = local_998 * 7252.86180424343 + (double)local_8b8._0_8_;
          dVar25 = local_a48[2] * local_a48[4];
          dVar26 = exp(((local_868 - (double)local_8d8._0_8_) + (double)local_898._0_8_) -
                       (double)local_828._0_8_);
          dVar26 = dVar24 / dVar26;
          dVar28 = dVar24 * dVar30 - dVar25 * dVar26;
          dVar23 = dVar23 * dVar24 * dVar30 -
                   (dVar23 - ((local_7a8 + local_798) - (dStack_7b0 + dStack_7a0)) * dVar31) *
                   dVar26 * dVar25;
          local_988[1] = local_988[1] - dVar28;
          local_988[2] = local_988[2] + dVar28;
          local_988[3] = local_988[3] - dVar28;
          local_988[4] = dVar28 + local_988[4];
          dVar30 = local_a48[3] * dVar24;
          pdVar6[0x17] = pdVar6[0x17] - dVar30;
          pdVar6[0x18] = pdVar6[0x18] + dVar30;
          pdVar6[0x19] = pdVar6[0x19] - dVar30;
          pdVar6[0x1a] = dVar30 + pdVar6[0x1a];
          dVar30 = local_a48[4] * -dVar26;
          pdVar6[0x2f] = pdVar6[0x2f] - dVar30;
          pdVar6[0x30] = pdVar6[0x30] + dVar30;
          pdVar6[0x2d] = pdVar6[0x2d] - dVar30;
          pdVar6[0x2e] = dVar30 + pdVar6[0x2e];
          dVar24 = dVar24 * local_a48[1];
          pdVar6[0x43] = pdVar6[0x43] - dVar24;
          pdVar6[0x44] = pdVar6[0x44] + dVar24;
          pdVar6[0x45] = pdVar6[0x45] - dVar24;
          pdVar6[0x46] = dVar24 + pdVar6[0x46];
          dVar30 = -dVar26 * local_a48[2];
          pdVar6[0x59] = pdVar6[0x59] - dVar30;
          pdVar6[0x5a] = pdVar6[0x5a] + dVar30;
          auVar8._8_4_ = SUB84(dVar30 + pdVar6[0x5c],0);
          auVar8._0_8_ = pdVar6[0x5b] - dVar30;
          auVar8._12_4_ = (int)((ulong)(dVar30 + pdVar6[0x5c]) >> 0x20);
          *(undefined1 (*) [16])(pdVar6 + 0x5b) = auVar8;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar23;
          pdVar6[0x1d0] = pdVar6[0x1d0] + dVar23;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar23;
          pdVar6[0x1d2] = dVar23 + pdVar6[0x1d2];
          dVar30 = local_a48[1] * local_a48[6];
          local_808._0_8_ = exp(dVar31 * -537.435399079441 + local_8a8);
          local_808._0_8_ = (double)local_808._0_8_ * 28000000.0;
          dVar24 = local_998 * 537.435399079441 + (double)local_8b8._0_8_;
          dVar23 = local_a48[0] * local_a48[3];
          dVar25 = local_868 - (double)local_838._0_8_;
          dVar26 = exp((dVar25 - (double)local_898._0_8_) + local_5c8);
          dVar26 = (double)local_808._0_8_ / dVar26;
          dVar28 = (double)local_808._0_8_ * dVar30 - dVar23 * dVar26;
          local_988[0] = local_988[0] + dVar28;
          local_988[1] = local_988[1] - dVar28;
          local_988[6] = local_988[6] - dVar28;
          local_988[3] = dVar28 + local_988[3];
          dVar28 = local_a48[3] * -dVar26;
          *pdVar6 = *pdVar6 + dVar28;
          pdVar6[1] = pdVar6[1] - dVar28;
          pdVar6[3] = dVar28 + pdVar6[3];
          pdVar6[6] = pdVar6[6] - dVar28;
          dVar28 = local_a48[6] * (double)local_808._0_8_;
          pdVar6[0x16] = pdVar6[0x16] + dVar28;
          pdVar6[0x17] = pdVar6[0x17] - dVar28;
          pdVar6[0x19] = pdVar6[0x19] + dVar28;
          pdVar6[0x1c] = pdVar6[0x1c] - dVar28;
          dVar28 = -dVar26 * local_a48[0];
          pdVar6[0x42] = pdVar6[0x42] + dVar28;
          pdVar6[0x43] = pdVar6[0x43] - dVar28;
          pdVar6[0x45] = pdVar6[0x45] + dVar28;
          pdVar6[0x48] = pdVar6[0x48] - dVar28;
          dVar28 = (double)local_808._0_8_ * local_a48[1];
          dVar30 = dVar24 * (double)local_808._0_8_ * dVar30 -
                   (dVar24 - ((local_7b8 + dStack_7a0) - (dStack_7b0 + local_788)) * dVar31) *
                   dVar26 * dVar23;
          pdVar6[0x84] = pdVar6[0x84] + dVar28;
          pdVar6[0x85] = pdVar6[0x85] - dVar28;
          pdVar6[0x87] = pdVar6[0x87] + dVar28;
          pdVar6[0x8a] = pdVar6[0x8a] - dVar28;
          pdVar6[0x1ce] = pdVar6[0x1ce] + dVar30;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar30;
          pdVar6[0x1d1] = pdVar6[0x1d1] + dVar30;
          pdVar6[0x1d4] = pdVar6[0x1d4] - dVar30;
          dVar30 = local_a48[1] * local_a48[6];
          local_808._0_8_ = exp(dVar31 * -319.54258278599724 + local_8a8);
          local_808._0_8_ = (double)local_808._0_8_ * 134000000.0;
          dVar24 = local_998 * 319.54258278599724 + (double)local_8b8._0_8_;
          dVar23 = local_a48[4] * local_a48[4];
          local_838._0_8_ = (double)local_828._0_8_ + (double)local_828._0_8_;
          dVar26 = exp((local_868 - ((double)local_828._0_8_ + (double)local_828._0_8_)) + local_5c8
                      );
          dVar26 = (double)local_808._0_8_ / dVar26;
          dVar28 = (double)local_808._0_8_ * dVar30 - dVar23 * dVar26;
          local_988[1] = local_988[1] - dVar28;
          local_988[6] = local_988[6] - dVar28;
          local_988[4] = dVar28 + dVar28 + local_988[4];
          dVar28 = local_a48[6] * (double)local_808._0_8_;
          pdVar6[0x17] = pdVar6[0x17] - dVar28;
          pdVar6[0x1a] = dVar28 + dVar28 + pdVar6[0x1a];
          pdVar6[0x1c] = pdVar6[0x1c] - dVar28;
          dVar28 = dVar26 * -2.0 * local_a48[4];
          pdVar6[0x59] = pdVar6[0x59] - dVar28;
          pdVar6[0x5c] = dVar28 + dVar28 + pdVar6[0x5c];
          pdVar6[0x5e] = pdVar6[0x5e] - dVar28;
          dVar28 = (double)local_808._0_8_ * local_a48[1];
          pdVar6[0x85] = pdVar6[0x85] - dVar28;
          dVar30 = dVar24 * (double)local_808._0_8_ * dVar30 -
                   (dVar24 - ((local_798 + local_798) - (dStack_7b0 + local_788)) * dVar31) * dVar26
                   * dVar23;
          pdVar6[0x88] = dVar28 + dVar28 + pdVar6[0x88];
          pdVar6[0x8a] = pdVar6[0x8a] - dVar28;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar30;
          pdVar6[0x1d2] = dVar30 + dVar30 + pdVar6[0x1d2];
          pdVar6[0x1d4] = pdVar6[0x1d4] - dVar30;
          dVar30 = local_a48[1] * local_a48[10];
          local_808._0_8_ = exp(local_848 * 1.62 + dVar31 * -5454.868657323165);
          local_808._0_8_ = (double)local_808._0_8_ * 660.0;
          dVar28 = local_a48[0] * local_a48[9];
          dVar23 = dVar31 * 1.62 + local_998 * 5454.868657323165;
          dVar24 = exp((dVar25 - (double)local_7e8._0_8_) + local_598);
          dVar24 = (double)local_808._0_8_ / dVar24;
          dVar26 = (double)local_808._0_8_ * dVar30 - dVar28 * dVar24;
          local_988[0] = local_988[0] + dVar26;
          local_988[1] = local_988[1] - dVar26;
          local_988[10] = local_988[10] - dVar26;
          local_988[9] = dVar26 + local_988[9];
          dVar26 = local_a48[9] * -dVar24;
          *pdVar6 = *pdVar6 + dVar26;
          pdVar6[1] = pdVar6[1] - dVar26;
          pdVar6[9] = dVar26 + pdVar6[9];
          pdVar6[10] = pdVar6[10] - dVar26;
          dVar26 = local_a48[10] * (double)local_808._0_8_;
          pdVar6[0x16] = pdVar6[0x16] + dVar26;
          pdVar6[0x17] = pdVar6[0x17] - dVar26;
          pdVar6[0x1f] = pdVar6[0x1f] + dVar26;
          pdVar6[0x20] = pdVar6[0x20] - dVar26;
          dVar26 = -dVar24 * local_a48[0];
          pdVar6[0xc6] = pdVar6[0xc6] + dVar26;
          pdVar6[199] = pdVar6[199] - dVar26;
          pdVar6[0xcf] = pdVar6[0xcf] + dVar26;
          pdVar6[0xd0] = pdVar6[0xd0] - dVar26;
          dVar26 = (double)local_808._0_8_ * local_a48[1];
          dVar30 = dVar23 * (double)local_808._0_8_ * dVar30 -
                   (dVar23 - ((local_7b8 + dStack_770) - (dStack_7b0 + local_768)) * dVar31) *
                   dVar24 * dVar28;
          pdVar6[0xdc] = pdVar6[0xdc] + dVar26;
          pdVar6[0xdd] = pdVar6[0xdd] - dVar26;
          pdVar6[0xe5] = pdVar6[0xe5] + dVar26;
          pdVar6[0xe6] = pdVar6[0xe6] - dVar26;
          pdVar6[0x1ce] = pdVar6[0x1ce] + dVar30;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] + dVar30;
          pdVar6[0x1d8] = pdVar6[0x1d8] - dVar30;
          dVar30 = local_a48[1] * local_a48[0xd];
          dVar24 = exp((double)local_878._0_8_);
          dVar26 = local_a48[0] * local_a48[0xb];
          dVar24 = dVar24 * 73400000.0;
          dVar23 = exp((dVar25 - (double)local_818._0_8_) + (double)local_7c8._0_8_);
          dVar23 = dVar24 / dVar23;
          dVar28 = dVar24 * dVar30 - dVar26 * dVar23;
          dVar30 = (double)local_858._0_8_ * dVar24 * dVar30 -
                   ((double)local_858._0_8_ -
                   ((local_7b8 + dStack_760) - (dStack_7b0 + dStack_750)) * dVar31) * dVar23 *
                   dVar26;
          local_988[0] = local_988[0] + dVar28;
          local_988[1] = local_988[1] - dVar28;
          local_988[0xd] = local_988[0xd] - dVar28;
          local_988[0xb] = dVar28 + local_988[0xb];
          dVar26 = local_a48[0xb] * -dVar23;
          *pdVar6 = *pdVar6 + dVar26;
          pdVar6[1] = pdVar6[1] - dVar26;
          pdVar6[0xb] = dVar26 + pdVar6[0xb];
          pdVar6[0xd] = pdVar6[0xd] - dVar26;
          dVar26 = local_a48[0xd] * dVar24;
          pdVar6[0x16] = pdVar6[0x16] + dVar26;
          pdVar6[0x17] = pdVar6[0x17] - dVar26;
          pdVar6[0x21] = pdVar6[0x21] + dVar26;
          pdVar6[0x23] = pdVar6[0x23] - dVar26;
          dVar23 = -dVar23 * local_a48[0];
          pdVar6[0xf2] = pdVar6[0xf2] + dVar23;
          pdVar6[0xf3] = pdVar6[0xf3] - dVar23;
          pdVar6[0xfd] = pdVar6[0xfd] + dVar23;
          pdVar6[0xff] = pdVar6[0xff] - dVar23;
          dVar24 = dVar24 * local_a48[1];
          pdVar6[0x11e] = pdVar6[0x11e] + dVar24;
          pdVar6[0x11f] = pdVar6[0x11f] - dVar24;
          pdVar6[0x129] = pdVar6[0x129] + dVar24;
          pdVar6[299] = pdVar6[299] - dVar24;
          pdVar6[0x1ce] = pdVar6[0x1ce] + dVar30;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar30;
          pdVar6[0x1d9] = pdVar6[0x1d9] + dVar30;
          pdVar6[0x1db] = pdVar6[0x1db] - dVar30;
          dVar30 = local_a48[1] * local_a48[0xe];
          local_808._0_8_ = exp(local_848 * 1.05 + dVar31 * -1648.034580510458);
          local_808._0_8_ = (double)local_808._0_8_ * 23000.0;
          dVar28 = local_a48[0] * local_a48[0xd];
          dVar23 = dVar31 * 1.05 + local_998 * 1648.034580510458;
          dVar24 = exp((dVar25 - (double)local_7c8._0_8_) + local_688);
          dVar24 = (double)local_808._0_8_ / dVar24;
          dVar26 = (double)local_808._0_8_ * dVar30 - dVar28 * dVar24;
          local_988[0] = local_988[0] + dVar26;
          local_988[1] = local_988[1] - dVar26;
          local_988[0xe] = local_988[0xe] - dVar26;
          local_988[0xd] = dVar26 + local_988[0xd];
          dVar26 = local_a48[0xd] * -dVar24;
          *pdVar6 = *pdVar6 + dVar26;
          pdVar6[1] = pdVar6[1] - dVar26;
          pdVar6[0xd] = dVar26 + pdVar6[0xd];
          pdVar6[0xe] = pdVar6[0xe] - dVar26;
          dVar26 = local_a48[0xe] * (double)local_808._0_8_;
          pdVar6[0x16] = pdVar6[0x16] + dVar26;
          pdVar6[0x17] = pdVar6[0x17] - dVar26;
          pdVar6[0x23] = pdVar6[0x23] + dVar26;
          pdVar6[0x24] = pdVar6[0x24] - dVar26;
          dVar26 = -dVar24 * local_a48[0];
          pdVar6[0x11e] = pdVar6[0x11e] + dVar26;
          pdVar6[0x11f] = pdVar6[0x11f] - dVar26;
          pdVar6[299] = pdVar6[299] + dVar26;
          pdVar6[300] = pdVar6[300] - dVar26;
          dVar26 = (double)local_808._0_8_ * local_a48[1];
          dVar30 = dVar23 * (double)local_808._0_8_ * dVar30 -
                   (dVar23 - ((local_7b8 + dStack_750) - (dStack_7b0 + local_748)) * dVar31) *
                   dVar24 * dVar28;
          pdVar6[0x134] = pdVar6[0x134] + dVar26;
          pdVar6[0x135] = pdVar6[0x135] - dVar26;
          pdVar6[0x141] = pdVar6[0x141] + dVar26;
          pdVar6[0x142] = pdVar6[0x142] - dVar26;
          pdVar6[0x1ce] = pdVar6[0x1ce] + dVar30;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar30;
          pdVar6[0x1db] = pdVar6[0x1db] + dVar30;
          pdVar6[0x1dc] = pdVar6[0x1dc] - dVar30;
          dVar30 = local_a48[1] * local_a48[0xf];
          dVar24 = exp((double)local_878._0_8_);
          dVar24 = dVar24 * 32000000.0;
          dVar23 = local_a48[4] * local_a48[9];
          dVar26 = exp(((local_868 - (double)local_828._0_8_) - (double)local_7e8._0_8_) + local_5b8
                      );
          dVar26 = dVar24 / dVar26;
          dVar28 = dVar24 * dVar30 - dVar23 * dVar26;
          dVar30 = (double)local_858._0_8_ * dVar24 * dVar30 -
                   ((double)local_858._0_8_ -
                   ((local_798 + dStack_770) - (dStack_7b0 + dStack_740)) * dVar31) * dVar26 *
                   dVar23;
          local_988[1] = local_988[1] - dVar28;
          local_988[4] = local_988[4] + dVar28;
          local_988[0xf] = local_988[0xf] - dVar28;
          local_988[9] = dVar28 + local_988[9];
          dVar23 = local_a48[0xf] * dVar24;
          pdVar6[0x17] = pdVar6[0x17] - dVar23;
          pdVar6[0x1a] = pdVar6[0x1a] + dVar23;
          pdVar6[0x1f] = dVar23 + pdVar6[0x1f];
          pdVar6[0x25] = pdVar6[0x25] - dVar23;
          dVar23 = local_a48[9] * -dVar26;
          pdVar6[0x59] = pdVar6[0x59] - dVar23;
          pdVar6[0x5c] = pdVar6[0x5c] + dVar23;
          pdVar6[0x61] = pdVar6[0x61] + dVar23;
          pdVar6[0x67] = pdVar6[0x67] - dVar23;
          dVar23 = -dVar26 * local_a48[4];
          pdVar6[199] = pdVar6[199] - dVar23;
          pdVar6[0xca] = pdVar6[0xca] + dVar23;
          pdVar6[0xcf] = pdVar6[0xcf] + dVar23;
          pdVar6[0xd5] = pdVar6[0xd5] - dVar23;
          dVar24 = dVar24 * local_a48[1];
          pdVar6[0x14b] = pdVar6[0x14b] - dVar24;
          pdVar6[0x14e] = pdVar6[0x14e] + dVar24;
          pdVar6[0x153] = pdVar6[0x153] + dVar24;
          pdVar6[0x159] = pdVar6[0x159] - dVar24;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] + dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] + dVar30;
          pdVar6[0x1dd] = pdVar6[0x1dd] - dVar30;
          dVar30 = local_a48[1] * local_a48[0x12];
          local_808._0_8_ = exp(local_848 * 1.9 + dVar31 * -3789.2214935095417);
          local_808._0_8_ = (double)local_808._0_8_ * 115.0;
          dVar26 = dVar31 * 1.9 + local_998 * 3789.2214935095417;
          dVar24 = local_a48[0] * local_a48[0x11];
          dVar23 = exp((dVar25 - local_578) + local_558);
          dVar23 = (double)local_808._0_8_ / dVar23;
          dVar25 = (double)local_808._0_8_ * dVar30 - dVar24 * dVar23;
          dVar24 = dVar26 * (double)local_808._0_8_ * dVar30 -
                   (dVar26 - ((local_7b8 + dStack_730) - (dStack_7b0 + local_728)) * dVar31) *
                   dVar23 * dVar24;
          local_988[0] = local_988[0] + dVar25;
          local_988[1] = local_988[1] - dVar25;
          local_988[0x12] = local_988[0x12] - dVar25;
          local_988[0x11] = dVar25 + local_988[0x11];
          dVar30 = local_a48[0x11] * -dVar23;
          *pdVar6 = *pdVar6 + dVar30;
          pdVar6[1] = pdVar6[1] - dVar30;
          pdVar6[0x11] = dVar30 + pdVar6[0x11];
          pdVar6[0x12] = pdVar6[0x12] - dVar30;
          dVar30 = local_a48[0x12] * (double)local_808._0_8_;
          pdVar6[0x16] = pdVar6[0x16] + dVar30;
          pdVar6[0x17] = pdVar6[0x17] - dVar30;
          pdVar6[0x27] = pdVar6[0x27] + dVar30;
          pdVar6[0x28] = pdVar6[0x28] - dVar30;
          dVar30 = -dVar23 * local_a48[0];
          pdVar6[0x176] = pdVar6[0x176] + dVar30;
          pdVar6[0x177] = pdVar6[0x177] - dVar30;
          pdVar6[0x187] = pdVar6[0x187] + dVar30;
          pdVar6[0x188] = pdVar6[0x188] - dVar30;
          dVar30 = (double)local_808._0_8_ * local_a48[1];
          pdVar6[0x18c] = pdVar6[0x18c] + dVar30;
          pdVar6[0x18d] = pdVar6[0x18d] - dVar30;
          pdVar6[0x19d] = pdVar6[0x19d] + dVar30;
          pdVar6[0x19e] = pdVar6[0x19e] - dVar30;
          pdVar6[0x1ce] = pdVar6[0x1ce] + dVar24;
          pdVar6[0x1cf] = pdVar6[0x1cf] - dVar24;
          pdVar6[0x1df] = pdVar6[0x1df] + dVar24;
          pdVar6[0x1e0] = pdVar6[0x1e0] - dVar24;
          dVar30 = local_a48[0] * local_a48[4];
          dVar24 = exp(local_848 * 1.51 + dVar31 * -1726.0331637101897);
          dVar24 = dVar24 * 216.0;
          dVar28 = local_a48[1] * local_a48[5];
          dVar25 = dVar31 * 1.51 + local_998 * 1726.0331637101897;
          dVar23 = exp(((double)local_828._0_8_ + (double)local_7f8._0_8_) - (double)local_698._0_8_
                      );
          dVar23 = dVar24 / dVar23;
          dVar26 = dVar24 * dVar30 - dVar28 * dVar23;
          local_988[0] = local_988[0] - dVar26;
          local_988[1] = local_988[1] + dVar26;
          local_988[4] = local_988[4] - dVar26;
          local_988[5] = dVar26 + local_988[5];
          dVar26 = local_a48[4] * dVar24;
          *pdVar6 = *pdVar6 - dVar26;
          pdVar6[1] = pdVar6[1] + dVar26;
          pdVar6[4] = pdVar6[4] - dVar26;
          pdVar6[5] = dVar26 + pdVar6[5];
          dVar26 = local_a48[5] * -dVar23;
          pdVar6[0x16] = pdVar6[0x16] - dVar26;
          pdVar6[0x17] = pdVar6[0x17] + dVar26;
          pdVar6[0x1a] = pdVar6[0x1a] - dVar26;
          pdVar6[0x1b] = dVar26 + pdVar6[0x1b];
          dVar26 = dVar24 * local_a48[0];
          pdVar6[0x58] = pdVar6[0x58] - dVar26;
          pdVar6[0x59] = pdVar6[0x59] + dVar26;
          pdVar6[0x5c] = pdVar6[0x5c] - dVar26;
          pdVar6[0x5d] = dVar26 + pdVar6[0x5d];
          dVar26 = -dVar23 * local_a48[1];
          dVar30 = dVar25 * dVar24 * dVar30 -
                   (dVar25 - ((dStack_7b0 + dStack_790) - (local_7b8 + local_798)) * dVar31) *
                   dVar23 * dVar28;
          pdVar6[0x6e] = pdVar6[0x6e] - dVar26;
          pdVar6[0x6f] = pdVar6[0x6f] + dVar26;
          pdVar6[0x72] = pdVar6[0x72] - dVar26;
          pdVar6[0x73] = dVar26 + pdVar6[0x73];
          pdVar6[0x1ce] = pdVar6[0x1ce] - dVar30;
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar30;
          pdVar6[0x1d3] = dVar30 + pdVar6[0x1d3];
          dVar30 = local_a48[4] * local_a48[4];
          dVar24 = exp(local_848 * 2.4 + dVar31 * 1061.7871648479593);
          dVar24 = dVar24 * 0.0357;
          dVar26 = dVar31 * 2.4 + local_998 * -1061.7871648479593;
          dVar23 = local_a48[2] * local_a48[5];
          dVar25 = exp(((double)local_838._0_8_ - (double)local_8d8._0_8_) - (double)local_698._0_8_
                      );
          dVar25 = dVar24 / dVar25;
          dVar28 = dVar24 * dVar30 - dVar23 * dVar25;
          local_988[2] = local_988[2] + dVar28;
          local_988[4] = local_988[4] - (dVar28 + dVar28);
          local_988[5] = dVar28 + local_988[5];
          dVar28 = local_a48[5] * -dVar25;
          pdVar6[0x2e] = pdVar6[0x2e] + dVar28;
          pdVar6[0x30] = pdVar6[0x30] - (dVar28 + dVar28);
          pdVar6[0x31] = dVar28 + pdVar6[0x31];
          dVar28 = (dVar24 + dVar24) * local_a48[4];
          pdVar6[0x5a] = pdVar6[0x5a] + dVar28;
          pdVar6[0x5c] = pdVar6[0x5c] - (dVar28 + dVar28);
          pdVar6[0x5d] = dVar28 + pdVar6[0x5d];
          dVar28 = -dVar25 * local_a48[2];
          pdVar6[0x70] = pdVar6[0x70] + dVar28;
          pdVar6[0x72] = pdVar6[0x72] - (dVar28 + dVar28);
          dVar30 = dVar26 * dVar24 * dVar30 -
                   (dVar26 - ((local_7a8 + dStack_790) - (local_798 + local_798)) * dVar31) * dVar25
                   * dVar23;
          pdVar6[0x73] = dVar28 + pdVar6[0x73];
          pdVar6[0x1d0] = pdVar6[0x1d0] + dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] - (dVar30 + dVar30);
          pdVar6[0x1d3] = dVar30 + pdVar6[0x1d3];
          dVar30 = local_a48[4] * local_a48[6];
          dVar24 = exp(dVar31 * 251.60833290236002 + local_8a8);
          dVar24 = dVar24 * 29000000.0;
          local_838._8_4_ = (int)uStack_990;
          local_838._0_8_ = local_998 * -251.60833290236002 + (double)local_8b8._0_8_;
          local_838._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          local_8d8._0_8_ = local_a48[3] * local_a48[5];
          dVar23 = exp((((double)local_828._0_8_ - (double)local_898._0_8_) -
                       (double)local_698._0_8_) + local_5c8);
          dVar23 = dVar24 / dVar23;
          dVar25 = dVar24 * dVar30 - (double)local_8d8._0_8_ * dVar23;
          local_988[3] = local_988[3] + dVar25;
          local_988[4] = local_988[4] - dVar25;
          local_988[6] = local_988[6] - dVar25;
          local_988[5] = dVar25 + local_988[5];
          dVar25 = local_a48[5] * -dVar23;
          pdVar6[0x45] = pdVar6[0x45] + dVar25;
          pdVar6[0x46] = pdVar6[0x46] - dVar25;
          pdVar6[0x47] = dVar25 + pdVar6[0x47];
          pdVar6[0x48] = pdVar6[0x48] - dVar25;
          dVar25 = local_a48[6] * dVar24;
          pdVar6[0x5d] = pdVar6[0x5d] + dVar25;
          pdVar6[0x5e] = pdVar6[0x5e] - dVar25;
          pdVar6[0x5b] = dVar25 + pdVar6[0x5b];
          pdVar6[0x5c] = pdVar6[0x5c] - dVar25;
          dVar25 = -dVar23 * local_a48[3];
          dVar30 = (double)local_838._0_8_ * dVar24 * dVar30 -
                   ((double)local_838._0_8_ -
                   ((dStack_7a0 + dStack_790) - (local_798 + local_788)) * dVar31) * dVar23 *
                   (double)local_8d8._0_8_;
          pdVar6[0x71] = pdVar6[0x71] + dVar25;
          pdVar6[0x72] = pdVar6[0x72] - dVar25;
          pdVar6[0x73] = dVar25 + pdVar6[0x73];
          pdVar6[0x74] = pdVar6[0x74] - dVar25;
          dVar24 = dVar24 * local_a48[4];
          pdVar6[0x87] = pdVar6[0x87] + dVar24;
          pdVar6[0x88] = pdVar6[0x88] - dVar24;
          auVar9._8_4_ = SUB84(pdVar6[0x8a] - dVar24,0);
          auVar9._0_8_ = dVar24 + pdVar6[0x89];
          auVar9._12_4_ = (int)((ulong)(pdVar6[0x8a] - dVar24) >> 0x20);
          *(undefined1 (*) [16])(pdVar6 + 0x89) = auVar9;
          pdVar6[0x1d1] = pdVar6[0x1d1] + dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar30;
          pdVar6[0x1d3] = pdVar6[0x1d3] + dVar30;
          pdVar6[0x1d4] = pdVar6[0x1d4] - dVar30;
          dVar30 = local_a48[4] * local_a48[7];
          dVar24 = exp((double)local_878._0_8_);
          dVar24 = dVar24 * 20000000.0;
          local_8d8._0_8_ = (double)local_828._0_8_ - local_868;
          local_838._0_8_ = local_a48[1] * local_a48[0xe];
          dVar23 = exp(((double)local_6e8._0_8_ + (double)local_8d8._0_8_) - local_688);
          dVar23 = dVar24 / dVar23;
          dVar25 = dVar24 * dVar30 - (double)local_838._0_8_ * dVar23;
          local_988[1] = local_988[1] + dVar25;
          local_988[4] = local_988[4] - dVar25;
          local_988[7] = local_988[7] - dVar25;
          local_988[0xe] = dVar25 + local_988[0xe];
          dVar25 = local_a48[0xe] * -dVar23;
          pdVar6[0x17] = pdVar6[0x17] + dVar25;
          pdVar6[0x1a] = pdVar6[0x1a] - dVar25;
          pdVar6[0x1d] = pdVar6[0x1d] - dVar25;
          pdVar6[0x24] = dVar25 + pdVar6[0x24];
          dVar25 = local_a48[7] * dVar24;
          pdVar6[0x59] = pdVar6[0x59] + dVar25;
          pdVar6[0x5c] = pdVar6[0x5c] - dVar25;
          pdVar6[0x5f] = pdVar6[0x5f] - dVar25;
          pdVar6[0x66] = dVar25 + pdVar6[0x66];
          dVar25 = dVar24 * local_a48[4];
          pdVar6[0x9b] = pdVar6[0x9b] + dVar25;
          pdVar6[0x9e] = pdVar6[0x9e] - dVar25;
          pdVar6[0xa1] = pdVar6[0xa1] - dVar25;
          pdVar6[0xa8] = dVar25 + pdVar6[0xa8];
          dVar25 = -dVar23 * local_a48[1];
          dVar30 = (double)local_858._0_8_ * dVar24 * dVar30 -
                   ((double)local_858._0_8_ -
                   ((dStack_7b0 + local_748) - (local_798 + dStack_780)) * dVar31) * dVar23 *
                   (double)local_838._0_8_;
          pdVar6[0x135] = pdVar6[0x135] + dVar25;
          pdVar6[0x138] = pdVar6[0x138] - dVar25;
          pdVar6[0x13b] = pdVar6[0x13b] - dVar25;
          pdVar6[0x142] = dVar25 + pdVar6[0x142];
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar30;
          pdVar6[0x1d5] = pdVar6[0x1d5] - dVar30;
          pdVar6[0x1dc] = dVar30 + pdVar6[0x1dc];
          dVar30 = local_a48[4] * local_a48[8];
          dVar24 = exp((double)local_878._0_8_);
          local_838._0_8_ = local_a48[1] * local_a48[0xe];
          dVar24 = dVar24 * 30000000.0;
          dVar23 = exp(((double)local_8c8._0_8_ + (double)local_8d8._0_8_) - local_688);
          dVar23 = dVar24 / dVar23;
          dVar25 = dVar24 * dVar30 - (double)local_838._0_8_ * dVar23;
          local_988[1] = local_988[1] + dVar25;
          local_988[4] = local_988[4] - dVar25;
          local_988[8] = local_988[8] - dVar25;
          local_988[0xe] = dVar25 + local_988[0xe];
          dVar25 = local_a48[0xe] * -dVar23;
          pdVar6[0x17] = pdVar6[0x17] + dVar25;
          pdVar6[0x1a] = pdVar6[0x1a] - dVar25;
          pdVar6[0x1e] = pdVar6[0x1e] - dVar25;
          pdVar6[0x24] = dVar25 + pdVar6[0x24];
          dVar25 = local_a48[8] * dVar24;
          pdVar6[0x59] = pdVar6[0x59] + dVar25;
          pdVar6[0x5c] = pdVar6[0x5c] - dVar25;
          pdVar6[0x60] = pdVar6[0x60] - dVar25;
          pdVar6[0x66] = dVar25 + pdVar6[0x66];
          dVar25 = dVar24 * local_a48[4];
          pdVar6[0xb1] = pdVar6[0xb1] + dVar25;
          pdVar6[0xb4] = pdVar6[0xb4] - dVar25;
          pdVar6[0xb8] = pdVar6[0xb8] - dVar25;
          dVar24 = (double)local_858._0_8_ * dVar24 * dVar30 -
                   ((double)local_858._0_8_ -
                   ((dStack_7b0 + local_748) - (local_798 + local_778)) * dVar31) * dVar23 *
                   (double)local_838._0_8_;
          pdVar6[0xbe] = dVar25 + pdVar6[0xbe];
          dVar30 = -dVar23 * local_a48[1];
          pdVar6[0x135] = pdVar6[0x135] + dVar30;
          pdVar6[0x138] = pdVar6[0x138] - dVar30;
          pdVar6[0x13c] = pdVar6[0x13c] - dVar30;
          pdVar6[0x142] = dVar30 + pdVar6[0x142];
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar24;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar24;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar24;
          pdVar6[0x1dc] = dVar24 + pdVar6[0x1dc];
          dVar30 = local_a48[4] * local_a48[9];
          dVar28 = local_848 * 1.6;
          dVar24 = exp(dVar31 * -2727.4343286615826 + dVar28);
          local_6b8._0_8_ = dVar24 * 56.0;
          local_838._8_8_ = 0;
          local_838._0_8_ = dVar31 * 1.6;
          local_808._0_8_ = local_998 * 2727.4343286615826 + dVar31 * 1.6;
          local_808._8_8_ = uStack_990;
          dVar24 = local_a48[5] * local_a48[7];
          dVar23 = (double)local_828._0_8_ - (double)local_698._0_8_;
          dVar25 = exp((dVar23 - (double)local_6e8._0_8_) + (double)local_7e8._0_8_);
          dVar25 = (double)local_6b8._0_8_ / dVar25;
          dVar26 = (double)local_6b8._0_8_ * dVar30 - dVar24 * dVar25;
          local_988[4] = local_988[4] - dVar26;
          local_988[5] = local_988[5] + dVar26;
          local_988[9] = local_988[9] - dVar26;
          local_988[7] = dVar26 + local_988[7];
          dVar26 = local_a48[9] * (double)local_6b8._0_8_;
          pdVar6[0x5c] = pdVar6[0x5c] - dVar26;
          pdVar6[0x5d] = pdVar6[0x5d] + dVar26;
          pdVar6[0x5f] = dVar26 + pdVar6[0x5f];
          pdVar6[0x61] = pdVar6[0x61] - dVar26;
          dVar26 = local_a48[7] * -dVar25;
          pdVar6[0x72] = pdVar6[0x72] - dVar26;
          pdVar6[0x73] = pdVar6[0x73] + dVar26;
          pdVar6[0x75] = pdVar6[0x75] + dVar26;
          pdVar6[0x77] = pdVar6[0x77] - dVar26;
          dVar26 = -dVar25 * local_a48[5];
          pdVar6[0x9e] = pdVar6[0x9e] - dVar26;
          pdVar6[0x9f] = pdVar6[0x9f] + dVar26;
          pdVar6[0xa1] = pdVar6[0xa1] + dVar26;
          pdVar6[0xa3] = pdVar6[0xa3] - dVar26;
          dVar26 = (double)local_6b8._0_8_ * local_a48[4];
          dVar30 = (double)local_808._0_8_ * (double)local_6b8._0_8_ * dVar30 -
                   ((double)local_808._0_8_ -
                   ((dStack_790 + dStack_780) - (local_798 + dStack_770)) * dVar31) * dVar25 *
                   dVar24;
          pdVar6[0xca] = pdVar6[0xca] - dVar26;
          pdVar6[0xcb] = pdVar6[0xcb] + dVar26;
          pdVar6[0xcd] = pdVar6[0xcd] + dVar26;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar26;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar30;
          pdVar6[0x1d3] = pdVar6[0x1d3] + dVar30;
          pdVar6[0x1d5] = pdVar6[0x1d5] + dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar30;
          dVar30 = local_a48[4] * local_a48[9];
          dVar24 = exp((double)local_878._0_8_);
          dVar25 = local_a48[5] * local_a48[8];
          local_808._0_8_ = dVar24 * 25010000.0;
          dVar24 = exp((dVar23 - (double)local_8c8._0_8_) + (double)local_7e8._0_8_);
          dVar24 = (double)local_808._0_8_ / dVar24;
          dVar26 = (double)local_808._0_8_ * dVar30 - dVar25 * dVar24;
          local_988[4] = local_988[4] - dVar26;
          local_988[5] = local_988[5] + dVar26;
          local_988[9] = local_988[9] - dVar26;
          local_988[8] = dVar26 + local_988[8];
          dVar26 = local_a48[9] * (double)local_808._0_8_;
          pdVar6[0x5c] = pdVar6[0x5c] - dVar26;
          pdVar6[0x5d] = pdVar6[0x5d] + dVar26;
          pdVar6[0x60] = dVar26 + pdVar6[0x60];
          pdVar6[0x61] = pdVar6[0x61] - dVar26;
          dVar26 = local_a48[8] * -dVar24;
          pdVar6[0x72] = pdVar6[0x72] - dVar26;
          pdVar6[0x73] = pdVar6[0x73] + dVar26;
          pdVar6[0x76] = pdVar6[0x76] + dVar26;
          pdVar6[0x77] = pdVar6[0x77] - dVar26;
          dVar26 = -dVar24 * local_a48[5];
          pdVar6[0xb4] = pdVar6[0xb4] - dVar26;
          pdVar6[0xb5] = pdVar6[0xb5] + dVar26;
          pdVar6[0xb8] = pdVar6[0xb8] + dVar26;
          pdVar6[0xb9] = pdVar6[0xb9] - dVar26;
          dVar26 = (double)local_808._0_8_ * local_a48[4];
          dVar30 = (double)local_858._0_8_ * (double)local_808._0_8_ * dVar30 -
                   ((double)local_858._0_8_ -
                   ((dStack_790 + local_778) - (local_798 + dStack_770)) * dVar31) * dVar24 * dVar25
          ;
          pdVar6[0xca] = pdVar6[0xca] - dVar26;
          pdVar6[0xcb] = pdVar6[0xcb] + dVar26;
          pdVar6[0xce] = pdVar6[0xce] + dVar26;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar26;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar30;
          pdVar6[0x1d3] = pdVar6[0x1d3] + dVar30;
          pdVar6[0x1d6] = pdVar6[0x1d6] + dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar30;
          dVar30 = local_a48[4] * local_a48[10];
          dVar24 = exp(dVar31 * -1570.0359973107265 + dVar28);
          dVar24 = dVar24 * 100.0;
          dVar26 = local_a48[5] * local_a48[9];
          local_838._8_4_ = (int)uStack_990;
          local_838._0_8_ = local_998 * 1570.0359973107265 + (double)local_838._0_8_;
          local_838._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          dVar25 = exp((dVar23 - (double)local_7e8._0_8_) + local_598);
          dVar25 = dVar24 / dVar25;
          dVar28 = dVar24 * dVar30 - dVar26 * dVar25;
          dVar26 = (double)local_838._0_8_ * dVar24 * dVar30 -
                   ((double)local_838._0_8_ -
                   ((dStack_790 + dStack_770) - (local_798 + local_768)) * dVar31) * dVar25 * dVar26
          ;
          local_988[4] = local_988[4] - dVar28;
          local_988[5] = local_988[5] + dVar28;
          local_988[10] = local_988[10] - dVar28;
          local_988[9] = dVar28 + local_988[9];
          dVar30 = local_a48[10] * dVar24;
          pdVar6[0x5c] = pdVar6[0x5c] - dVar30;
          pdVar6[0x5d] = pdVar6[0x5d] + dVar30;
          pdVar6[0x61] = dVar30 + pdVar6[0x61];
          pdVar6[0x62] = pdVar6[0x62] - dVar30;
          dVar30 = local_a48[9] * -dVar25;
          pdVar6[0x72] = pdVar6[0x72] - dVar30;
          pdVar6[0x73] = pdVar6[0x73] + dVar30;
          pdVar6[0x77] = pdVar6[0x77] + dVar30;
          pdVar6[0x78] = pdVar6[0x78] - dVar30;
          dVar30 = -dVar25 * local_a48[5];
          pdVar6[0xca] = pdVar6[0xca] - dVar30;
          pdVar6[0xcb] = pdVar6[0xcb] + dVar30;
          pdVar6[0xcf] = pdVar6[0xcf] + dVar30;
          pdVar6[0xd0] = pdVar6[0xd0] - dVar30;
          dVar24 = dVar24 * local_a48[4];
          pdVar6[0xe0] = pdVar6[0xe0] - dVar24;
          pdVar6[0xe1] = pdVar6[0xe1] + dVar24;
          pdVar6[0xe5] = pdVar6[0xe5] + dVar24;
          pdVar6[0xe6] = pdVar6[0xe6] - dVar24;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar26;
          pdVar6[0x1d3] = pdVar6[0x1d3] + dVar26;
          pdVar6[0x1d7] = pdVar6[0x1d7] + dVar26;
          pdVar6[0x1d8] = pdVar6[0x1d8] - dVar26;
          local_838._0_8_ = local_a48[4] * local_a48[0xb];
          dVar30 = exp(local_848 * 1.228 + dVar31 * -35.225166606330404);
          dVar30 = dVar30 * 47.6;
          dVar26 = dVar31 * 1.228 + local_998 * 35.225166606330404;
          dVar24 = local_a48[1] * local_a48[0xc];
          dVar25 = exp(((double)local_8d8._0_8_ + (double)local_818._0_8_) - local_568);
          dVar25 = dVar30 / dVar25;
          dVar28 = dVar30 * (double)local_838._0_8_ - dVar24 * dVar25;
          local_988[1] = local_988[1] + dVar28;
          local_988[4] = local_988[4] - dVar28;
          local_988[0xb] = local_988[0xb] - dVar28;
          local_988[0xc] = dVar28 + local_988[0xc];
          dVar28 = local_a48[0xc] * -dVar25;
          pdVar6[0x17] = pdVar6[0x17] + dVar28;
          pdVar6[0x1a] = pdVar6[0x1a] - dVar28;
          pdVar6[0x21] = pdVar6[0x21] - dVar28;
          pdVar6[0x22] = dVar28 + pdVar6[0x22];
          dVar28 = local_a48[0xb] * dVar30;
          pdVar6[0x59] = pdVar6[0x59] + dVar28;
          pdVar6[0x5c] = pdVar6[0x5c] - dVar28;
          pdVar6[99] = pdVar6[99] - dVar28;
          pdVar6[100] = dVar28 + pdVar6[100];
          dVar28 = dVar30 * local_a48[4];
          pdVar6[0xf3] = pdVar6[0xf3] + dVar28;
          pdVar6[0xf6] = pdVar6[0xf6] - dVar28;
          pdVar6[0xfd] = pdVar6[0xfd] - dVar28;
          pdVar6[0xfe] = dVar28 + pdVar6[0xfe];
          dVar28 = -dVar25 * local_a48[1];
          dVar30 = dVar26 * dVar30 * (double)local_838._0_8_ -
                   (dVar26 - ((dStack_7b0 + local_758) - (local_798 + dStack_760)) * dVar31) *
                   dVar25 * dVar24;
          pdVar6[0x109] = pdVar6[0x109] + dVar28;
          pdVar6[0x10c] = pdVar6[0x10c] - dVar28;
          pdVar6[0x113] = pdVar6[0x113] - dVar28;
          pdVar6[0x114] = dVar28 + pdVar6[0x114];
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar30;
          pdVar6[0x1d9] = pdVar6[0x1d9] - dVar30;
          pdVar6[0x1da] = dVar30 + pdVar6[0x1da];
          local_8d8._0_8_ = local_a48[4] * local_a48[0xd];
          dVar30 = exp((double)local_878._0_8_);
          local_838._0_8_ = local_a48[5] * local_a48[0xb];
          dVar30 = dVar30 * 50000000.0;
          dVar24 = exp((dVar23 - (double)local_818._0_8_) + (double)local_7c8._0_8_);
          dVar24 = dVar30 / dVar24;
          dVar26 = dVar30 * (double)local_8d8._0_8_ - (double)local_838._0_8_ * dVar24;
          dVar25 = (double)local_858._0_8_ * dVar30 * (double)local_8d8._0_8_ -
                   ((double)local_858._0_8_ -
                   ((dStack_790 + dStack_760) - (local_798 + dStack_750)) * dVar31) * dVar24 *
                   (double)local_838._0_8_;
          local_988[4] = local_988[4] - dVar26;
          local_988[5] = local_988[5] + dVar26;
          local_988[0xd] = local_988[0xd] - dVar26;
          local_988[0xb] = dVar26 + local_988[0xb];
          dVar26 = local_a48[0xd] * dVar30;
          pdVar6[0x5c] = pdVar6[0x5c] - dVar26;
          pdVar6[0x5d] = pdVar6[0x5d] + dVar26;
          pdVar6[99] = dVar26 + pdVar6[99];
          pdVar6[0x65] = pdVar6[0x65] - dVar26;
          dVar26 = local_a48[0xb] * -dVar24;
          pdVar6[0x72] = pdVar6[0x72] - dVar26;
          pdVar6[0x73] = pdVar6[0x73] + dVar26;
          pdVar6[0x79] = pdVar6[0x79] + dVar26;
          pdVar6[0x7b] = pdVar6[0x7b] - dVar26;
          dVar24 = -dVar24 * local_a48[5];
          pdVar6[0xf6] = pdVar6[0xf6] - dVar24;
          pdVar6[0xf7] = pdVar6[0xf7] + dVar24;
          pdVar6[0xfd] = pdVar6[0xfd] + dVar24;
          pdVar6[0xff] = pdVar6[0xff] - dVar24;
          dVar30 = dVar30 * local_a48[4];
          pdVar6[0x122] = pdVar6[0x122] - dVar30;
          pdVar6[0x123] = pdVar6[0x123] + dVar30;
          pdVar6[0x129] = pdVar6[0x129] + dVar30;
          pdVar6[299] = pdVar6[299] - dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar25;
          pdVar6[0x1d3] = pdVar6[0x1d3] + dVar25;
          pdVar6[0x1d9] = pdVar6[0x1d9] + dVar25;
          pdVar6[0x1db] = pdVar6[0x1db] - dVar25;
          local_8d8._0_8_ = local_a48[4] * local_a48[0xe];
          dVar30 = exp(local_848 * 1.18 + dVar31 * 224.93784961470985);
          dVar30 = dVar30 * 3430.0;
          local_838._0_8_ = local_a48[5] * local_a48[0xd];
          dVar25 = dVar31 * 1.18 + local_998 * -224.93784961470985;
          dVar24 = exp((dVar23 - (double)local_7c8._0_8_) + local_688);
          dVar24 = dVar30 / dVar24;
          dVar26 = dVar30 * (double)local_8d8._0_8_ - (double)local_838._0_8_ * dVar24;
          dVar28 = dVar25 * dVar30 * (double)local_8d8._0_8_ -
                   (dVar25 - ((dStack_790 + dStack_750) - (local_798 + local_748)) * dVar31) *
                   dVar24 * (double)local_838._0_8_;
          local_988[4] = local_988[4] - dVar26;
          local_988[5] = local_988[5] + dVar26;
          local_988[0xe] = local_988[0xe] - dVar26;
          local_988[0xd] = dVar26 + local_988[0xd];
          dVar25 = local_a48[0xe] * dVar30;
          pdVar6[0x5c] = pdVar6[0x5c] - dVar25;
          pdVar6[0x5d] = pdVar6[0x5d] + dVar25;
          pdVar6[0x65] = dVar25 + pdVar6[0x65];
          pdVar6[0x66] = pdVar6[0x66] - dVar25;
          dVar25 = local_a48[0xd] * -dVar24;
          pdVar6[0x72] = pdVar6[0x72] - dVar25;
          pdVar6[0x73] = pdVar6[0x73] + dVar25;
          pdVar6[0x7b] = pdVar6[0x7b] + dVar25;
          pdVar6[0x7c] = pdVar6[0x7c] - dVar25;
          dVar24 = -dVar24 * local_a48[5];
          pdVar6[0x122] = pdVar6[0x122] - dVar24;
          pdVar6[0x123] = pdVar6[0x123] + dVar24;
          pdVar6[299] = pdVar6[299] + dVar24;
          pdVar6[300] = pdVar6[300] - dVar24;
          dVar30 = dVar30 * local_a48[4];
          pdVar6[0x138] = pdVar6[0x138] - dVar30;
          pdVar6[0x139] = pdVar6[0x139] + dVar30;
          pdVar6[0x141] = pdVar6[0x141] + dVar30;
          pdVar6[0x142] = pdVar6[0x142] - dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar28;
          pdVar6[0x1d3] = pdVar6[0x1d3] + dVar28;
          pdVar6[0x1db] = pdVar6[0x1db] + dVar28;
          pdVar6[0x1dc] = pdVar6[0x1dc] - dVar28;
          local_8d8._0_8_ = local_a48[4] * local_a48[0x12];
          dVar30 = exp(local_848 * 2.12 + dVar31 * -437.79849925010643);
          dVar30 = dVar30 * 3.54;
          dVar25 = dVar31 * 2.12 + local_998 * 437.79849925010643;
          local_838._0_8_ = local_a48[5] * local_a48[0x11];
          dVar24 = exp((dVar23 - local_578) + local_558);
          dVar24 = dVar30 / dVar24;
          dVar23 = dVar30 * (double)local_8d8._0_8_ - (double)local_838._0_8_ * dVar24;
          local_988[4] = local_988[4] - dVar23;
          local_988[5] = local_988[5] + dVar23;
          local_988[0x12] = local_988[0x12] - dVar23;
          local_988[0x11] = dVar23 + local_988[0x11];
          dVar23 = local_a48[0x12] * dVar30;
          pdVar6[0x5c] = pdVar6[0x5c] - dVar23;
          pdVar6[0x5d] = pdVar6[0x5d] + dVar23;
          pdVar6[0x69] = dVar23 + pdVar6[0x69];
          pdVar6[0x6a] = pdVar6[0x6a] - dVar23;
          dVar23 = local_a48[0x11] * -dVar24;
          pdVar6[0x72] = pdVar6[0x72] - dVar23;
          pdVar6[0x73] = pdVar6[0x73] + dVar23;
          pdVar6[0x7f] = pdVar6[0x7f] + dVar23;
          pdVar6[0x80] = pdVar6[0x80] - dVar23;
          dVar23 = -dVar24 * local_a48[5];
          pdVar6[0x17a] = pdVar6[0x17a] - dVar23;
          pdVar6[0x17b] = pdVar6[0x17b] + dVar23;
          pdVar6[0x187] = pdVar6[0x187] + dVar23;
          pdVar6[0x188] = pdVar6[0x188] - dVar23;
          dVar23 = dVar30 * local_a48[4];
          dVar30 = dVar25 * dVar30 * (double)local_8d8._0_8_ -
                   (dVar25 - ((dStack_790 + dStack_730) - (local_798 + local_728)) * dVar31) *
                   dVar24 * (double)local_838._0_8_;
          pdVar6[400] = pdVar6[400] - dVar23;
          pdVar6[0x191] = pdVar6[0x191] + dVar23;
          pdVar6[0x19d] = pdVar6[0x19d] + dVar23;
          pdVar6[0x19e] = pdVar6[0x19e] - dVar23;
          pdVar6[0x1d2] = pdVar6[0x1d2] - dVar30;
          pdVar6[0x1d3] = pdVar6[0x1d3] + dVar30;
          pdVar6[0x1df] = pdVar6[0x1df] + dVar30;
          pdVar6[0x1e0] = pdVar6[0x1e0] - dVar30;
          local_8d8._0_8_ = local_a48[6] * local_a48[7];
          dVar30 = exp((double)local_878._0_8_);
          dVar30 = dVar30 * 20000000.0;
          local_838._0_8_ = local_a48[4] * local_a48[0xe];
          dVar23 = local_5c8 - (double)local_828._0_8_;
          dVar24 = exp(((double)local_6e8._0_8_ + dVar23) - local_688);
          dVar24 = dVar30 / dVar24;
          dVar25 = dVar30 * (double)local_8d8._0_8_ - (double)local_838._0_8_ * dVar24;
          local_988[4] = local_988[4] + dVar25;
          local_988[6] = local_988[6] - dVar25;
          local_988[7] = local_988[7] - dVar25;
          local_988[0xe] = dVar25 + local_988[0xe];
          dVar25 = local_a48[0xe] * -dVar24;
          pdVar6[0x5c] = pdVar6[0x5c] + dVar25;
          pdVar6[0x5e] = pdVar6[0x5e] - dVar25;
          pdVar6[0x5f] = pdVar6[0x5f] - dVar25;
          pdVar6[0x66] = dVar25 + pdVar6[0x66];
          dVar25 = local_a48[7] * dVar30;
          pdVar6[0x88] = pdVar6[0x88] + dVar25;
          pdVar6[0x8a] = pdVar6[0x8a] - dVar25;
          pdVar6[0x8b] = pdVar6[0x8b] - dVar25;
          pdVar6[0x92] = dVar25 + pdVar6[0x92];
          dVar25 = dVar30 * local_a48[6];
          dVar30 = (double)local_858._0_8_ * dVar30 * (double)local_8d8._0_8_ -
                   ((double)local_858._0_8_ -
                   ((local_798 + local_748) - (local_788 + dStack_780)) * dVar31) * dVar24 *
                   (double)local_838._0_8_;
          pdVar6[0x9e] = pdVar6[0x9e] + dVar25;
          pdVar6[0xa0] = pdVar6[0xa0] - dVar25;
          pdVar6[0xa1] = pdVar6[0xa1] - dVar25;
          pdVar6[0xa8] = dVar25 + pdVar6[0xa8];
          dVar24 = -dVar24 * local_a48[4];
          pdVar6[0x138] = pdVar6[0x138] + dVar24;
          pdVar6[0x13a] = pdVar6[0x13a] - dVar24;
          pdVar6[0x13b] = pdVar6[0x13b] - dVar24;
          pdVar6[0x142] = dVar24 + pdVar6[0x142];
          pdVar6[0x1d2] = pdVar6[0x1d2] + dVar30;
          pdVar6[0x1d4] = pdVar6[0x1d4] - dVar30;
          pdVar6[0x1d5] = pdVar6[0x1d5] - dVar30;
          pdVar6[0x1dc] = dVar30 + pdVar6[0x1dc];
          local_8d8._0_8_ = local_a48[6] * local_a48[9];
          dVar30 = exp((double)local_878._0_8_);
          local_838._0_8_ = local_a48[3] * local_a48[10];
          dVar30 = dVar30 * 1000000.0;
          dVar24 = exp(((local_5c8 - (double)local_898._0_8_) + (double)local_7e8._0_8_) - local_598
                      );
          dVar24 = dVar30 / dVar24;
          dVar25 = dVar30 * (double)local_8d8._0_8_ - (double)local_838._0_8_ * dVar24;
          local_988[3] = local_988[3] + dVar25;
          local_988[6] = local_988[6] - dVar25;
          local_988[9] = local_988[9] - dVar25;
          local_988[10] = dVar25 + local_988[10];
          dVar25 = local_a48[10] * -dVar24;
          pdVar6[0x45] = pdVar6[0x45] + dVar25;
          pdVar6[0x48] = pdVar6[0x48] - dVar25;
          pdVar6[0x4b] = pdVar6[0x4b] - dVar25;
          pdVar6[0x4c] = dVar25 + pdVar6[0x4c];
          dVar25 = local_a48[9] * dVar30;
          pdVar6[0x87] = pdVar6[0x87] + dVar25;
          pdVar6[0x8a] = pdVar6[0x8a] - dVar25;
          pdVar6[0x8d] = pdVar6[0x8d] - dVar25;
          pdVar6[0x8e] = dVar25 + pdVar6[0x8e];
          dVar25 = dVar30 * local_a48[6];
          pdVar6[0xc9] = pdVar6[0xc9] + dVar25;
          pdVar6[0xcc] = pdVar6[0xcc] - dVar25;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar25;
          pdVar6[0xd0] = dVar25 + pdVar6[0xd0];
          dVar25 = -dVar24 * local_a48[3];
          dVar30 = (double)local_858._0_8_ * dVar30 * (double)local_8d8._0_8_ -
                   ((double)local_858._0_8_ -
                   ((dStack_7a0 + local_768) - (local_788 + dStack_770)) * dVar31) * dVar24 *
                   (double)local_838._0_8_;
          pdVar6[0xdf] = pdVar6[0xdf] + dVar25;
          pdVar6[0xe2] = pdVar6[0xe2] - dVar25;
          pdVar6[0xe5] = pdVar6[0xe5] - dVar25;
          pdVar6[0xe6] = dVar25 + pdVar6[0xe6];
          pdVar6[0x1d1] = pdVar6[0x1d1] + dVar30;
          pdVar6[0x1d4] = pdVar6[0x1d4] - dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar30;
          pdVar6[0x1d8] = dVar30 + pdVar6[0x1d8];
          local_8d8._0_8_ = local_a48[6] * local_a48[9];
          dVar30 = exp((double)local_878._0_8_);
          local_5c8 = local_a48[4] * local_a48[0xf];
          local_838._0_8_ = dVar30 * 20000000.0;
          dVar30 = exp(((double)local_7e8._0_8_ + dVar23) - local_5b8);
          dVar30 = (double)local_838._0_8_ / dVar30;
          dVar24 = (double)local_838._0_8_ * (double)local_8d8._0_8_ - local_5c8 * dVar30;
          local_988[4] = local_988[4] + dVar24;
          local_988[6] = local_988[6] - dVar24;
          local_988[9] = local_988[9] - dVar24;
          local_988[0xf] = dVar24 + local_988[0xf];
          dVar24 = local_a48[0xf] * -dVar30;
          pdVar6[0x5c] = pdVar6[0x5c] + dVar24;
          pdVar6[0x5e] = pdVar6[0x5e] - dVar24;
          pdVar6[0x61] = pdVar6[0x61] - dVar24;
          pdVar6[0x67] = dVar24 + pdVar6[0x67];
          dVar24 = local_a48[9] * (double)local_838._0_8_;
          pdVar6[0x88] = pdVar6[0x88] + dVar24;
          pdVar6[0x8a] = pdVar6[0x8a] - dVar24;
          pdVar6[0x8d] = pdVar6[0x8d] - dVar24;
          pdVar6[0x93] = dVar24 + pdVar6[0x93];
          dVar24 = (double)local_838._0_8_ * local_a48[6];
          pdVar6[0xca] = pdVar6[0xca] + dVar24;
          pdVar6[0xcc] = pdVar6[0xcc] - dVar24;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar24;
          pdVar6[0xd5] = dVar24 + pdVar6[0xd5];
          dVar24 = -dVar30 * local_a48[4];
          dVar30 = (double)local_858._0_8_ * (double)local_838._0_8_ * (double)local_8d8._0_8_ -
                   ((double)local_858._0_8_ -
                   ((local_798 + dStack_740) - (local_788 + dStack_770)) * dVar31) * dVar30 *
                   local_5c8;
          pdVar6[0x14e] = pdVar6[0x14e] + dVar24;
          pdVar6[0x150] = pdVar6[0x150] - dVar24;
          pdVar6[0x153] = pdVar6[0x153] - dVar24;
          pdVar6[0x159] = dVar24 + pdVar6[0x159];
          pdVar6[0x1d2] = pdVar6[0x1d2] + dVar30;
          pdVar6[0x1d4] = pdVar6[0x1d4] - dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar30;
          pdVar6[0x1dd] = dVar30 + pdVar6[0x1dd];
          local_8d8._0_8_ = local_a48[6] * local_a48[0xb];
          dVar30 = exp(dVar31 * -11875.913312991392 + local_8a8);
          dVar30 = dVar30 * 150000000.0;
          local_838._8_4_ = (int)uStack_990;
          local_838._0_8_ = local_998 * 11875.913312991392 + (double)local_8b8._0_8_;
          local_838._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          local_5c8 = local_a48[4] * local_a48[0xc];
          dVar24 = exp((dVar23 + (double)local_818._0_8_) - local_568);
          dVar24 = dVar30 / dVar24;
          dVar23 = dVar30 * (double)local_8d8._0_8_ - local_5c8 * dVar24;
          local_988[4] = local_988[4] + dVar23;
          local_988[6] = local_988[6] - dVar23;
          local_988[0xb] = local_988[0xb] - dVar23;
          local_988[0xc] = dVar23 + local_988[0xc];
          dVar23 = local_a48[0xc] * -dVar24;
          pdVar6[0x5c] = pdVar6[0x5c] + dVar23;
          pdVar6[0x5e] = pdVar6[0x5e] - dVar23;
          pdVar6[99] = pdVar6[99] - dVar23;
          pdVar6[100] = dVar23 + pdVar6[100];
          dVar23 = local_a48[0xb] * dVar30;
          pdVar6[0x88] = pdVar6[0x88] + dVar23;
          pdVar6[0x8a] = pdVar6[0x8a] - dVar23;
          pdVar6[0x8f] = pdVar6[0x8f] - dVar23;
          pdVar6[0x90] = dVar23 + pdVar6[0x90];
          dVar23 = dVar30 * local_a48[6];
          pdVar6[0xf6] = pdVar6[0xf6] + dVar23;
          pdVar6[0xf8] = pdVar6[0xf8] - dVar23;
          pdVar6[0xfd] = pdVar6[0xfd] - dVar23;
          pdVar6[0xfe] = dVar23 + pdVar6[0xfe];
          dVar23 = -dVar24 * local_a48[4];
          dVar30 = (double)local_838._0_8_ * dVar30 * (double)local_8d8._0_8_ -
                   ((double)local_838._0_8_ -
                   ((local_798 + local_758) - (local_788 + dStack_760)) * dVar31) * dVar24 *
                   local_5c8;
          pdVar6[0x10c] = pdVar6[0x10c] + dVar23;
          pdVar6[0x10e] = pdVar6[0x10e] - dVar23;
          pdVar6[0x113] = pdVar6[0x113] - dVar23;
          pdVar6[0x114] = dVar23 + pdVar6[0x114];
          pdVar6[0x1d2] = pdVar6[0x1d2] + dVar30;
          pdVar6[0x1d4] = pdVar6[0x1d4] - dVar30;
          pdVar6[0x1d9] = pdVar6[0x1d9] - dVar30;
          pdVar6[0x1da] = dVar30 + pdVar6[0x1da];
          dVar30 = local_a48[3] * local_a48[7];
          dVar24 = exp(dVar31 * -754.82499870708 + local_8a8);
          dVar24 = dVar24 * 13200000.0;
          local_838._8_4_ = (int)uStack_990;
          local_838._0_8_ = local_998 * 754.82499870708 + (double)local_8b8._0_8_;
          local_838._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          local_8d8._0_8_ = local_a48[4] * local_a48[0xd];
          local_5c8 = (double)local_898._0_8_ - (double)local_828._0_8_;
          dVar23 = exp(((double)local_6e8._0_8_ + local_5c8) - (double)local_7c8._0_8_);
          dVar23 = dVar24 / dVar23;
          dVar25 = dVar24 * dVar30 - (double)local_8d8._0_8_ * dVar23;
          local_988[3] = local_988[3] - dVar25;
          local_988[4] = local_988[4] + dVar25;
          local_988[7] = local_988[7] - dVar25;
          local_988[0xd] = dVar25 + local_988[0xd];
          dVar25 = local_a48[7] * dVar24;
          pdVar6[0x45] = pdVar6[0x45] - dVar25;
          pdVar6[0x46] = pdVar6[0x46] + dVar25;
          pdVar6[0x49] = pdVar6[0x49] - dVar25;
          pdVar6[0x4f] = dVar25 + pdVar6[0x4f];
          dVar25 = local_a48[0xd] * -dVar23;
          pdVar6[0x5b] = pdVar6[0x5b] - dVar25;
          pdVar6[0x5c] = pdVar6[0x5c] + dVar25;
          pdVar6[0x5f] = pdVar6[0x5f] - dVar25;
          pdVar6[0x65] = dVar25 + pdVar6[0x65];
          dVar25 = dVar24 * local_a48[3];
          pdVar6[0x9d] = pdVar6[0x9d] - dVar25;
          pdVar6[0x9e] = pdVar6[0x9e] + dVar25;
          pdVar6[0xa1] = pdVar6[0xa1] - dVar25;
          pdVar6[0xa7] = dVar25 + pdVar6[0xa7];
          dVar25 = -dVar23 * local_a48[4];
          dVar30 = (double)local_838._0_8_ * dVar24 * dVar30 -
                   ((double)local_838._0_8_ -
                   ((local_798 + dStack_750) - (dStack_7a0 + dStack_780)) * dVar31) * dVar23 *
                   (double)local_8d8._0_8_;
          pdVar6[0x121] = pdVar6[0x121] - dVar25;
          pdVar6[0x122] = pdVar6[0x122] + dVar25;
          pdVar6[0x125] = pdVar6[0x125] - dVar25;
          pdVar6[299] = dVar25 + pdVar6[299];
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] + dVar30;
          pdVar6[0x1d5] = pdVar6[0x1d5] - dVar30;
          pdVar6[0x1db] = dVar30 + pdVar6[0x1db];
          dVar30 = local_a48[0] * local_a48[7];
          dVar24 = exp(dVar31 * -3638.256493768126 + (double)local_888._0_8_);
          dVar24 = dVar24 * 0.5;
          local_8d8._0_8_ = local_a48[1] * local_a48[9];
          local_838._8_4_ = (int)uStack_990;
          local_838._0_8_ = local_998 * 3638.256493768126 + (double)local_6c8._0_8_;
          local_838._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          dVar23 = exp(((double)local_6e8._0_8_ + (double)local_7f8._0_8_) - (double)local_7e8._0_8_
                      );
          dVar23 = dVar24 / dVar23;
          dVar25 = dVar24 * dVar30 - (double)local_8d8._0_8_ * dVar23;
          local_988[0] = local_988[0] - dVar25;
          local_988[1] = local_988[1] + dVar25;
          local_988[7] = local_988[7] - dVar25;
          local_988[9] = dVar25 + local_988[9];
          dVar25 = local_a48[7] * dVar24;
          *pdVar6 = *pdVar6 - dVar25;
          pdVar6[1] = pdVar6[1] + dVar25;
          pdVar6[7] = pdVar6[7] - dVar25;
          pdVar6[9] = dVar25 + pdVar6[9];
          dVar25 = local_a48[9] * -dVar23;
          pdVar6[0x16] = pdVar6[0x16] - dVar25;
          pdVar6[0x17] = pdVar6[0x17] + dVar25;
          pdVar6[0x1d] = pdVar6[0x1d] - dVar25;
          pdVar6[0x1f] = dVar25 + pdVar6[0x1f];
          dVar25 = dVar24 * local_a48[0];
          pdVar6[0x9a] = pdVar6[0x9a] - dVar25;
          pdVar6[0x9b] = pdVar6[0x9b] + dVar25;
          pdVar6[0xa1] = pdVar6[0xa1] - dVar25;
          pdVar6[0xa3] = dVar25 + pdVar6[0xa3];
          dVar25 = -dVar23 * local_a48[1];
          dVar30 = (double)local_838._0_8_ * dVar24 * dVar30 -
                   ((double)local_838._0_8_ -
                   ((dStack_7b0 + dStack_770) - (local_7b8 + dStack_780)) * dVar31) * dVar23 *
                   (double)local_8d8._0_8_;
          pdVar6[0xc6] = pdVar6[0xc6] - dVar25;
          pdVar6[199] = pdVar6[199] + dVar25;
          pdVar6[0xcd] = pdVar6[0xcd] - dVar25;
          pdVar6[0xcf] = dVar25 + pdVar6[0xcf];
          pdVar6[0x1ce] = pdVar6[0x1ce] - dVar30;
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d5] = pdVar6[0x1d5] - dVar30;
          pdVar6[0x1d7] = dVar30 + pdVar6[0x1d7];
          dVar30 = local_a48[7] * local_a48[9];
          dVar24 = exp((double)local_878._0_8_);
          local_8d8._0_8_ = local_a48[1] * local_a48[0x10];
          local_838._0_8_ = dVar24 * 40000000.0;
          dVar24 = exp((((double)local_6e8._0_8_ - local_868) + (double)local_7e8._0_8_) - local_548
                      );
          dVar24 = (double)local_838._0_8_ / dVar24;
          dVar23 = (double)local_838._0_8_ * dVar30 - (double)local_8d8._0_8_ * dVar24;
          local_988[1] = local_988[1] + dVar23;
          local_988[7] = local_988[7] - dVar23;
          local_988[9] = local_988[9] - dVar23;
          local_988[0x10] = dVar23 + local_988[0x10];
          dVar23 = local_a48[0x10] * -dVar24;
          pdVar6[0x17] = pdVar6[0x17] + dVar23;
          pdVar6[0x1d] = pdVar6[0x1d] - dVar23;
          pdVar6[0x1f] = pdVar6[0x1f] - dVar23;
          pdVar6[0x26] = dVar23 + pdVar6[0x26];
          dVar23 = local_a48[9] * (double)local_838._0_8_;
          pdVar6[0x9b] = pdVar6[0x9b] + dVar23;
          pdVar6[0xa1] = pdVar6[0xa1] - dVar23;
          pdVar6[0xa3] = pdVar6[0xa3] - dVar23;
          pdVar6[0xaa] = dVar23 + pdVar6[0xaa];
          dVar23 = (double)local_838._0_8_ * local_a48[7];
          pdVar6[199] = pdVar6[199] + dVar23;
          pdVar6[0xcd] = pdVar6[0xcd] - dVar23;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar23;
          pdVar6[0xd6] = dVar23 + pdVar6[0xd6];
          dVar23 = -dVar24 * local_a48[1];
          dVar30 = (double)local_858._0_8_ * (double)local_838._0_8_ * dVar30 -
                   ((double)local_858._0_8_ -
                   ((dStack_7b0 + local_738) - (dStack_780 + dStack_770)) * dVar31) * dVar24 *
                   (double)local_8d8._0_8_;
          pdVar6[0x161] = pdVar6[0x161] + dVar23;
          pdVar6[0x167] = pdVar6[0x167] - dVar23;
          pdVar6[0x169] = pdVar6[0x169] - dVar23;
          pdVar6[0x170] = dVar23 + pdVar6[0x170];
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d5] = pdVar6[0x1d5] - dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar30;
          pdVar6[0x1de] = dVar30 + pdVar6[0x1de];
          dVar30 = local_a48[7] * local_a48[10];
          dVar24 = exp(dVar31 * -4161.601826205035 + (double)local_888._0_8_);
          dVar24 = dVar24 * 2.46;
          local_8d8._8_4_ = (int)uStack_990;
          local_8d8._0_8_ = local_998 * 4161.601826205035 + (double)local_6c8._0_8_;
          local_8d8._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          local_888._0_8_ = local_a48[9] * local_a48[9];
          local_838._0_8_ = (double)local_7e8._0_8_ * -2.0;
          dVar23 = exp((double)local_7e8._0_8_ * -2.0 + (double)local_6e8._0_8_ + local_598);
          dVar23 = dVar24 / dVar23;
          dVar25 = dVar24 * dVar30 - (double)local_888._0_8_ * dVar23;
          local_988[7] = local_988[7] - dVar25;
          local_988[10] = local_988[10] - dVar25;
          local_988[9] = dVar25 + dVar25 + local_988[9];
          dVar25 = local_a48[10] * dVar24;
          pdVar6[0xa1] = pdVar6[0xa1] - dVar25;
          pdVar6[0xa3] = dVar25 + dVar25 + pdVar6[0xa3];
          pdVar6[0xa4] = pdVar6[0xa4] - dVar25;
          dVar25 = dVar23 * -2.0 * local_a48[9];
          pdVar6[0xcd] = pdVar6[0xcd] - dVar25;
          pdVar6[0xcf] = dVar25 + dVar25 + pdVar6[0xcf];
          pdVar6[0xd0] = pdVar6[0xd0] - dVar25;
          dVar25 = dVar24 * local_a48[7];
          pdVar6[0xe3] = pdVar6[0xe3] - dVar25;
          dVar30 = (double)local_8d8._0_8_ * dVar24 * dVar30 -
                   ((double)local_8d8._0_8_ -
                   ((dStack_770 + dStack_770) - (dStack_780 + local_768)) * dVar31) * dVar23 *
                   (double)local_888._0_8_;
          pdVar6[0xe5] = dVar25 + dVar25 + pdVar6[0xe5];
          pdVar6[0xe6] = pdVar6[0xe6] - dVar25;
          pdVar6[0x1d5] = pdVar6[0x1d5] - dVar30;
          pdVar6[0x1d7] = dVar30 + dVar30 + pdVar6[0x1d7];
          pdVar6[0x1d8] = pdVar6[0x1d8] - dVar30;
          dVar30 = dVar31 * -301.929999482832 + local_8a8;
          local_888._8_8_ = 0;
          local_888._0_8_ = dVar30;
          local_6c8._0_8_ = local_a48[8] * local_a48[0x13];
          dVar30 = exp(dVar30);
          dVar30 = dVar30 * 15000000.0;
          local_8d8._8_4_ = (int)uStack_990;
          local_8d8._0_8_ = local_998 * 301.929999482832 + (double)local_8b8._0_8_;
          local_8d8._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          dVar24 = local_a48[7] * local_a48[0x13];
          dVar23 = local_8c8._0_8_ - (double)local_6e8._0_8_;
          dVar25 = exp((dVar23 + local_4f8) - local_4f8);
          dVar25 = dVar30 / dVar25;
          dVar26 = dVar30 * (double)local_6c8._0_8_ - dVar24 * dVar25;
          dVar24 = (double)local_8d8._0_8_ * dVar30 * (double)local_6c8._0_8_ -
                   ((double)local_8d8._0_8_ -
                   ((dStack_720 + dStack_780) - (local_778 + dStack_720)) * dVar31) * dVar25 *
                   dVar24;
          local_988[7] = local_988[7] + dVar26;
          local_988[8] = local_988[8] - dVar26;
          pdVar6[0xa1] = pdVar6[0xa1] + -dVar25 * local_a48[0x13];
          pdVar6[0xa2] = pdVar6[0xa2] - -dVar25 * local_a48[0x13];
          pdVar6[0xb7] = local_a48[0x13] * dVar30 + pdVar6[0xb7];
          pdVar6[0xb8] = pdVar6[0xb8] - local_a48[0x13] * dVar30;
          dVar30 = dVar30 * local_a48[8] - dVar25 * local_a48[7];
          pdVar6[0x1a9] = pdVar6[0x1a9] + dVar30;
          pdVar6[0x1aa] = pdVar6[0x1aa] - dVar30;
          pdVar6[0x1d5] = pdVar6[0x1d5] + dVar24;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar24;
          local_6c8._0_8_ = local_a48[8] * local_a48[0x14];
          local_4f8 = exp((double)local_888._0_8_);
          local_4f8 = local_4f8 * 9000000.0;
          local_888._0_8_ = local_a48[7] * local_a48[0x14];
          dVar30 = exp((dVar23 + local_248) - local_248);
          dVar30 = local_4f8 / dVar30;
          dVar24 = local_4f8 * (double)local_6c8._0_8_ - (double)local_888._0_8_ * dVar30;
          dVar25 = (double)local_8d8._0_8_ * local_4f8 * (double)local_6c8._0_8_ -
                   ((double)local_8d8._0_8_ -
                   ((local_718 + dStack_780) - (local_778 + local_718)) * dVar31) * dVar30 *
                   (double)local_888._0_8_;
          local_988[7] = local_988[7] + dVar24;
          local_988[8] = local_988[8] - dVar24;
          pdVar6[0xa1] = pdVar6[0xa1] + -dVar30 * local_a48[0x14];
          pdVar6[0xa2] = pdVar6[0xa2] - -dVar30 * local_a48[0x14];
          pdVar6[0xb7] = local_a48[0x14] * local_4f8 + pdVar6[0xb7];
          pdVar6[0xb8] = pdVar6[0xb8] - local_a48[0x14] * local_4f8;
          dVar30 = local_4f8 * local_a48[8] - dVar30 * local_a48[7];
          pdVar6[0x1bf] = pdVar6[0x1bf] + dVar30;
          pdVar6[0x1c0] = pdVar6[0x1c0] - dVar30;
          pdVar6[0x1d5] = pdVar6[0x1d5] + dVar25;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar25;
          local_8d8._0_8_ = local_a48[3] * local_a48[8];
          dVar30 = exp((double)local_878._0_8_);
          local_6c8._0_8_ = dVar30 * 28000000.0;
          local_888._0_8_ = local_a48[1] * local_a48[4] * local_a48[0xb];
          dVar30 = exp(((((double)local_898._0_8_ - local_868) - (double)local_828._0_8_) +
                       (double)local_8c8._0_8_) - (double)local_818._0_8_);
          dVar30 = (double)local_6c8._0_8_ / (local_5a0 * dVar30);
          dVar24 = (double)local_6c8._0_8_ * (double)local_8d8._0_8_ -
                   (double)local_888._0_8_ * dVar30;
          local_988[1] = local_988[1] + dVar24;
          local_988[3] = local_988[3] - dVar24;
          local_988[4] = local_988[4] + dVar24;
          local_988[8] = local_988[8] - dVar24;
          local_988[0xb] = dVar24 + local_988[0xb];
          dVar24 = -dVar30;
          dVar25 = local_a48[4] * dVar24 * local_a48[0xb];
          pdVar6[0x17] = pdVar6[0x17] + dVar25;
          pdVar6[0x19] = pdVar6[0x19] - dVar25;
          pdVar6[0x1a] = pdVar6[0x1a] + dVar25;
          pdVar6[0x1e] = pdVar6[0x1e] - dVar25;
          pdVar6[0x21] = dVar25 + pdVar6[0x21];
          dVar25 = local_a48[8] * (double)local_6c8._0_8_;
          pdVar6[0x43] = pdVar6[0x43] + dVar25;
          pdVar6[0x45] = pdVar6[0x45] - dVar25;
          pdVar6[0x46] = pdVar6[0x46] + dVar25;
          pdVar6[0x4a] = pdVar6[0x4a] - dVar25;
          pdVar6[0x4d] = dVar25 + pdVar6[0x4d];
          dVar25 = local_a48[1] * dVar24 * local_a48[0xb];
          pdVar6[0x59] = pdVar6[0x59] + dVar25;
          pdVar6[0x5b] = pdVar6[0x5b] - dVar25;
          pdVar6[0x5c] = pdVar6[0x5c] + dVar25;
          pdVar6[0x60] = pdVar6[0x60] - dVar25;
          pdVar6[99] = dVar25 + pdVar6[99];
          dVar25 = (double)local_6c8._0_8_ * local_a48[3];
          pdVar6[0xb1] = pdVar6[0xb1] + dVar25;
          pdVar6[0xb3] = pdVar6[0xb3] - dVar25;
          pdVar6[0xb4] = pdVar6[0xb4] + dVar25;
          pdVar6[0xb8] = pdVar6[0xb8] - dVar25;
          pdVar6[0xbb] = dVar25 + pdVar6[0xbb];
          dVar24 = dVar24 * local_a48[1] * local_a48[4];
          pdVar6[0xf3] = pdVar6[0xf3] + dVar24;
          pdVar6[0xf5] = pdVar6[0xf5] - dVar24;
          pdVar6[0xf6] = pdVar6[0xf6] + dVar24;
          pdVar6[0xfa] = pdVar6[0xfa] - dVar24;
          dVar30 = (double)local_858._0_8_ * (double)local_6c8._0_8_ * (double)local_8d8._0_8_ -
                   ((double)local_858._0_8_ -
                   (((dStack_7b0 + local_798 + dStack_760) - (dStack_7a0 + local_778)) + -1.0) *
                   dVar31) * dVar30 * (double)local_888._0_8_;
          pdVar6[0xfd] = dVar24 + pdVar6[0xfd];
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] + dVar30;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar30;
          pdVar6[0x1d9] = dVar30 + pdVar6[0x1d9];
          local_828._0_8_ = local_a48[3] * local_a48[8];
          local_5a0 = exp((double)local_878._0_8_);
          local_8d8._0_8_ = local_a48[5] * local_a48[0xb];
          local_5a0 = local_5a0 * 12000000.0;
          dVar30 = exp((((double)local_898._0_8_ - (double)local_698._0_8_) +
                       (double)local_8c8._0_8_) - (double)local_818._0_8_);
          dVar30 = local_5a0 / dVar30;
          dVar24 = local_5a0 * (double)local_828._0_8_ - (double)local_8d8._0_8_ * dVar30;
          local_988[3] = local_988[3] - dVar24;
          local_988[5] = local_988[5] + dVar24;
          local_988[8] = local_988[8] - dVar24;
          local_988[0xb] = dVar24 + local_988[0xb];
          dVar24 = local_a48[8] * local_5a0;
          pdVar6[0x45] = pdVar6[0x45] - dVar24;
          pdVar6[0x47] = pdVar6[0x47] + dVar24;
          pdVar6[0x4a] = pdVar6[0x4a] - dVar24;
          pdVar6[0x4d] = dVar24 + pdVar6[0x4d];
          dVar24 = local_a48[0xb] * -dVar30;
          pdVar6[0x71] = pdVar6[0x71] - dVar24;
          pdVar6[0x73] = pdVar6[0x73] + dVar24;
          pdVar6[0x76] = pdVar6[0x76] - dVar24;
          pdVar6[0x79] = dVar24 + pdVar6[0x79];
          dVar24 = local_5a0 * local_a48[3];
          pdVar6[0xb3] = pdVar6[0xb3] - dVar24;
          pdVar6[0xb5] = pdVar6[0xb5] + dVar24;
          pdVar6[0xb8] = pdVar6[0xb8] - dVar24;
          pdVar6[0xbb] = dVar24 + pdVar6[0xbb];
          dVar24 = -dVar30 * local_a48[5];
          dVar30 = (double)local_858._0_8_ * local_5a0 * (double)local_828._0_8_ -
                   ((double)local_858._0_8_ -
                   ((dStack_790 + dStack_760) - (dStack_7a0 + local_778)) * dVar31) * dVar30 *
                   (double)local_8d8._0_8_;
          pdVar6[0xf5] = pdVar6[0xf5] - dVar24;
          pdVar6[0xf7] = pdVar6[0xf7] + dVar24;
          pdVar6[0xfa] = pdVar6[0xfa] - dVar24;
          pdVar6[0xfd] = dVar24 + pdVar6[0xfd];
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar30;
          pdVar6[0x1d3] = pdVar6[0x1d3] + dVar30;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar30;
          pdVar6[0x1d9] = dVar30 + pdVar6[0x1d9];
          local_828._0_8_ = local_a48[0] * local_a48[8];
          dVar30 = exp((double)local_878._0_8_);
          local_8d8._0_8_ = local_a48[1] * local_a48[9];
          local_898._0_8_ = dVar30 * 70000000.0;
          dVar30 = exp(((double)local_7f8._0_8_ + (double)local_8c8._0_8_) - (double)local_7e8._0_8_
                      );
          dVar30 = (double)local_898._0_8_ / dVar30;
          dVar24 = (double)local_898._0_8_ * (double)local_828._0_8_ -
                   (double)local_8d8._0_8_ * dVar30;
          local_988[0] = local_988[0] - dVar24;
          local_988[1] = local_988[1] + dVar24;
          local_988[8] = local_988[8] - dVar24;
          local_988[9] = dVar24 + local_988[9];
          dVar24 = local_a48[8] * (double)local_898._0_8_;
          *pdVar6 = *pdVar6 - dVar24;
          pdVar6[1] = pdVar6[1] + dVar24;
          pdVar6[8] = pdVar6[8] - dVar24;
          pdVar6[9] = dVar24 + pdVar6[9];
          dVar24 = local_a48[9] * -dVar30;
          pdVar6[0x16] = pdVar6[0x16] - dVar24;
          pdVar6[0x17] = pdVar6[0x17] + dVar24;
          pdVar6[0x1e] = pdVar6[0x1e] - dVar24;
          pdVar6[0x1f] = dVar24 + pdVar6[0x1f];
          dVar24 = (double)local_898._0_8_ * local_a48[0];
          pdVar6[0xb0] = pdVar6[0xb0] - dVar24;
          pdVar6[0xb1] = pdVar6[0xb1] + dVar24;
          pdVar6[0xb8] = pdVar6[0xb8] - dVar24;
          pdVar6[0xb9] = dVar24 + pdVar6[0xb9];
          dVar24 = -dVar30 * local_a48[1];
          dVar30 = (double)local_858._0_8_ * (double)local_898._0_8_ * (double)local_828._0_8_ -
                   ((double)local_858._0_8_ -
                   ((dStack_7b0 + dStack_770) - (local_7b8 + local_778)) * dVar31) * dVar30 *
                   (double)local_8d8._0_8_;
          pdVar6[0xc6] = pdVar6[0xc6] - dVar24;
          pdVar6[199] = pdVar6[199] + dVar24;
          pdVar6[0xce] = pdVar6[0xce] - dVar24;
          pdVar6[0xcf] = dVar24 + pdVar6[0xcf];
          pdVar6[0x1ce] = pdVar6[0x1ce] - dVar30;
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar30;
          pdVar6[0x1d7] = dVar30 + pdVar6[0x1d7];
          local_828._0_8_ = local_a48[5] * local_a48[8];
          local_898._0_8_ = exp((double)local_878._0_8_);
          local_8d8._0_8_ = local_a48[5] * local_a48[7];
          local_898._0_8_ = (double)local_898._0_8_ * 30000000.0;
          dVar30 = exp((((double)local_698._0_8_ - (double)local_698._0_8_) -
                       (double)local_6e8._0_8_) + (double)local_8c8._0_8_);
          dVar30 = (double)local_898._0_8_ / dVar30;
          dVar24 = (double)local_898._0_8_ * (double)local_828._0_8_ -
                   (double)local_8d8._0_8_ * dVar30;
          local_988[7] = local_988[7] + dVar24;
          local_988[8] = local_988[8] - dVar24;
          dVar24 = local_a48[8] * (double)local_898._0_8_ - dVar30 * local_a48[7];
          pdVar6[0x75] = pdVar6[0x75] + dVar24;
          pdVar6[0x76] = pdVar6[0x76] - dVar24;
          pdVar6[0xa1] = pdVar6[0xa1] + -dVar30 * local_a48[5];
          pdVar6[0xa2] = pdVar6[0xa2] - -dVar30 * local_a48[5];
          dVar30 = (double)local_858._0_8_ * (double)local_898._0_8_ * (double)local_828._0_8_ -
                   ((double)local_858._0_8_ -
                   ((dStack_790 + dStack_780) - (local_778 + dStack_790)) * dVar31) * dVar30 *
                   (double)local_8d8._0_8_;
          pdVar6[0xb7] = pdVar6[0xb7] + (double)local_898._0_8_ * local_a48[5];
          pdVar6[0xb8] = pdVar6[0xb8] - (double)local_898._0_8_ * local_a48[5];
          pdVar6[0x1d5] = pdVar6[0x1d5] + dVar30;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar30;
          local_8d8._0_8_ = local_a48[8] * local_a48[9];
          dVar30 = dVar31 * 286.8334995086904 + local_8a8;
          local_6e8._8_8_ = 0;
          local_6e8._0_8_ = dVar30;
          dVar30 = exp(dVar30);
          local_698._8_4_ = extraout_XMM0_Dc_03;
          local_698._0_8_ = dVar30 * 12000000.0;
          local_698._12_4_ = extraout_XMM0_Dd_03;
          local_828._8_4_ = (int)uStack_990;
          local_828._0_8_ = local_998 * -286.8334995086904 + (double)local_8b8._0_8_;
          local_828._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          local_898._0_8_ = local_a48[1] * local_a48[0x10];
          dVar30 = exp((((double)local_8c8._0_8_ - local_868) + (double)local_7e8._0_8_) - local_548
                      );
          dVar30 = (double)local_698._0_8_ / dVar30;
          dVar24 = (double)local_698._0_8_ * (double)local_8d8._0_8_ -
                   (double)local_898._0_8_ * dVar30;
          local_988[1] = local_988[1] + dVar24;
          local_988[8] = local_988[8] - dVar24;
          local_988[9] = local_988[9] - dVar24;
          local_988[0x10] = dVar24 + local_988[0x10];
          dVar24 = local_a48[0x10] * -dVar30;
          pdVar6[0x17] = pdVar6[0x17] + dVar24;
          pdVar6[0x1e] = pdVar6[0x1e] - dVar24;
          pdVar6[0x1f] = pdVar6[0x1f] - dVar24;
          pdVar6[0x26] = dVar24 + pdVar6[0x26];
          dVar24 = local_a48[9] * (double)local_698._0_8_;
          pdVar6[0xb1] = pdVar6[0xb1] + dVar24;
          pdVar6[0xb8] = pdVar6[0xb8] - dVar24;
          pdVar6[0xb9] = pdVar6[0xb9] - dVar24;
          pdVar6[0xc0] = dVar24 + pdVar6[0xc0];
          dVar25 = (double)local_698._0_8_ * local_a48[8];
          dVar24 = (double)local_828._0_8_ * (double)local_698._0_8_ * (double)local_8d8._0_8_ -
                   ((double)local_828._0_8_ -
                   ((dStack_7b0 + local_738) - (local_778 + dStack_770)) * dVar31) * dVar30 *
                   (double)local_898._0_8_;
          pdVar6[199] = pdVar6[199] + dVar25;
          pdVar6[0xce] = pdVar6[0xce] - dVar25;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar25;
          pdVar6[0xd6] = dVar25 + pdVar6[0xd6];
          dVar30 = -dVar30 * local_a48[1];
          pdVar6[0x161] = pdVar6[0x161] + dVar30;
          pdVar6[0x168] = pdVar6[0x168] - dVar30;
          pdVar6[0x169] = pdVar6[0x169] - dVar30;
          pdVar6[0x170] = dVar30 + pdVar6[0x170];
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar24;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar24;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar24;
          pdVar6[0x1de] = dVar24 + pdVar6[0x1de];
          local_868 = local_a48[8] * local_a48[10];
          dVar30 = exp((double)local_6e8._0_8_);
          local_8d8._0_8_ = dVar30 * 16000000.0;
          local_6e8._0_8_ = local_a48[9] * local_a48[9];
          dVar30 = exp((double)local_838._0_8_ + (double)local_8c8._0_8_ + local_598);
          dVar30 = (double)local_8d8._0_8_ / dVar30;
          dVar24 = (double)local_8d8._0_8_ * local_868 - (double)local_6e8._0_8_ * dVar30;
          local_988[8] = local_988[8] - dVar24;
          local_988[10] = local_988[10] - dVar24;
          local_988[9] = dVar24 + dVar24 + local_988[9];
          dVar24 = local_a48[10] * (double)local_8d8._0_8_;
          pdVar6[0xb8] = pdVar6[0xb8] - dVar24;
          pdVar6[0xb9] = dVar24 + dVar24 + pdVar6[0xb9];
          pdVar6[0xba] = pdVar6[0xba] - dVar24;
          dVar24 = dVar30 * -2.0 * local_a48[9];
          pdVar6[0xce] = pdVar6[0xce] - dVar24;
          pdVar6[0xcf] = dVar24 + dVar24 + pdVar6[0xcf];
          pdVar6[0xd0] = pdVar6[0xd0] - dVar24;
          dVar24 = (double)local_8d8._0_8_ * local_a48[8];
          pdVar6[0xe4] = pdVar6[0xe4] - dVar24;
          dVar30 = (double)local_828._0_8_ * (double)local_8d8._0_8_ * local_868 -
                   ((double)local_828._0_8_ -
                   ((dStack_770 + dStack_770) - (local_778 + local_768)) * dVar31) * dVar30 *
                   (double)local_6e8._0_8_;
          pdVar6[0xe5] = dVar24 + dVar24 + pdVar6[0xe5];
          pdVar6[0xe6] = pdVar6[0xe6] - dVar24;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar30;
          pdVar6[0x1d7] = dVar30 + dVar30 + pdVar6[0x1d7];
          pdVar6[0x1d8] = pdVar6[0x1d8] - dVar30;
          local_868 = local_a48[8] * local_a48[0xb];
          local_6e8._0_8_ = exp((double)local_878._0_8_);
          local_6e8._0_8_ = (double)local_6e8._0_8_ * 9000000.0;
          local_828._0_8_ = local_a48[7] * local_a48[0xb];
          dVar30 = exp(((double)local_818._0_8_ + dVar23) - (double)local_818._0_8_);
          dVar30 = (double)local_6e8._0_8_ / dVar30;
          dVar25 = (double)local_6e8._0_8_ * local_868 - (double)local_828._0_8_ * dVar30;
          dVar24 = (double)local_858._0_8_ * (double)local_6e8._0_8_ * local_868 -
                   ((double)local_858._0_8_ -
                   ((dStack_760 + dStack_780) - (local_778 + dStack_760)) * dVar31) * dVar30 *
                   (double)local_828._0_8_;
          local_988[7] = local_988[7] + dVar25;
          local_988[8] = local_988[8] - dVar25;
          pdVar6[0xa1] = pdVar6[0xa1] + -dVar30 * local_a48[0xb];
          pdVar6[0xa2] = pdVar6[0xa2] - -dVar30 * local_a48[0xb];
          pdVar6[0xb7] = local_a48[0xb] * (double)local_6e8._0_8_ + pdVar6[0xb7];
          pdVar6[0xb8] = pdVar6[0xb8] - local_a48[0xb] * (double)local_6e8._0_8_;
          dVar30 = (double)local_6e8._0_8_ * local_a48[8] - dVar30 * local_a48[7];
          pdVar6[0xf9] = pdVar6[0xf9] + dVar30;
          pdVar6[0xfa] = pdVar6[0xfa] - dVar30;
          pdVar6[0x1d5] = pdVar6[0x1d5] + dVar24;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar24;
          local_868 = local_a48[8] * local_a48[0xc];
          dVar30 = exp((double)local_878._0_8_);
          local_6e8._0_8_ = dVar30 * 7000000.0;
          local_828._0_8_ = local_a48[7] * local_a48[0xc];
          dVar30 = exp((dVar23 + local_568) - local_568);
          dVar30 = (double)local_6e8._0_8_ / dVar30;
          dVar23 = (double)local_6e8._0_8_ * local_868 - (double)local_828._0_8_ * dVar30;
          dVar24 = (double)local_858._0_8_ * (double)local_6e8._0_8_ * local_868 -
                   ((double)local_858._0_8_ -
                   ((local_758 + dStack_780) - (local_778 + local_758)) * dVar31) * dVar30 *
                   (double)local_828._0_8_;
          local_988[7] = local_988[7] + dVar23;
          local_988[8] = local_988[8] - dVar23;
          pdVar6[0xa1] = pdVar6[0xa1] + -dVar30 * local_a48[0xc];
          pdVar6[0xa2] = pdVar6[0xa2] - -dVar30 * local_a48[0xc];
          pdVar6[0xb7] = local_a48[0xc] * (double)local_6e8._0_8_ + pdVar6[0xb7];
          pdVar6[0xb8] = pdVar6[0xb8] - local_a48[0xc] * (double)local_6e8._0_8_;
          dVar30 = (double)local_6e8._0_8_ * local_a48[8] - dVar30 * local_a48[7];
          pdVar6[0x10f] = pdVar6[0x10f] + dVar30;
          pdVar6[0x110] = pdVar6[0x110] - dVar30;
          pdVar6[0x1d5] = pdVar6[0x1d5] + dVar24;
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar24;
          local_868 = local_a48[8] * local_a48[0xc];
          dVar30 = exp((double)local_878._0_8_);
          local_828._0_8_ = local_a48[0xb] * local_a48[0xe];
          dVar30 = dVar30 * 14000000.0;
          dVar24 = exp((((double)local_8c8._0_8_ - (double)local_818._0_8_) + local_568) - local_688
                      );
          dVar24 = dVar30 / dVar24;
          dVar23 = dVar30 * local_868 - (double)local_828._0_8_ * dVar24;
          local_988[8] = local_988[8] - dVar23;
          local_988[0xb] = local_988[0xb] + dVar23;
          local_988[0xc] = local_988[0xc] - dVar23;
          local_988[0xe] = dVar23 + local_988[0xe];
          dVar23 = local_a48[0xc] * dVar30;
          pdVar6[0xb8] = pdVar6[0xb8] - dVar23;
          pdVar6[0xbb] = pdVar6[0xbb] + dVar23;
          pdVar6[0xbc] = pdVar6[0xbc] - dVar23;
          pdVar6[0xbe] = dVar23 + pdVar6[0xbe];
          dVar23 = local_a48[0xe] * -dVar24;
          pdVar6[0xfa] = pdVar6[0xfa] - dVar23;
          pdVar6[0xfd] = pdVar6[0xfd] + dVar23;
          pdVar6[0xfe] = pdVar6[0xfe] - dVar23;
          pdVar6[0x100] = dVar23 + pdVar6[0x100];
          dVar23 = dVar30 * local_a48[8];
          pdVar6[0x110] = pdVar6[0x110] - dVar23;
          pdVar6[0x113] = pdVar6[0x113] + dVar23;
          pdVar6[0x114] = pdVar6[0x114] - dVar23;
          pdVar6[0x116] = dVar23 + pdVar6[0x116];
          dVar23 = -dVar24 * local_a48[0xb];
          dVar30 = (double)local_858._0_8_ * dVar30 * local_868 -
                   ((double)local_858._0_8_ -
                   ((dStack_760 + local_748) - (local_778 + local_758)) * dVar31) * dVar24 *
                   (double)local_828._0_8_;
          pdVar6[0x13c] = pdVar6[0x13c] - dVar23;
          pdVar6[0x13f] = pdVar6[0x13f] + dVar23;
          pdVar6[0x140] = pdVar6[0x140] - dVar23;
          pdVar6[0x142] = dVar23 + pdVar6[0x142];
          pdVar6[0x1d6] = pdVar6[0x1d6] - dVar30;
          pdVar6[0x1d9] = pdVar6[0x1d9] + dVar30;
          pdVar6[0x1da] = pdVar6[0x1da] - dVar30;
          pdVar6[0x1dc] = dVar30 + pdVar6[0x1dc];
          local_868 = local_a48[3] * local_a48[9];
          dVar30 = exp(dVar31 * -14492.639975175936 + local_8a8);
          dVar30 = dVar30 * 26750000.0;
          local_828._8_4_ = (int)uStack_990;
          local_828._0_8_ = local_998 * 14492.639975175936 + (double)local_8b8._0_8_;
          local_828._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          local_8c8._0_8_ = local_a48[2] * local_a48[0xf];
          dVar24 = exp(((double)local_7d8._0_8_ + (double)local_7e8._0_8_) - local_5b8);
          dVar24 = dVar30 / dVar24;
          dVar23 = dVar30 * local_868 - (double)local_8c8._0_8_ * dVar24;
          local_988[2] = local_988[2] + dVar23;
          local_988[3] = local_988[3] - dVar23;
          local_988[9] = local_988[9] - dVar23;
          local_988[0xf] = dVar23 + local_988[0xf];
          dVar23 = local_a48[0xf] * -dVar24;
          pdVar6[0x2e] = pdVar6[0x2e] + dVar23;
          pdVar6[0x2f] = pdVar6[0x2f] - dVar23;
          pdVar6[0x35] = pdVar6[0x35] - dVar23;
          pdVar6[0x3b] = dVar23 + pdVar6[0x3b];
          dVar23 = local_a48[9] * dVar30;
          pdVar6[0x44] = pdVar6[0x44] + dVar23;
          pdVar6[0x45] = pdVar6[0x45] - dVar23;
          pdVar6[0x4b] = pdVar6[0x4b] - dVar23;
          pdVar6[0x51] = dVar23 + pdVar6[0x51];
          dVar23 = dVar30 * local_a48[3];
          pdVar6[200] = pdVar6[200] + dVar23;
          pdVar6[0xc9] = pdVar6[0xc9] - dVar23;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar23;
          pdVar6[0xd5] = dVar23 + pdVar6[0xd5];
          dVar23 = -dVar24 * local_a48[2];
          dVar30 = (double)local_828._0_8_ * dVar30 * local_868 -
                   ((double)local_828._0_8_ -
                   ((local_7a8 + dStack_740) - (dStack_7a0 + dStack_770)) * dVar31) * dVar24 *
                   (double)local_8c8._0_8_;
          pdVar6[0x14c] = pdVar6[0x14c] + dVar23;
          pdVar6[0x14d] = pdVar6[0x14d] - dVar23;
          pdVar6[0x153] = pdVar6[0x153] - dVar23;
          pdVar6[0x159] = dVar23 + pdVar6[0x159];
          pdVar6[0x1d0] = pdVar6[0x1d0] + dVar30;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar30;
          pdVar6[0x1dd] = dVar30 + pdVar6[0x1dd];
          local_868 = local_a48[3] * local_a48[9];
          dVar30 = exp(dVar31 * -4498.756992294197 + local_8a8);
          dVar30 = dVar30 * 36000.0;
          local_828._8_4_ = (int)uStack_990;
          local_828._0_8_ = local_998 * 4498.756992294197 + (double)local_8b8._0_8_;
          local_828._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          local_8c8._0_8_ = local_a48[4] * local_a48[0xe];
          dVar24 = exp((local_5c8 + (double)local_7e8._0_8_) - local_688);
          dVar24 = dVar30 / dVar24;
          dVar23 = dVar30 * local_868 - (double)local_8c8._0_8_ * dVar24;
          local_988[3] = local_988[3] - dVar23;
          local_988[4] = local_988[4] + dVar23;
          local_988[9] = local_988[9] - dVar23;
          local_988[0xe] = dVar23 + local_988[0xe];
          dVar23 = local_a48[9] * dVar30;
          pdVar6[0x45] = pdVar6[0x45] - dVar23;
          pdVar6[0x46] = pdVar6[0x46] + dVar23;
          pdVar6[0x4b] = pdVar6[0x4b] - dVar23;
          pdVar6[0x50] = dVar23 + pdVar6[0x50];
          dVar23 = local_a48[0xe] * -dVar24;
          pdVar6[0x5b] = pdVar6[0x5b] - dVar23;
          pdVar6[0x5c] = pdVar6[0x5c] + dVar23;
          pdVar6[0x61] = pdVar6[0x61] - dVar23;
          pdVar6[0x66] = dVar23 + pdVar6[0x66];
          dVar23 = dVar30 * local_a48[3];
          pdVar6[0xc9] = pdVar6[0xc9] - dVar23;
          pdVar6[0xca] = pdVar6[0xca] + dVar23;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar23;
          pdVar6[0xd4] = dVar23 + pdVar6[0xd4];
          dVar23 = -dVar24 * local_a48[4];
          dVar30 = (double)local_828._0_8_ * dVar30 * local_868 -
                   ((double)local_828._0_8_ -
                   ((local_798 + local_748) - (dStack_7a0 + dStack_770)) * dVar31) * dVar24 *
                   (double)local_8c8._0_8_;
          pdVar6[0x137] = pdVar6[0x137] - dVar23;
          pdVar6[0x138] = pdVar6[0x138] + dVar23;
          pdVar6[0x13d] = pdVar6[0x13d] - dVar23;
          pdVar6[0x142] = dVar23 + pdVar6[0x142];
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar30;
          pdVar6[0x1d2] = pdVar6[0x1d2] + dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar30;
          pdVar6[0x1dc] = dVar30 + pdVar6[0x1dc];
          local_868 = local_a48[9] * local_a48[9];
          dVar30 = exp(local_848 * 0.1 + dVar31 * -5334.096657530033);
          dVar30 = dVar30 * 4990000.0;
          local_828._8_8_ = 0;
          local_828._0_8_ = dVar31 * 0.1 + local_998 * 5334.096657530033;
          local_8c8._0_8_ = local_a48[1] * local_a48[0x11];
          dVar24 = exp((local_6a8 + (double)local_708._0_8_) - local_578);
          dVar24 = dVar30 / dVar24;
          dVar23 = dVar30 * local_868 - (double)local_8c8._0_8_ * dVar24;
          local_988[1] = local_988[1] + dVar23;
          local_988[9] = local_988[9] - (dVar23 + dVar23);
          local_988[0x11] = dVar23 + local_988[0x11];
          dVar23 = local_a48[0x11] * -dVar24;
          pdVar6[0x17] = pdVar6[0x17] + dVar23;
          pdVar6[0x1f] = pdVar6[0x1f] - (dVar23 + dVar23);
          pdVar6[0x27] = dVar23 + pdVar6[0x27];
          dVar23 = (dVar30 + dVar30) * local_a48[9];
          pdVar6[199] = pdVar6[199] + dVar23;
          pdVar6[0xcf] = pdVar6[0xcf] - (dVar23 + dVar23);
          pdVar6[0xd7] = dVar23 + pdVar6[0xd7];
          dVar23 = -dVar24 * local_a48[1];
          pdVar6[0x177] = pdVar6[0x177] + dVar23;
          pdVar6[0x17f] = pdVar6[0x17f] - (dVar23 + dVar23);
          dVar30 = (double)local_828._0_8_ * dVar30 * local_868 -
                   ((double)local_828._0_8_ -
                   ((dStack_7b0 + dStack_730) - (dStack_770 + dStack_770)) * dVar31) * dVar24 *
                   (double)local_8c8._0_8_;
          pdVar6[0x187] = dVar23 + pdVar6[0x187];
          pdVar6[0x1cf] = pdVar6[0x1cf] + dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] - (dVar30 + dVar30);
          pdVar6[0x1df] = dVar30 + pdVar6[0x1df];
          local_868 = local_a48[9] * local_a48[0xd];
          dVar30 = exp((double)local_878._0_8_);
          local_8c8._8_4_ = extraout_XMM0_Dc_04;
          local_8c8._0_8_ = dVar30 * 26480000.0;
          local_8c8._12_4_ = extraout_XMM0_Dd_04;
          uVar22 = local_7e8._12_4_;
          dVar30 = local_7e8._0_8_ - local_598;
          local_7e8._8_4_ = local_7e8._8_4_;
          local_7e8._0_8_ = dVar30;
          local_7e8._12_4_ = uVar22;
          local_878._0_8_ = local_a48[10] * local_a48[0xb];
          dVar30 = exp((dVar30 - (double)local_818._0_8_) + (double)local_7c8._0_8_);
          dVar30 = (double)local_8c8._0_8_ / dVar30;
          dVar24 = (double)local_8c8._0_8_ * local_868 - (double)local_878._0_8_ * dVar30;
          local_988[9] = local_988[9] - dVar24;
          local_988[0xd] = local_988[0xd] - dVar24;
          local_988[10] = dVar24 + local_988[10];
          local_988[0xb] = dVar24 + local_988[0xb];
          dVar24 = local_a48[0xd] * (double)local_8c8._0_8_;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar24;
          pdVar6[0xd0] = dVar24 + pdVar6[0xd0];
          pdVar6[0xd1] = dVar24 + pdVar6[0xd1];
          pdVar6[0xd3] = pdVar6[0xd3] - dVar24;
          dVar24 = local_a48[0xb] * -dVar30;
          pdVar6[0xe5] = pdVar6[0xe5] - dVar24;
          pdVar6[0xe6] = dVar24 + pdVar6[0xe6];
          pdVar6[0xe7] = dVar24 + pdVar6[0xe7];
          pdVar6[0xe9] = pdVar6[0xe9] - dVar24;
          dVar24 = -dVar30 * local_a48[10];
          dVar23 = (double)local_858._0_8_ * (double)local_8c8._0_8_ * local_868 -
                   ((double)local_858._0_8_ -
                   ((dStack_760 + local_768) - (dStack_750 + dStack_770)) * dVar31) * dVar30 *
                   (double)local_878._0_8_;
          pdVar6[0xfb] = pdVar6[0xfb] - dVar24;
          pdVar6[0xfc] = dVar24 + pdVar6[0xfc];
          pdVar6[0xfd] = dVar24 + pdVar6[0xfd];
          pdVar6[0xff] = pdVar6[0xff] - dVar24;
          dVar30 = (double)local_8c8._0_8_ * local_a48[9];
          pdVar6[0x127] = pdVar6[0x127] - dVar30;
          pdVar6[0x128] = dVar30 + pdVar6[0x128];
          pdVar6[0x129] = dVar30 + pdVar6[0x129];
          pdVar6[299] = pdVar6[299] - dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar23;
          pdVar6[0x1d8] = dVar23 + pdVar6[0x1d8];
          pdVar6[0x1d9] = dVar23 + pdVar6[0x1d9];
          pdVar6[0x1db] = pdVar6[0x1db] - dVar23;
          local_858._0_8_ = local_a48[9] * local_a48[0xe];
          dVar30 = exp(local_848 * 2.81 + dVar31 * -2948.8496616156594);
          local_878._0_8_ = local_a48[10] * local_a48[0xd];
          local_868 = dVar31 * 2.81 + local_998 * 2948.8496616156594;
          dStack_860 = 0.0;
          local_8c8._0_8_ = dVar30 * 0.00332;
          dVar30 = exp(((double)local_7e8._0_8_ - (double)local_7c8._0_8_) + local_688);
          dVar30 = (double)local_8c8._0_8_ / dVar30;
          dVar24 = (double)local_8c8._0_8_ * (double)local_858._0_8_ -
                   (double)local_878._0_8_ * dVar30;
          dVar23 = local_868 * (double)local_8c8._0_8_ * (double)local_858._0_8_ -
                   (local_868 - ((local_768 + dStack_750) - (dStack_770 + local_748)) * dVar31) *
                   dVar30 * (double)local_878._0_8_;
          local_988[9] = local_988[9] - dVar24;
          local_988[10] = local_988[10] + dVar24;
          local_988[0xe] = local_988[0xe] - dVar24;
          local_988[0xd] = dVar24 + local_988[0xd];
          dVar24 = local_a48[0xe] * (double)local_8c8._0_8_;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar24;
          pdVar6[0xd0] = pdVar6[0xd0] + dVar24;
          pdVar6[0xd3] = dVar24 + pdVar6[0xd3];
          pdVar6[0xd4] = pdVar6[0xd4] - dVar24;
          dVar24 = local_a48[0xd] * -dVar30;
          pdVar6[0xe5] = pdVar6[0xe5] - dVar24;
          pdVar6[0xe6] = pdVar6[0xe6] + dVar24;
          pdVar6[0xe9] = pdVar6[0xe9] + dVar24;
          pdVar6[0xea] = pdVar6[0xea] - dVar24;
          dVar30 = -dVar30 * local_a48[10];
          pdVar6[0x127] = pdVar6[0x127] - dVar30;
          pdVar6[0x128] = pdVar6[0x128] + dVar30;
          pdVar6[299] = pdVar6[299] + dVar30;
          pdVar6[300] = pdVar6[300] - dVar30;
          dVar30 = (double)local_8c8._0_8_ * local_a48[9];
          pdVar6[0x13d] = pdVar6[0x13d] - dVar30;
          pdVar6[0x13e] = pdVar6[0x13e] + dVar30;
          pdVar6[0x141] = pdVar6[0x141] + dVar30;
          pdVar6[0x142] = pdVar6[0x142] - dVar30;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar23;
          pdVar6[0x1d8] = pdVar6[0x1d8] + dVar23;
          pdVar6[0x1db] = pdVar6[0x1db] + dVar23;
          pdVar6[0x1dc] = pdVar6[0x1dc] - dVar23;
          local_858._0_8_ = local_a48[9] * local_a48[0x12];
          dVar30 = exp(local_848 * 1.74 + dVar31 * -5258.6141576593245);
          local_8c8._0_8_ = dVar30 * 6.14;
          local_868 = dVar31 * 1.74 + local_998 * 5258.6141576593245;
          dStack_860 = 0.0;
          local_878._0_8_ = local_a48[10] * local_a48[0x11];
          dVar30 = exp(((double)local_7e8._0_8_ - local_578) + local_558);
          dVar30 = (double)local_8c8._0_8_ / dVar30;
          dVar24 = (double)local_8c8._0_8_ * (double)local_858._0_8_ -
                   (double)local_878._0_8_ * dVar30;
          local_988[9] = local_988[9] - dVar24;
          local_988[10] = local_988[10] + dVar24;
          local_988[0x12] = local_988[0x12] - dVar24;
          local_988[0x11] = dVar24 + local_988[0x11];
          dVar24 = local_a48[0x12] * (double)local_8c8._0_8_;
          pdVar6[0xcf] = pdVar6[0xcf] - dVar24;
          pdVar6[0xd0] = pdVar6[0xd0] + dVar24;
          pdVar6[0xd7] = dVar24 + pdVar6[0xd7];
          pdVar6[0xd8] = pdVar6[0xd8] - dVar24;
          dVar24 = local_a48[0x11] * -dVar30;
          pdVar6[0xe5] = pdVar6[0xe5] - dVar24;
          pdVar6[0xe6] = pdVar6[0xe6] + dVar24;
          pdVar6[0xed] = pdVar6[0xed] + dVar24;
          pdVar6[0xee] = pdVar6[0xee] - dVar24;
          dVar24 = -dVar30 * local_a48[10];
          pdVar6[0x17f] = pdVar6[0x17f] - dVar24;
          pdVar6[0x180] = pdVar6[0x180] + dVar24;
          pdVar6[0x187] = pdVar6[0x187] + dVar24;
          pdVar6[0x188] = pdVar6[0x188] - dVar24;
          dVar24 = (double)local_8c8._0_8_ * local_a48[9];
          dVar30 = local_868 * (double)local_8c8._0_8_ * (double)local_858._0_8_ -
                   (local_868 - ((local_768 + dStack_730) - (dStack_770 + local_728)) * dVar31) *
                   dVar30 * (double)local_878._0_8_;
          pdVar6[0x195] = pdVar6[0x195] - dVar24;
          pdVar6[0x196] = pdVar6[0x196] + dVar24;
          pdVar6[0x19d] = pdVar6[0x19d] + dVar24;
          pdVar6[0x19e] = pdVar6[0x19e] - dVar24;
          pdVar6[0x1d7] = pdVar6[0x1d7] - dVar30;
          pdVar6[0x1d8] = pdVar6[0x1d8] + dVar30;
          pdVar6[0x1df] = pdVar6[0x1df] + dVar30;
          pdVar6[0x1e0] = pdVar6[0x1e0] - dVar30;
          local_858._0_8_ = local_a48[3] * local_a48[0xd];
          local_868 = exp(dVar31 * -201.28666632188802 + local_8a8);
          local_868 = local_868 * 7600000.0;
          local_878._0_8_ = local_a48[6] * local_a48[0xb];
          local_7e8._8_4_ = (int)uStack_990;
          local_7e8._0_8_ = local_998 * 201.28666632188802 + (double)local_8b8._0_8_;
          local_7e8._12_4_ = (int)((ulong)uStack_990 >> 0x20);
          dVar30 = exp((dVar27 - (double)local_818._0_8_) + (double)local_7c8._0_8_);
          dVar30 = local_868 / dVar30;
          dVar24 = local_868 * (double)local_858._0_8_ - (double)local_878._0_8_ * dVar30;
          local_988[3] = local_988[3] - dVar24;
          local_988[6] = local_988[6] + dVar24;
          local_988[0xd] = local_988[0xd] - dVar24;
          local_988[0xb] = dVar24 + local_988[0xb];
          dVar24 = local_a48[0xd] * local_868;
          pdVar6[0x45] = pdVar6[0x45] - dVar24;
          pdVar6[0x48] = pdVar6[0x48] + dVar24;
          pdVar6[0x4d] = dVar24 + pdVar6[0x4d];
          pdVar6[0x4f] = pdVar6[0x4f] - dVar24;
          dVar24 = local_a48[0xb] * -dVar30;
          pdVar6[0x87] = pdVar6[0x87] - dVar24;
          pdVar6[0x8a] = pdVar6[0x8a] + dVar24;
          pdVar6[0x8f] = pdVar6[0x8f] + dVar24;
          pdVar6[0x91] = pdVar6[0x91] - dVar24;
          dVar24 = -dVar30 * local_a48[6];
          pdVar6[0xf5] = pdVar6[0xf5] - dVar24;
          pdVar6[0xf8] = pdVar6[0xf8] + dVar24;
          pdVar6[0xfd] = pdVar6[0xfd] + dVar24;
          pdVar6[0xff] = pdVar6[0xff] - dVar24;
          dVar24 = local_868 * local_a48[3];
          dVar30 = (double)local_7e8._0_8_ * local_868 * (double)local_858._0_8_ -
                   ((double)local_7e8._0_8_ -
                   ((local_788 + dStack_760) - (dStack_7a0 + dStack_750)) * dVar31) * dVar30 *
                   (double)local_878._0_8_;
          pdVar6[0x121] = pdVar6[0x121] - dVar24;
          pdVar6[0x124] = pdVar6[0x124] + dVar24;
          pdVar6[0x129] = pdVar6[0x129] + dVar24;
          pdVar6[299] = pdVar6[299] - dVar24;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar30;
          pdVar6[0x1d4] = pdVar6[0x1d4] + dVar30;
          pdVar6[0x1d9] = pdVar6[0x1d9] + dVar30;
          pdVar6[0x1db] = pdVar6[0x1db] - dVar30;
          local_858._0_8_ = local_a48[3] * local_a48[0xf];
          dVar30 = exp(local_848 * 7.6 + dVar31 * 1776.3548302906618);
          local_7e8._0_8_ = dVar30 * 4.28e-19;
          local_848 = local_a48[6] * local_a48[0xe];
          local_878._8_8_ = 0;
          local_878._0_8_ = dVar31 * 7.6 + local_998 * -1776.3548302906618;
          dVar30 = exp((dVar27 - local_688) + local_5b8);
          dVar30 = (double)local_7e8._0_8_ / dVar30;
          dVar24 = (double)local_7e8._0_8_ * (double)local_858._0_8_ - local_848 * dVar30;
          local_988[3] = local_988[3] - dVar24;
          local_988[6] = local_988[6] + dVar24;
          local_988[0xf] = local_988[0xf] - dVar24;
          local_988[0xe] = dVar24 + local_988[0xe];
          dVar24 = local_a48[0xf] * (double)local_7e8._0_8_;
          pdVar6[0x45] = pdVar6[0x45] - dVar24;
          pdVar6[0x48] = pdVar6[0x48] + dVar24;
          pdVar6[0x50] = dVar24 + pdVar6[0x50];
          pdVar6[0x51] = pdVar6[0x51] - dVar24;
          dVar24 = local_a48[0xe] * -dVar30;
          pdVar6[0x87] = pdVar6[0x87] - dVar24;
          pdVar6[0x8a] = pdVar6[0x8a] + dVar24;
          pdVar6[0x92] = pdVar6[0x92] + dVar24;
          pdVar6[0x93] = pdVar6[0x93] - dVar24;
          dVar24 = -dVar30 * local_a48[6];
          pdVar6[0x137] = pdVar6[0x137] - dVar24;
          pdVar6[0x13a] = pdVar6[0x13a] + dVar24;
          pdVar6[0x142] = pdVar6[0x142] + dVar24;
          pdVar6[0x143] = pdVar6[0x143] - dVar24;
          dVar24 = (double)local_7e8._0_8_ * local_a48[3];
          dVar30 = (double)local_878._0_8_ * (double)local_7e8._0_8_ * (double)local_858._0_8_ -
                   ((double)local_878._0_8_ -
                   ((local_788 + local_748) - (dStack_7a0 + dStack_740)) * dVar31) * dVar30 *
                   local_848;
          pdVar6[0x14d] = pdVar6[0x14d] - dVar24;
          pdVar6[0x150] = pdVar6[0x150] + dVar24;
          pdVar6[0x158] = pdVar6[0x158] + dVar24;
          pdVar6[0x159] = pdVar6[0x159] - dVar24;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar30;
          pdVar6[0x1d4] = pdVar6[0x1d4] + dVar30;
          pdVar6[0x1dc] = pdVar6[0x1dc] + dVar30;
          pdVar6[0x1dd] = pdVar6[0x1dd] - dVar30;
          local_848 = local_a48[3] * local_a48[0x11];
          dVar30 = exp(dVar31 * -1949.96457999329 + local_8a8);
          local_878._0_8_ = dVar30;
          local_858._0_8_ = local_a48[6] * local_a48[0x10];
          dVar30 = exp((dVar27 - local_548) + local_578);
          dVar23 = (double)local_878._0_8_ * 840000.0;
          dVar25 = local_998 * 1949.96457999329 + (double)local_8b8._0_8_;
          dVar30 = dVar23 / dVar30;
          dVar24 = dVar23 * local_848 - (double)local_858._0_8_ * dVar30;
          local_988[3] = local_988[3] - dVar24;
          local_988[6] = local_988[6] + dVar24;
          local_988[0x10] = dVar24 + local_988[0x10];
          local_988[0x11] = local_988[0x11] - dVar24;
          dVar24 = local_a48[0x11] * dVar23;
          pdVar6[0x45] = pdVar6[0x45] - dVar24;
          pdVar6[0x48] = pdVar6[0x48] + dVar24;
          pdVar6[0x52] = dVar24 + pdVar6[0x52];
          pdVar6[0x53] = pdVar6[0x53] - dVar24;
          dVar24 = local_a48[0x10] * -dVar30;
          pdVar6[0x87] = pdVar6[0x87] - dVar24;
          pdVar6[0x8a] = pdVar6[0x8a] + dVar24;
          pdVar6[0x94] = pdVar6[0x94] + dVar24;
          pdVar6[0x95] = pdVar6[0x95] - dVar24;
          dVar24 = -dVar30 * local_a48[6];
          dVar30 = dVar25 * dVar23 * local_848 -
                   (dVar25 - ((local_788 + local_738) - (dStack_7a0 + dStack_730)) * dVar31) *
                   dVar30 * (double)local_858._0_8_;
          pdVar6[0x163] = pdVar6[0x163] - dVar24;
          pdVar6[0x166] = pdVar6[0x166] + dVar24;
          pdVar6[0x170] = pdVar6[0x170] + dVar24;
          pdVar6[0x171] = pdVar6[0x171] - dVar24;
          dVar23 = dVar23 * local_a48[3];
          pdVar6[0x179] = pdVar6[0x179] - dVar23;
          pdVar6[0x17c] = pdVar6[0x17c] + dVar23;
          pdVar6[0x186] = pdVar6[0x186] + dVar23;
          pdVar6[0x187] = pdVar6[0x187] - dVar23;
          pdVar6[0x1d1] = pdVar6[0x1d1] - dVar30;
          pdVar6[0x1d4] = pdVar6[0x1d4] + dVar30;
          pdVar6[0x1de] = pdVar6[0x1de] + dVar30;
          pdVar6[0x1df] = pdVar6[0x1df] - dVar30;
          if (local_51c == 2) {
            if (1000.0 <= local_6d8) {
              local_438[0] = local_518 * 2.00255376e-14 +
                             local_308 * -1.79566394e-10 +
                             local_318 * 4.99456778e-07 + local_6d8 * -4.94024731e-05 + 3.3372792;
              local_438[1] = local_518 * 4.98197357e-22 +
                             local_308 * -4.73515235e-18 +
                             local_318 * 1.61561948e-14 + local_6d8 * -2.30842973e-11 + 2.50000001;
              local_438[2] = local_518 * 1.22833691e-15 +
                             local_308 * -1.00177799e-11 +
                             local_318 * 4.19484589e-08 + local_6d8 * -8.59741137e-05 + 2.56942078;
              local_438[3] = local_518 * -2.16717794e-14 +
                             local_308 * 2.09470555e-10 +
                             local_318 * -7.57966669e-07 + local_6d8 * 0.00148308754 + 3.28253784;
              local_438[4] = local_518 * 1.17412376e-14 +
                             local_308 * -8.79461556e-11 +
                             local_318 * 1.26505228e-07 + local_6d8 * 0.000548429716 + 3.09288767;
              local_438[5] = local_518 * 1.68200992e-14 +
                             local_308 * -9.7041987e-11 +
                             local_318 * -1.64072518e-07 + local_6d8 * 0.00217691804 + 3.03399249;
              local_438[6] = local_518 * -1.07908535e-14 +
                             local_308 * 1.1424637e-10 +
                             local_318 * -6.3365815e-07 + local_6d8 * 0.00223982013 + 4.0172109;
              local_438[7] = local_518 * -1.87727567e-14 +
                             local_308 * 2.60179549e-10 +
                             local_318 * -1.40894597e-06 + local_6d8 * 0.00365639292 + 2.87410113;
              local_438[8] = local_518 * -3.39716365e-14 +
                             local_308 * 4.17906e-10 +
                             local_318 * -2.01191947e-06 + local_6d8 * 0.00465588637 + 2.29203842;
              local_438[9] = local_518 * -4.67154394e-14 +
                             local_308 * 5.95684644e-10 +
                             local_318 * -2.98714348e-06 + local_6d8 * 0.00723990037 + 2.28571772;
              local_438[10] =
                   local_518 * -1.0181523e-13 +
                   local_308 * 1.22292535e-09 +
                   local_318 * -5.73285809e-06 + local_6d8 * 0.0133909467 + 0.074851495;
              local_438[0xb] =
                   local_518 * -2.03647716e-14 +
                   local_308 * 2.30053008e-10 +
                   local_318 * -9.98825771e-07 + local_6d8 * 0.00206252743 + 2.71518561;
              local_438[0xc] =
                   local_518 * -4.72084164e-14 +
                   local_308 * 5.23490188e-10 +
                   local_318 * -2.21481404e-06 + local_6d8 * 0.00441437026 + 3.85746029;
              local_438[0xd] =
                   local_518 * -5.33508711e-14 +
                   local_308 * 5.89161778e-10 +
                   local_318 * -2.48445613e-06 + local_6d8 * 0.00495695526 + 2.77217438;
              local_438[0xe] =
                   local_518 * -8.8385564e-14 +
                   local_308 * 1.00641212e-09 +
                   local_318 * -4.42258813e-06 + local_6d8 * 0.00920000082 + 1.76069008;
              local_438[0xf] =
                   local_518 * -2.112616e-14 +
                   local_308 * 3.944431e-10 +
                   local_318 * -2.656384e-06 + local_6d8 * 0.007871497 + 3.770799;
              local_438[0x10] =
                   local_518 * -1.25706061e-13 +
                   local_308 * 1.47222923e-09 +
                   local_318 * -6.71077915e-06 + local_6d8 * 0.0146454151 + 2.03611116;
              local_438[0x11] =
                   local_518 * -1.49641576e-13 +
                   local_308 * 1.75217689e-09 +
                   local_318 * -7.98206668e-06 + local_6d8 * 0.0173972722 + 1.95465642;
              dVar23 = local_308 * 2.21412001e-09 +
                       local_318 * -1.00256067e-05 + local_6d8 * 0.0216852677 + 1.0718815;
              dVar25 = local_308 * 1.0097038e-10 +
                       local_318 * -5.68476e-07 + local_6d8 * 0.0014879768 + 2.92664;
              dVar30 = -1.9000289e-13;
              dVar24 = -6.753351e-15;
            }
            else {
              local_438[0] = local_518 * -7.37611761e-12 +
                             local_308 * 2.01572094e-08 +
                             local_318 * -1.9478151e-05 + local_6d8 * 0.00798052075 + 2.34433112;
              local_438[1] = local_518 * -9.27732332e-22 +
                             local_308 * 2.30081632e-18 +
                             local_318 * -1.99591964e-15 + local_6d8 * 7.05332819e-13 + 2.5;
              local_438[2] = local_518 * 2.11265971e-12 +
                             local_308 * -6.12806624e-09 +
                             local_318 * 6.64306396e-06 + local_6d8 * -0.00327931884 + 3.1682671;
              local_438[3] = local_518 * 3.24372837e-12 +
                             local_308 * -9.68129509e-09 +
                             local_318 * 9.84730201e-06 + local_6d8 * -0.00299673416 + 3.78245636;
              local_438[4] = local_518 * 1.3641147e-12 +
                             local_308 * -3.88113333e-09 +
                             local_318 * 4.61793841e-06 + local_6d8 * -0.00240131752 + 3.99201543;
              local_438[5] = local_518 * 1.77197817e-12 +
                             local_308 * -5.48797062e-09 +
                             local_318 * 6.52040211e-06 + local_6d8 * -0.0020364341 + 4.19864056;
              local_438[6] = local_518 * 9.29225124e-12 +
                             local_308 * -2.42763894e-08 +
                             local_318 * 2.11582891e-05 + local_6d8 * -0.00474912051 + 4.30179801;
              local_438[7] = local_518 * 1.68741719e-12 +
                             local_308 * -3.85091153e-09 +
                             local_318 * 2.79489841e-06 + local_6d8 * 0.000968872143 + 3.76267867;
              local_438[8] = local_518 * 1.94314737e-12 +
                             local_308 * -6.68815981e-09 +
                             local_318 * 8.2329622e-06 + local_6d8 * -0.00236661419 + 4.19860411;
              local_438[9] = local_518 * 2.54385734e-12 +
                             local_308 * -6.87117425e-09 +
                             local_318 * 5.73021856e-06 + local_6d8 * 0.00201095175 + 3.6735904;
              local_438[10] =
                   local_518 * 1.66693956e-11 +
                   local_308 * -4.84743026e-08 +
                   local_318 * 4.91800599e-05 + local_6d8 * -0.0136709788 + 5.14987613;
              local_438[0xb] =
                   local_518 * -9.04424499e-13 +
                   local_308 * 9.07005884e-10 +
                   local_318 * 1.01681433e-06 + local_6d8 * -0.00061035368 + 3.57953347;
              local_438[0xc] =
                   local_518 * -1.43699548e-13 +
                   local_308 * 2.45919022e-09 +
                   local_318 * -7.12356269e-06 + local_6d8 * 0.00898459677 + 2.35677352;
              local_438[0xd] =
                   local_518 * 4.33768865e-12 +
                   local_308 * -1.33144093e-08 +
                   local_318 * 1.37799446e-05 + local_6d8 * -0.00324392532 + 4.22118584;
              local_438[0xe] =
                   local_518 * 1.31772652e-11 +
                   local_308 * -3.79285261e-08 +
                   local_318 * 3.73220008e-05 + local_6d8 * -0.00990833369 + 4.79372315;
              local_438[0xf] =
                   local_518 * 2.07561e-12 +
                   local_308 * -7.377636e-09 +
                   local_318 * 5.338472e-06 + local_6d8 * 0.007216595 + 2.106204;
              local_438[0x10] =
                   local_518 * 2.69884373e-11 +
                   local_308 * -6.91588753e-08 +
                   local_318 * 5.70990292e-05 + local_6d8 * -0.00757052247 + 3.95920148;
              local_438[0x11] =
                   local_518 * 2.30509004e-11 +
                   local_308 * -5.99126606e-08 +
                   local_318 * 4.97142807e-05 + local_6d8 * -0.00418658892 + 4.30646568;
              dVar23 = local_308 * -7.08466285e-08 +
                       local_318 * 5.99438288e-05 + local_6d8 * -0.0055015427 + 4.29142492;
              dVar25 = local_308 * 5.641515e-09 +
                       local_318 * -3.963222e-06 + local_6d8 * 0.0014082404 + 3.298677;
              dVar30 = 2.68685771e-11;
              dVar24 = -2.444854e-12;
            }
            local_438[0x12] = local_518 * dVar30 + dVar23;
            local_438[0x13] = local_518 * dVar24 + dVar25;
            local_438[0x14] = local_358 + (double)local_338._0_8_ + 2.5 + local_348 + local_328;
            if (1000.0 <= local_6d8) {
              local_4e8[0] = local_308 * 8.01021504e-14 +
                             local_318 * -5.38699182e-10 +
                             local_6d8 * 9.98913556e-07 + -4.94024731e-05;
              local_4e8[1] = local_308 * 1.99278943e-21 +
                             local_318 * -1.42054571e-17 +
                             local_6d8 * 3.23123896e-14 + -2.30842973e-11;
              local_4e8[2] = local_308 * 4.91334764e-15 +
                             local_318 * -3.00533397e-11 +
                             local_6d8 * 8.38969178e-08 + -8.59741137e-05;
              local_4e8[3] = local_308 * -8.66871176e-14 +
                             local_318 * 6.28411665e-10 +
                             local_6d8 * -1.51593334e-06 + 0.00148308754;
              local_4e8[4] = local_308 * 4.69649504e-14 +
                             local_318 * -2.63838467e-10 +
                             local_6d8 * 2.53010456e-07 + 0.000548429716;
              local_4e8[5] = local_308 * 6.72803968e-14 +
                             local_318 * -2.91125961e-10 +
                             local_6d8 * -3.28145036e-07 + 0.00217691804;
              local_4e8[6] = local_308 * -4.3163414e-14 +
                             local_318 * 3.4273911e-10 + local_6d8 * -1.2673163e-06 + 0.00223982013;
              local_4e8[7] = local_308 * -7.50910268e-14 +
                             local_318 * 7.80538647e-10 +
                             local_6d8 * -2.81789194e-06 + 0.00365639292;
              local_4e8[8] = local_308 * -1.35886546e-13 +
                             local_318 * 1.253718e-09 + local_6d8 * -4.02383894e-06 + 0.00465588637;
              local_4e8[9] = local_308 * -1.86861758e-13 +
                             local_318 * 1.78705393e-09 +
                             local_6d8 * -5.97428696e-06 + 0.00723990037;
              local_4e8[10] =
                   local_308 * -4.0726092e-13 +
                   local_318 * 3.66877605e-09 + local_6d8 * -1.14657162e-05 + 0.0133909467;
              local_4e8[0xb] =
                   local_308 * -8.14590864e-14 +
                   local_318 * 6.90159024e-10 + local_6d8 * -1.99765154e-06 + 0.00206252743;
              local_4e8[0xc] =
                   local_308 * -1.88833666e-13 +
                   local_318 * 1.57047056e-09 + local_6d8 * -4.42962808e-06 + 0.00441437026;
              local_4e8[0xd] =
                   local_308 * -2.13403484e-13 +
                   local_318 * 1.76748533e-09 + local_6d8 * -4.96891226e-06 + 0.00495695526;
              local_4e8[0xe] =
                   local_308 * -3.53542256e-13 +
                   local_318 * 3.01923636e-09 + local_6d8 * -8.84517626e-06 + 0.00920000082;
              local_4e8[0xf] =
                   local_308 * -8.450464e-14 +
                   local_318 * 1.1833293e-09 + local_6d8 * -5.312768e-06 + 0.007871497;
              local_4e8[0x10] =
                   local_308 * -5.02824244e-13 +
                   local_318 * 4.41668769e-09 + local_6d8 * -1.34215583e-05 + 0.0146454151;
              local_4e8[0x11] =
                   local_308 * -5.98566304e-13 +
                   local_318 * 5.25653067e-09 + local_6d8 * -1.59641334e-05 + 0.0173972722;
              dVar23 = local_318 * 6.64236003e-09 + local_6d8 * -2.00512134e-05 + 0.0216852677;
              dVar25 = local_318 * 3.0291114e-10 + local_6d8 * -1.136952e-06 + 0.0014879768;
              dVar30 = -7.6001156e-13;
              dVar24 = -2.7013404e-14;
            }
            else {
              local_4e8[0] = local_308 * -2.95044704e-11 +
                             local_318 * 6.04716282e-08 + local_6d8 * -3.8956302e-05 + 0.00798052075
              ;
              local_4e8[1] = local_308 * -3.71092933e-21 +
                             local_318 * 6.90244896e-18 +
                             local_6d8 * -3.99183928e-15 + 7.05332819e-13;
              local_4e8[2] = local_308 * 8.45063884e-12 +
                             local_318 * -1.83841987e-08 +
                             local_6d8 * 1.32861279e-05 + -0.00327931884;
              local_4e8[3] = local_308 * 1.29749135e-11 +
                             local_318 * -2.90438853e-08 +
                             local_6d8 * 1.9694604e-05 + -0.00299673416;
              local_4e8[4] = local_308 * 5.4564588e-12 +
                             local_318 * -1.16434e-08 + local_6d8 * 9.23587682e-06 + -0.00240131752;
              local_4e8[5] = local_308 * 7.08791268e-12 +
                             local_318 * -1.64639119e-08 +
                             local_6d8 * 1.30408042e-05 + -0.0020364341;
              local_4e8[6] = local_308 * 3.7169005e-11 +
                             local_318 * -7.28291682e-08 +
                             local_6d8 * 4.23165782e-05 + -0.00474912051;
              local_4e8[7] = local_308 * 6.74966876e-12 +
                             local_318 * -1.15527346e-08 +
                             local_6d8 * 5.58979682e-06 + 0.000968872143;
              local_4e8[8] = local_308 * 7.77258948e-12 +
                             local_318 * -2.00644794e-08 +
                             local_6d8 * 1.64659244e-05 + -0.00236661419;
              local_4e8[9] = local_308 * 1.01754294e-11 +
                             local_318 * -2.06135228e-08 +
                             local_6d8 * 1.14604371e-05 + 0.00201095175;
              local_4e8[10] =
                   local_308 * 6.66775824e-11 +
                   local_318 * -1.45422908e-07 + local_6d8 * 9.83601198e-05 + -0.0136709788;
              local_4e8[0xb] =
                   local_308 * -3.617698e-12 +
                   local_318 * 2.72101765e-09 + local_6d8 * 2.03362866e-06 + -0.00061035368;
              local_4e8[0xc] =
                   local_308 * -5.74798192e-13 +
                   local_318 * 7.37757066e-09 + local_6d8 * -1.42471254e-05 + 0.00898459677;
              local_4e8[0xd] =
                   local_308 * 1.73507546e-11 +
                   local_318 * -3.99432279e-08 + local_6d8 * 2.75598892e-05 + -0.00324392532;
              local_4e8[0xe] =
                   local_308 * 5.27090608e-11 +
                   local_318 * -1.13785578e-07 + local_6d8 * 7.46440016e-05 + -0.00990833369;
              local_4e8[0xf] =
                   local_308 * 8.30244e-12 +
                   local_318 * -2.2132908e-08 + local_6d8 * 1.0676944e-05 + 0.007216595;
              local_4e8[0x10] =
                   local_308 * 1.07953749e-10 +
                   local_318 * -2.07476626e-07 + local_6d8 * 0.000114198058 + -0.00757052247;
              local_4e8[0x11] =
                   local_308 * 9.22036016e-11 +
                   local_318 * -1.79737982e-07 + local_6d8 * 9.94285614e-05 + -0.00418658892;
              dVar23 = local_318 * -2.12539886e-07 + local_6d8 * 0.000119887658 + -0.0055015427;
              dVar25 = local_318 * 1.6924545e-08 + local_6d8 * -7.926444e-06 + 0.0014082404;
              dVar30 = 1.07474308e-10;
              dVar24 = -9.779416e-12;
            }
            local_4e8[0x12] = local_308 * dVar30 + dVar23;
            local_4e8[0x13] = local_308 * dVar24 + dVar25;
            local_4e8[0x14] = local_328 + local_348 + (double)local_338._0_8_ + 0.0;
            pdVar13 = &local_7b8;
          }
          else {
            if (1000.0 <= local_6d8) {
              local_438[0] = local_518 * 2.00255376e-14 +
                             local_308 * -1.79566394e-10 +
                             local_318 * 4.99456778e-07 + local_6d8 * -4.94024731e-05 + 2.3372792;
              local_438[1] = local_518 * 4.98197357e-22 +
                             local_308 * -4.73515235e-18 +
                             local_318 * 1.61561948e-14 + local_6d8 * -2.30842973e-11 + 1.50000001;
              local_438[2] = local_518 * 1.22833691e-15 +
                             local_308 * -1.00177799e-11 +
                             local_318 * 4.19484589e-08 + local_6d8 * -8.59741137e-05 + 1.56942078;
              local_438[3] = local_518 * -2.16717794e-14 +
                             local_308 * 2.09470555e-10 +
                             local_318 * -7.57966669e-07 + local_6d8 * 0.00148308754 + 2.28253784;
              local_438[4] = local_518 * 1.17412376e-14 +
                             local_308 * -8.79461556e-11 +
                             local_318 * 1.26505228e-07 + local_6d8 * 0.000548429716 + 2.09288767;
              local_438[5] = local_518 * 1.68200992e-14 +
                             local_308 * -9.7041987e-11 +
                             local_318 * -1.64072518e-07 + local_6d8 * 0.00217691804 + 2.03399249;
              local_438[6] = local_518 * -1.07908535e-14 +
                             local_308 * 1.1424637e-10 +
                             local_318 * -6.3365815e-07 + local_6d8 * 0.00223982013 + 3.0172109;
              local_438[7] = local_518 * -1.87727567e-14 +
                             local_308 * 2.60179549e-10 +
                             local_318 * -1.40894597e-06 + local_6d8 * 0.00365639292 + 1.87410113;
              local_438[8] = local_518 * -3.39716365e-14 +
                             local_308 * 4.17906e-10 +
                             local_318 * -2.01191947e-06 + local_6d8 * 0.00465588637 + 1.29203842;
              local_438[9] = local_518 * -4.67154394e-14 +
                             local_308 * 5.95684644e-10 +
                             local_318 * -2.98714348e-06 + local_6d8 * 0.00723990037 + 1.28571772;
              local_438[10] =
                   local_518 * -1.0181523e-13 +
                   local_308 * 1.22292535e-09 +
                   local_318 * -5.73285809e-06 + local_6d8 * 0.0133909467 + -0.925148505;
              local_438[0xb] =
                   local_518 * -2.03647716e-14 +
                   local_308 * 2.30053008e-10 +
                   local_318 * -9.98825771e-07 + local_6d8 * 0.00206252743 + 1.71518561;
              local_438[0xc] =
                   local_518 * -4.72084164e-14 +
                   local_308 * 5.23490188e-10 +
                   local_318 * -2.21481404e-06 + local_6d8 * 0.00441437026 + 2.85746029;
              local_438[0xd] =
                   local_518 * -5.33508711e-14 +
                   local_308 * 5.89161778e-10 +
                   local_318 * -2.48445613e-06 + local_6d8 * 0.00495695526 + 1.77217438;
              local_438[0xe] =
                   local_518 * -8.8385564e-14 +
                   local_308 * 1.00641212e-09 +
                   local_318 * -4.42258813e-06 + local_6d8 * 0.00920000082 + 0.76069008;
              local_438[0xf] =
                   local_518 * -2.112616e-14 +
                   local_308 * 3.944431e-10 +
                   local_318 * -2.656384e-06 + local_6d8 * 0.007871497 + 2.770799;
              local_438[0x10] =
                   local_518 * -1.25706061e-13 +
                   local_308 * 1.47222923e-09 +
                   local_318 * -6.71077915e-06 + local_6d8 * 0.0146454151 + 1.03611116;
              local_438[0x11] =
                   local_518 * -1.49641576e-13 +
                   local_308 * 1.75217689e-09 +
                   local_318 * -7.98206668e-06 + local_6d8 * 0.0173972722 + 0.95465642;
              dVar23 = local_308 * 2.21412001e-09 +
                       local_318 * -1.00256067e-05 + local_6d8 * 0.0216852677 + 0.0718815;
              dVar25 = local_308 * 1.0097038e-10 +
                       local_318 * -5.68476e-07 + local_6d8 * 0.0014879768 + 1.92664;
              dVar30 = -1.9000289e-13;
              dVar24 = -6.753351e-15;
            }
            else {
              local_438[0] = local_518 * -7.37611761e-12 +
                             local_308 * 2.01572094e-08 +
                             local_318 * -1.9478151e-05 + local_6d8 * 0.00798052075 + 1.34433112;
              local_438[1] = local_518 * -9.27732332e-22 +
                             local_308 * 2.30081632e-18 +
                             local_318 * -1.99591964e-15 + local_6d8 * 7.05332819e-13 + 1.5;
              local_438[2] = local_518 * 2.11265971e-12 +
                             local_308 * -6.12806624e-09 +
                             local_318 * 6.64306396e-06 + local_6d8 * -0.00327931884 + 2.1682671;
              local_438[3] = local_518 * 3.24372837e-12 +
                             local_308 * -9.68129509e-09 +
                             local_318 * 9.84730201e-06 + local_6d8 * -0.00299673416 + 2.78245636;
              local_438[4] = local_518 * 1.3641147e-12 +
                             local_308 * -3.88113333e-09 +
                             local_318 * 4.61793841e-06 + local_6d8 * -0.00240131752 + 2.99201543;
              local_438[5] = local_518 * 1.77197817e-12 +
                             local_308 * -5.48797062e-09 +
                             local_318 * 6.52040211e-06 + local_6d8 * -0.0020364341 + 3.19864056;
              local_438[6] = local_518 * 9.29225124e-12 +
                             local_308 * -2.42763894e-08 +
                             local_318 * 2.11582891e-05 + local_6d8 * -0.00474912051 + 3.30179801;
              local_438[7] = local_518 * 1.68741719e-12 +
                             local_308 * -3.85091153e-09 +
                             local_318 * 2.79489841e-06 + local_6d8 * 0.000968872143 + 2.76267867;
              local_438[8] = local_518 * 1.94314737e-12 +
                             local_308 * -6.68815981e-09 +
                             local_318 * 8.2329622e-06 + local_6d8 * -0.00236661419 + 3.19860411;
              local_438[9] = local_518 * 2.54385734e-12 +
                             local_308 * -6.87117425e-09 +
                             local_318 * 5.73021856e-06 + local_6d8 * 0.00201095175 + 2.6735904;
              local_438[10] =
                   local_518 * 1.66693956e-11 +
                   local_308 * -4.84743026e-08 +
                   local_318 * 4.91800599e-05 + local_6d8 * -0.0136709788 + 4.14987613;
              local_438[0xb] =
                   local_518 * -9.04424499e-13 +
                   local_308 * 9.07005884e-10 +
                   local_318 * 1.01681433e-06 + local_6d8 * -0.00061035368 + 2.57953347;
              local_438[0xc] =
                   local_518 * -1.43699548e-13 +
                   local_308 * 2.45919022e-09 +
                   local_318 * -7.12356269e-06 + local_6d8 * 0.00898459677 + 1.35677352;
              local_438[0xd] =
                   local_518 * 4.33768865e-12 +
                   local_308 * -1.33144093e-08 +
                   local_318 * 1.37799446e-05 + local_6d8 * -0.00324392532 + 3.22118584;
              local_438[0xe] =
                   local_518 * 1.31772652e-11 +
                   local_308 * -3.79285261e-08 +
                   local_318 * 3.73220008e-05 + local_6d8 * -0.00990833369 + 3.79372315;
              local_438[0xf] =
                   local_518 * 2.07561e-12 +
                   local_308 * -7.377636e-09 +
                   local_318 * 5.338472e-06 + local_6d8 * 0.007216595 + 1.106204;
              local_438[0x10] =
                   local_518 * 2.69884373e-11 +
                   local_308 * -6.91588753e-08 +
                   local_318 * 5.70990292e-05 + local_6d8 * -0.00757052247 + 2.95920148;
              local_438[0x11] =
                   local_518 * 2.30509004e-11 +
                   local_308 * -5.99126606e-08 +
                   local_318 * 4.97142807e-05 + local_6d8 * -0.00418658892 + 3.30646568;
              dVar23 = local_308 * -7.08466285e-08 +
                       local_318 * 5.99438288e-05 + local_6d8 * -0.0055015427 + 3.29142492;
              dVar25 = local_308 * 5.641515e-09 +
                       local_318 * -3.963222e-06 + local_6d8 * 0.0014082404 + 2.298677;
              dVar30 = 2.68685771e-11;
              dVar24 = -2.444854e-12;
            }
            local_438[0x12] = local_518 * dVar30 + dVar23;
            local_438[0x13] = local_518 * dVar24 + dVar25;
            local_438[0x14] = (double)local_338._0_8_ + 1.5 + local_348 + local_328 + local_358;
            if (1000.0 <= local_6d8) {
              local_4e8[0] = local_308 * 8.01021504e-14 +
                             local_318 * -5.38699182e-10 +
                             local_6d8 * 9.98913556e-07 + -4.94024731e-05;
              local_4e8[1] = local_308 * 1.99278943e-21 +
                             local_318 * -1.42054571e-17 +
                             local_6d8 * 3.23123896e-14 + -2.30842973e-11;
              local_4e8[2] = local_308 * 4.91334764e-15 +
                             local_318 * -3.00533397e-11 +
                             local_6d8 * 8.38969178e-08 + -8.59741137e-05;
              local_4e8[3] = local_308 * -8.66871176e-14 +
                             local_318 * 6.28411665e-10 +
                             local_6d8 * -1.51593334e-06 + 0.00148308754;
              local_4e8[4] = local_308 * 4.69649504e-14 +
                             local_318 * -2.63838467e-10 +
                             local_6d8 * 2.53010456e-07 + 0.000548429716;
              local_4e8[5] = local_308 * 6.72803968e-14 +
                             local_318 * -2.91125961e-10 +
                             local_6d8 * -3.28145036e-07 + 0.00217691804;
              local_4e8[6] = local_308 * -4.3163414e-14 +
                             local_318 * 3.4273911e-10 + local_6d8 * -1.2673163e-06 + 0.00223982013;
              local_4e8[7] = local_308 * -7.50910268e-14 +
                             local_318 * 7.80538647e-10 +
                             local_6d8 * -2.81789194e-06 + 0.00365639292;
              local_4e8[8] = local_308 * -1.35886546e-13 +
                             local_318 * 1.253718e-09 + local_6d8 * -4.02383894e-06 + 0.00465588637;
              local_4e8[9] = local_308 * -1.86861758e-13 +
                             local_318 * 1.78705393e-09 +
                             local_6d8 * -5.97428696e-06 + 0.00723990037;
              local_4e8[10] =
                   local_308 * -4.0726092e-13 +
                   local_318 * 3.66877605e-09 + local_6d8 * -1.14657162e-05 + 0.0133909467;
              local_4e8[0xb] =
                   local_308 * -8.14590864e-14 +
                   local_318 * 6.90159024e-10 + local_6d8 * -1.99765154e-06 + 0.00206252743;
              local_4e8[0xc] =
                   local_308 * -1.88833666e-13 +
                   local_318 * 1.57047056e-09 + local_6d8 * -4.42962808e-06 + 0.00441437026;
              local_4e8[0xd] =
                   local_308 * -2.13403484e-13 +
                   local_318 * 1.76748533e-09 + local_6d8 * -4.96891226e-06 + 0.00495695526;
              local_4e8[0xe] =
                   local_308 * -3.53542256e-13 +
                   local_318 * 3.01923636e-09 + local_6d8 * -8.84517626e-06 + 0.00920000082;
              local_4e8[0xf] =
                   local_308 * -8.450464e-14 +
                   local_318 * 1.1833293e-09 + local_6d8 * -5.312768e-06 + 0.007871497;
              local_4e8[0x10] =
                   local_308 * -5.02824244e-13 +
                   local_318 * 4.41668769e-09 + local_6d8 * -1.34215583e-05 + 0.0146454151;
              local_4e8[0x11] =
                   local_308 * -5.98566304e-13 +
                   local_318 * 5.25653067e-09 + local_6d8 * -1.59641334e-05 + 0.0173972722;
              dVar23 = local_318 * 6.64236003e-09 + local_6d8 * -2.00512134e-05 + 0.0216852677;
              dVar25 = local_318 * 3.0291114e-10 + local_6d8 * -1.136952e-06 + 0.0014879768;
              dVar30 = -7.6001156e-13;
              dVar24 = -2.7013404e-14;
            }
            else {
              local_4e8[0] = local_308 * -2.95044704e-11 +
                             local_318 * 6.04716282e-08 + local_6d8 * -3.8956302e-05 + 0.00798052075
              ;
              local_4e8[1] = local_308 * -3.71092933e-21 +
                             local_318 * 6.90244896e-18 +
                             local_6d8 * -3.99183928e-15 + 7.05332819e-13;
              local_4e8[2] = local_308 * 8.45063884e-12 +
                             local_318 * -1.83841987e-08 +
                             local_6d8 * 1.32861279e-05 + -0.00327931884;
              local_4e8[3] = local_308 * 1.29749135e-11 +
                             local_318 * -2.90438853e-08 +
                             local_6d8 * 1.9694604e-05 + -0.00299673416;
              local_4e8[4] = local_308 * 5.4564588e-12 +
                             local_318 * -1.16434e-08 + local_6d8 * 9.23587682e-06 + -0.00240131752;
              local_4e8[5] = local_308 * 7.08791268e-12 +
                             local_318 * -1.64639119e-08 +
                             local_6d8 * 1.30408042e-05 + -0.0020364341;
              local_4e8[6] = local_308 * 3.7169005e-11 +
                             local_318 * -7.28291682e-08 +
                             local_6d8 * 4.23165782e-05 + -0.00474912051;
              local_4e8[7] = local_308 * 6.74966876e-12 +
                             local_318 * -1.15527346e-08 +
                             local_6d8 * 5.58979682e-06 + 0.000968872143;
              local_4e8[8] = local_308 * 7.77258948e-12 +
                             local_318 * -2.00644794e-08 +
                             local_6d8 * 1.64659244e-05 + -0.00236661419;
              local_4e8[9] = local_308 * 1.01754294e-11 +
                             local_318 * -2.06135228e-08 +
                             local_6d8 * 1.14604371e-05 + 0.00201095175;
              local_4e8[10] =
                   local_308 * 6.66775824e-11 +
                   local_318 * -1.45422908e-07 + local_6d8 * 9.83601198e-05 + -0.0136709788;
              local_4e8[0xb] =
                   local_308 * -3.617698e-12 +
                   local_318 * 2.72101765e-09 + local_6d8 * 2.03362866e-06 + -0.00061035368;
              local_4e8[0xc] =
                   local_308 * -5.74798192e-13 +
                   local_318 * 7.37757066e-09 + local_6d8 * -1.42471254e-05 + 0.00898459677;
              local_4e8[0xd] =
                   local_308 * 1.73507546e-11 +
                   local_318 * -3.99432279e-08 + local_6d8 * 2.75598892e-05 + -0.00324392532;
              local_4e8[0xe] =
                   local_308 * 5.27090608e-11 +
                   local_318 * -1.13785578e-07 + local_6d8 * 7.46440016e-05 + -0.00990833369;
              local_4e8[0xf] =
                   local_308 * 8.30244e-12 +
                   local_318 * -2.2132908e-08 + local_6d8 * 1.0676944e-05 + 0.007216595;
              local_4e8[0x10] =
                   local_308 * 1.07953749e-10 +
                   local_318 * -2.07476626e-07 + local_6d8 * 0.000114198058 + -0.00757052247;
              local_4e8[0x11] =
                   local_308 * 9.22036016e-11 +
                   local_318 * -1.79737982e-07 + local_6d8 * 9.94285614e-05 + -0.00418658892;
              dVar23 = local_318 * -2.12539886e-07 + local_6d8 * 0.000119887658 + -0.0055015427;
              dVar25 = local_318 * 1.6924545e-08 + local_6d8 * -7.926444e-06 + 0.0014082404;
              dVar30 = 1.07474308e-10;
              dVar24 = -9.779416e-12;
            }
            local_4e8[0x12] = local_308 * dVar30 + dVar23;
            local_4e8[0x13] = local_308 * dVar24 + dVar25;
            local_4e8[0x14] = (double)local_338._0_8_ + 0.0 + local_348 + local_328;
            if (1000.0 <= local_6d8) {
              local_2f8 = dVar31 * -950.158922 +
                          local_518 * 4.00510752e-15 +
                          local_308 * -4.48915985e-11 +
                          local_318 * 1.66485593e-07 + local_6d8 * -2.47012365e-05 + 2.3372792;
              dStack_2f0 = dVar31 * 25473.6599 +
                           local_518 * 9.96394714e-23 +
                           local_308 * -1.18378809e-18 +
                           local_318 * 5.38539827e-15 + local_6d8 * -1.15421486e-11 + 1.50000001;
              local_2e8 = dVar31 * 29217.5791 +
                          local_518 * 2.45667382e-16 +
                          local_308 * -2.50444497e-12 +
                          local_318 * 1.39828196e-08 + local_6d8 * -4.29870569e-05 + 1.56942078;
              dStack_2e0 = dVar31 * -1088.45772 +
                           local_518 * -4.33435588e-15 +
                           local_308 * 5.23676387e-11 +
                           local_318 * -2.52655556e-07 + local_6d8 * 0.00074154377 + 2.28253784;
              local_2d8 = dVar31 * 3858.657 +
                          local_518 * 2.34824752e-15 +
                          local_308 * -2.19865389e-11 +
                          local_318 * 4.21684093e-08 + local_6d8 * 0.000274214858 + 2.09288767;
              dStack_2d0 = dVar31 * -30004.2971 +
                           local_518 * 3.36401984e-15 +
                           local_308 * -2.42604967e-11 +
                           local_318 * -5.46908393e-08 + local_6d8 * 0.00108845902 + 2.03399249;
              local_2c8 = dVar31 * 111.856713 +
                          local_518 * -2.1581707e-15 +
                          local_308 * 2.85615925e-11 +
                          local_318 * -2.11219383e-07 + local_6d8 * 0.00111991006 + 3.0172109;
              dStack_2c0 = dVar31 * 46263.604 +
                           local_518 * -3.75455134e-15 +
                           local_308 * 6.50448872e-11 +
                           local_318 * -4.69648657e-07 + local_6d8 * 0.00182819646 + 1.87410113;
              local_2b8 = dVar31 * 50925.9997 +
                          local_518 * -6.7943273e-15 +
                          local_308 * 1.044765e-10 +
                          local_318 * -6.70639823e-07 + local_6d8 * 0.00232794318 + 1.29203842;
              dStack_2b0 = dVar31 * 16775.5843 +
                           local_518 * -9.34308788e-15 +
                           local_308 * 1.48921161e-10 +
                           local_318 * -9.95714493e-07 + local_6d8 * 0.00361995018 + 1.28571772;
              local_2a8 = dVar31 * -9468.34459 +
                          local_518 * -2.0363046e-14 +
                          local_308 * 3.05731338e-10 +
                          local_318 * -1.9109527e-06 + local_6d8 * 0.00669547335 + -0.925148505;
              dStack_2a0 = dVar31 * -14151.8724 +
                           local_518 * -4.07295432e-15 +
                           local_308 * 5.7513252e-11 +
                           local_318 * -3.32941924e-07 + local_6d8 * 0.00103126372 + 1.71518561;
              local_298 = dVar31 * -48759.166 +
                          local_518 * -9.44168328e-15 +
                          local_308 * 1.30872547e-10 +
                          local_318 * -7.38271347e-07 + local_6d8 * 0.00220718513 + 2.85746029;
              dStack_290 = dVar31 * 4011.91815 +
                           local_518 * -1.06701742e-14 +
                           local_308 * 1.47290445e-10 +
                           local_318 * -8.28152043e-07 + local_6d8 * 0.00247847763 + 1.77217438;
              local_288 = dVar31 * -13995.8323 +
                          local_518 * -1.76771128e-14 +
                          local_308 * 2.5160303e-10 +
                          local_318 * -1.47419604e-06 + local_6d8 * 0.00460000041 + 0.76069008;
              dStack_280 = dVar31 * 127.83252 +
                           local_518 * -4.225232e-15 +
                           local_308 * 9.8610775e-11 +
                           local_318 * -8.85461333e-07 + local_6d8 * 0.0039357485 + 2.770799;
              local_278 = dVar31 * 4939.88614 +
                          local_518 * -2.51412122e-14 +
                          local_308 * 3.68057308e-10 +
                          local_318 * -2.23692638e-06 + local_6d8 * 0.00732270755 + 1.03611116;
              dStack_270 = dVar31 * 12857.52 +
                           local_518 * -2.99283152e-14 +
                           local_308 * 4.38044223e-10 +
                           local_318 * -2.66068889e-06 + local_6d8 * 0.0086986361 + 0.95465642;
              dVar23 = local_518 * -3.8000578e-14 +
                       local_308 * 5.53530003e-10 +
                       local_318 * -3.3418689e-06 + local_6d8 * 0.0108426339 + 0.0718815;
              dVar25 = local_518 * -1.3506702e-15 +
                       local_308 * 2.5242595e-11 +
                       local_318 * -1.89492e-07 + local_6d8 * 0.0007439884 + 1.92664;
              dVar30 = -11426.3932;
              dVar24 = -922.7977;
            }
            else {
              local_2f8 = dVar31 * -917.935173 +
                          local_518 * -1.47522352e-12 +
                          local_308 * 5.03930235e-09 +
                          local_318 * -6.492717e-06 + local_6d8 * 0.00399026037 + 1.34433112;
              dStack_2f0 = dVar31 * 25473.6599 +
                           local_518 * -1.85546466e-22 +
                           local_308 * 5.7520408e-19 +
                           local_318 * -6.65306547e-16 + local_6d8 * 3.52666409e-13 + 1.5;
              local_2e8 = dVar31 * 29122.2592 +
                          local_518 * 4.22531942e-13 +
                          local_308 * -1.53201656e-09 +
                          local_318 * 2.21435465e-06 + local_6d8 * -0.00163965942 + 2.1682671;
              dStack_2e0 = dVar31 * -1063.94356 +
                           local_518 * 6.48745674e-13 +
                           local_308 * -2.42032377e-09 +
                           local_318 * 3.282434e-06 + local_6d8 * -0.00149836708 + 2.78245636;
              local_2d8 = dVar31 * 3615.08056 +
                          local_518 * 2.7282294e-13 +
                          local_308 * -9.70283332e-10 +
                          local_318 * 1.5393128e-06 + local_6d8 * -0.00120065876 + 2.99201543;
              dStack_2d0 = dVar31 * -30293.7267 +
                           local_518 * 3.54395634e-13 +
                           local_308 * -1.37199266e-09 +
                           local_318 * 2.17346737e-06 + local_6d8 * -0.00101821705 + 3.19864056;
              local_2c8 = dVar31 * 294.80804 +
                          local_518 * 1.85845025e-12 +
                          local_308 * -6.06909735e-09 +
                          local_318 * 7.05276303e-06 + local_6d8 * -0.00237456025 + 3.30179801;
              dStack_2c0 = dVar31 * 46004.0401 +
                           local_518 * 3.37483438e-13 +
                           local_308 * -9.62727883e-10 +
                           local_318 * 9.31632803e-07 + local_6d8 * 0.000484436072 + 2.76267867;
              local_2b8 = dVar31 * 50496.8163 +
                          local_518 * 3.88629474e-13 +
                          local_308 * -1.67203995e-09 +
                          local_318 * 2.74432073e-06 + local_6d8 * -0.0011833071 + 3.19860411;
              dStack_2b0 = dVar31 * 16444.9988 +
                           local_518 * 5.08771468e-13 +
                           local_308 * -1.71779356e-09 +
                           local_318 * 1.91007285e-06 + local_6d8 * 0.00100547588 + 2.6735904;
              local_2a8 = dVar31 * -10246.6476 +
                          local_518 * 3.33387912e-12 +
                          local_308 * -1.21185757e-08 +
                          local_318 * 1.63933533e-05 + local_6d8 * -0.0068354894 + 4.14987613;
              dStack_2a0 = dVar31 * -14344.086 +
                           local_518 * -1.808849e-13 +
                           local_308 * 2.26751471e-10 +
                           local_318 * 3.3893811e-07 + local_6d8 * -0.00030517684 + 2.57953347;
              local_298 = dVar31 * -48371.9697 +
                          local_518 * -2.87399096e-14 +
                          local_308 * 6.14797555e-10 +
                          local_318 * -2.3745209e-06 + local_6d8 * 0.00449229839 + 1.35677352;
              dStack_290 = dVar31 * 3839.56496 +
                           local_518 * 8.6753773e-13 +
                           local_308 * -3.32860233e-09 +
                           local_318 * 4.59331487e-06 + local_6d8 * -0.00162196266 + 3.22118584;
              local_288 = dVar31 * -14308.9567 +
                          local_518 * 2.63545304e-12 +
                          local_308 * -9.48213152e-09 +
                          local_318 * 1.24406669e-05 + local_6d8 * -0.00495416684 + 3.79372315;
              dStack_280 = dVar31 * 978.6011 +
                           local_518 * 4.15122e-13 +
                           local_308 * -1.844409e-09 +
                           local_318 * 1.77949067e-06 + local_6d8 * 0.0036082975 + 1.106204;
              local_278 = dVar31 * 5089.77593 +
                          local_518 * 5.39768746e-12 +
                          local_308 * -1.72897188e-08 +
                          local_318 * 1.90330097e-05 + local_6d8 * -0.00378526124 + 2.95920148;
              dStack_270 = dVar31 * 12841.6265 +
                           local_518 * 4.61018008e-12 +
                           local_308 * -1.49781651e-08 +
                           local_318 * 1.65714269e-05 + local_6d8 * -0.00209329446 + 3.30646568;
              dVar23 = local_518 * 5.37371542e-12 +
                       local_308 * -1.77116571e-08 +
                       local_318 * 1.99812763e-05 + local_6d8 * -0.00275077135 + 3.29142492;
              dVar25 = local_518 * -4.889708e-13 +
                       local_308 * 1.41037875e-09 +
                       local_318 * -1.321074e-06 + local_6d8 * 0.0007041202 + 2.298677;
              dVar30 = -11522.2055;
              dVar24 = -1020.8999;
            }
            local_268 = dVar31 * dVar30 + dVar23;
            dStack_260 = dVar31 * dVar24 + dVar25;
            local_258 = dVar31 * -745.375 +
                        local_358 + local_328 + local_348 + (double)local_338._0_8_ + 1.5;
            pdVar13 = &local_2f8;
          }
          dVar24 = 0.0;
          dVar23 = 0.0;
          dVar30 = 0.0;
          lVar10 = 0;
          dVar25 = 0.0;
          do {
            dVar25 = dVar25 + *(double *)((long)local_438 + lVar10) *
                              *(double *)((long)local_a48 + lVar10);
            dVar27 = *(double *)((long)pdVar13 + lVar10);
            dVar24 = dVar24 + *(double *)((long)local_a48 + lVar10) *
                              *(double *)((long)local_4e8 + lVar10);
            dVar23 = dVar23 + *(double *)((long)local_988 + lVar10) * dVar27;
            dVar30 = dVar30 + (*(double *)((long)local_438 + lVar10) - dVar27) * dVar31 *
                              *(double *)((long)local_988 + lVar10) +
                              dVar27 * *(double *)((long)pdVar6 + lVar10 + 0xe70);
            lVar10 = lVar10 + 8;
          } while (lVar10 != 0xa8);
          dVar23 = dVar23 * (1.0 / dVar25);
          dVar31 = (1.0 / dVar25) * local_6d8;
          dVar25 = dVar23 * dVar31;
          lVar10 = 0;
          pdVar12 = pdVar6;
          do {
            dVar27 = 0.0;
            lVar19 = 0;
            do {
              dVar27 = dVar27 + pdVar13[lVar19] * pdVar12[lVar19];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 0x15);
            pdVar6[lVar10 * 0x16 + 0x15] = local_438[lVar10] * dVar25 + dVar27 * -dVar31;
            lVar10 = lVar10 + 1;
            pdVar12 = pdVar12 + 0x16;
          } while (lVar10 != 0x15);
          pdVar6[0x1e3] = (dVar25 * dVar24 - dVar23) - dVar31 * dVar30;
          pdVar13 = pdVar6 + 0x15;
          lVar10 = 0;
          do {
            pdVar6[lVar10 + 0x1ce] = pdVar6[lVar10 + 0x1ce] * 1e-06;
            *pdVar13 = *pdVar13 * 1000000.0;
            lVar10 = lVar10 + 1;
            pdVar13 = pdVar13 + 0x16;
          } while (lVar10 != 0x15);
          pdVar6 = *(double **)(lVar4 + local_530 * 8);
          lVar10 = 0;
          pdVar13 = pdVar6;
          do {
            dVar30 = local_238[lVar10];
            lVar19 = 0;
            pdVar12 = pdVar13;
            do {
              *pdVar12 = (dVar30 / local_238[lVar19]) * *pdVar12;
              lVar19 = lVar19 + 1;
              pdVar12 = pdVar12 + 0x16;
            } while (lVar19 != 0x15);
            pdVar6[lVar10 * 0x16 + 0x15] = pdVar6[lVar10 * 0x16 + 0x15] / local_238[lVar10];
            lVar10 = lVar10 + 1;
            pdVar13 = pdVar13 + 1;
          } while (lVar10 != 0x15);
          lVar10 = *(long *)(lVar4 + local_530 * 8);
          lVar19 = 0;
          do {
            *(double *)(lVar10 + 0xe70 + lVar19 * 8) =
                 local_238[lVar19] * *(double *)(lVar10 + 0xe70 + lVar19 * 8);
            lVar19 = lVar19 + 1;
          } while (lVar19 != 0x15);
          local_998 = local_6d8;
          prVar16 = local_500;
        }
        uVar21 = local_530 + 1;
        local_528 = local_528 + 0x16;
      } while (uVar21 != uVar1);
    }
    iVar14 = 1;
    jcurPtr = local_508;
  }
  *jcurPtr = iVar14;
  lVar10 = *plVar5;
  lVar19 = 1;
  do {
    iVar14 = *(int *)(lVar10 + lVar19 * 4);
    iVar2 = *(int *)(lVar10 + -4 + lVar19 * 4);
    uVar20 = iVar14 - iVar2;
    if (uVar20 != 0 && iVar2 <= iVar14) {
      iVar14 = *(int *)(*plVar5 + -4 + lVar19 * 4);
      lVar15 = *local_368;
      uVar21 = 0;
      do {
        if (0 < (int)uVar1) {
          uVar3 = *(uint *)((long)iVar14 * 4 + lVar15 + uVar21 * 4);
          uVar17 = 0;
          do {
            lVar18 = *(long *)(lVar4 + uVar17 * 8);
            if (lVar19 - 1U == (ulong)uVar3) {
              dVar30 = *(double *)(lVar18 + (long)(int)uVar3 * 0xb8) * -local_388 + 1.0;
            }
            else {
              dVar30 = *(double *)(lVar18 + (lVar19 - 1U) * 8 + (long)(int)uVar3 * 0xb0) *
                       -local_388;
            }
            *(double *)
             (*(long *)(local_360 + uVar17 * 8) + uVar21 * 8 +
             (long)*(int *)(plVar5[uVar17] + -4 + lVar19 * 4) * 8) = dVar30;
            uVar17 = uVar17 + 1;
          } while (uVar1 != uVar17);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar20);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0x17);
  return 0;
}

Assistant:

int
Precond_custom(
  amrex::Real /* tn */,
  N_Vector u,
  N_Vector /* fu */,
  booleantype jok,
  booleantype* jcurPtr,
  amrex::Real gamma,
  void* user_data)
{
  BL_PROFILE("Pele::ReactorCvode::Precond_custom()");
  // Make local copies of pointers to input data
  amrex::Real* u_d = N_VGetArrayPointer(u);

  // Make local copies of pointers in user_data
  auto* udata = static_cast<CVODEUserData*>(user_data);
  auto ncells = udata->ncells;
  auto reactor_type = udata->reactor_type;
  auto* JSPSmat = udata->JSPSmat;
  auto* rowPtrs = udata->rowPtrs;
  auto* colVals = udata->colVals;
  auto* Jdata = udata->Jdata;

  // MW CGS
  amrex::Real mw[NUM_SPECIES] = {0.0};
  get_mw(mw);

  // Check if Jac is stale
  if (jok != 0) {
    // jok = SUNTRUE: Copy Jbd to P
    *jcurPtr = SUNFALSE;
  } else {
    // Save Jac from cell to cell if more than one
    amrex::Real temp_save_lcl = 0.0;
    for (int tid = 0; tid < ncells; tid++) {
      // Offset in case several cells
      int offset = tid * (NUM_SPECIES + 1);
      // rho MKS
      amrex::Real rho = 0.0;
      for (int i = 0; i < NUM_SPECIES; i++) {
        rho = rho + u_d[offset + i];
      }
      // Yks
      amrex::Real massfrac[NUM_SPECIES] = {0.0};
      amrex::Real rhoinv = 1.0 / rho;
      for (int i = 0; i < NUM_SPECIES; i++) {
        massfrac[i] = u_d[offset + i] * rhoinv;
      }
      amrex::Real temp = u_d[offset + NUM_SPECIES];
      // Activities
      amrex::Real activity[NUM_SPECIES] = {0.0};
      auto eos = pele::physics::PhysicsType::eos();
      eos.RTY2C(rho, temp, massfrac, activity);

      // Do we recompute Jac ?
      if (fabs(temp - temp_save_lcl) > 1.0) {
        // Formalism
        int consP =
          static_cast<int>(reactor_type == ReactorTypes::h_reactor_type);
        DWDOT_SIMPLIFIED(JSPSmat[tid], activity, &temp, &consP);

        for (int i = 0; i < NUM_SPECIES; i++) {
          for (int k = 0; k < NUM_SPECIES; k++) {
            (JSPSmat[tid])[k * (NUM_SPECIES + 1) + i] *= mw[i] / mw[k];
          }
          (JSPSmat[tid])[i * (NUM_SPECIES + 1) + NUM_SPECIES] /= mw[i];
        }
        for (int i = 0; i < NUM_SPECIES; i++) {
          (JSPSmat[tid])[NUM_SPECIES * (NUM_SPECIES + 1) + i] *= mw[i];
        }
        temp_save_lcl = temp;
      } else {
        // if not: copy the one from prev cell
        for (int i = 0; i < NUM_SPECIES + 1; i++) {
          for (int k = 0; k < NUM_SPECIES + 1; k++) {
            (JSPSmat[tid])[k * (NUM_SPECIES + 1) + i] =
              (JSPSmat[tid - 1])[k * (NUM_SPECIES + 1) + i];
          }
        }
      }
    }
    *jcurPtr = SUNTRUE;
  }

  for (int i = 1; i < NUM_SPECIES + 2; i++) {
    // nb non zeros elem should be the same for all cells
    int nbVals = rowPtrs[0][i] - rowPtrs[0][i - 1];
    for (int j = 0; j < nbVals; j++) {
      // row of non zero elem should be the same for all cells
      int idx = colVals[0][rowPtrs[0][i - 1] + j];
      // Scale by -gamma
      // Add identity matrix
      for (int tid = 0; tid < ncells; tid++) {
        if (idx == (i - 1)) {
          Jdata[tid][rowPtrs[tid][i - 1] + j] =
            1.0 - gamma * (JSPSmat[tid])[idx * (NUM_SPECIES + 1) + idx];
        } else {
          Jdata[tid][rowPtrs[tid][i - 1] + j] =
            -gamma * (JSPSmat[tid])[(i - 1) + (NUM_SPECIES + 1) * idx];
        }
      }
    }
  }

  return (0);
}